

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_mb_intersector.h
# Opt level: O3

void embree::avx512::CurveNiMBIntersectorK<4,8>::
     intersect_t<embree::avx512::RibbonCurve1IntersectorK<embree::BSplineCurveT,8,8>,embree::avx512::Intersect1KEpilogMU<8,8,true>>
               (Precalculations *pre,RayHitK<8> *ray,size_t k,RayQueryContext *context,
               Primitive *prim)

{
  int iVar1;
  int iVar2;
  float *pfVar3;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar4;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar5;
  Primitive PVar6;
  uint uVar7;
  int iVar8;
  undefined4 uVar9;
  __int_type_conflict _Var10;
  long lVar11;
  RTCFilterFunctionN p_Var12;
  bool bVar13;
  bool bVar14;
  bool bVar15;
  bool bVar16;
  bool bVar17;
  bool bVar18;
  bool bVar19;
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined8 uVar28;
  ulong uVar29;
  long lVar30;
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  int iVar66;
  int iVar67;
  int iVar68;
  int iVar69;
  int iVar70;
  undefined1 auVar71 [32];
  Geometry *pGVar72;
  byte bVar73;
  ulong uVar74;
  uint uVar75;
  uint uVar76;
  long lVar77;
  long lVar78;
  Geometry *pGVar79;
  uint uVar80;
  ulong uVar81;
  byte bVar82;
  ulong uVar83;
  float fVar84;
  float fVar85;
  float fVar137;
  float fVar139;
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar97 [32];
  undefined1 auVar98 [32];
  undefined1 auVar99 [32];
  undefined1 auVar100 [32];
  undefined1 auVar101 [32];
  undefined1 auVar102 [32];
  undefined1 auVar103 [32];
  undefined1 auVar104 [32];
  undefined1 auVar105 [32];
  undefined1 auVar106 [32];
  undefined1 auVar107 [32];
  undefined1 auVar108 [32];
  undefined1 auVar109 [32];
  undefined1 auVar110 [32];
  undefined1 auVar111 [32];
  undefined1 auVar112 [32];
  undefined1 auVar113 [32];
  undefined1 auVar114 [32];
  undefined1 auVar115 [32];
  undefined1 auVar116 [32];
  float fVar138;
  float fVar140;
  float fVar142;
  float fVar143;
  undefined1 auVar117 [32];
  undefined1 auVar118 [32];
  undefined1 auVar119 [32];
  undefined1 auVar120 [32];
  undefined1 auVar121 [32];
  undefined1 auVar122 [32];
  undefined1 auVar123 [32];
  undefined1 auVar124 [32];
  undefined1 auVar125 [32];
  undefined1 auVar126 [32];
  undefined1 auVar127 [32];
  undefined1 auVar96 [16];
  float fVar141;
  float fVar144;
  float fVar145;
  undefined1 auVar128 [32];
  undefined1 auVar129 [32];
  undefined1 auVar130 [32];
  undefined1 auVar131 [32];
  undefined1 auVar132 [32];
  undefined1 auVar133 [32];
  undefined1 auVar134 [32];
  undefined1 auVar135 [32];
  undefined1 auVar136 [32];
  float fVar146;
  undefined4 uVar147;
  float fVar163;
  float fVar164;
  vint4 bi_2;
  float fVar165;
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [32];
  undefined1 auVar156 [32];
  undefined1 auVar157 [32];
  undefined1 auVar158 [32];
  undefined1 auVar159 [32];
  undefined1 auVar160 [32];
  undefined1 auVar161 [32];
  undefined1 auVar162 [32];
  undefined8 uVar166;
  vint4 bi_1;
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [32];
  float fVar174;
  float fVar175;
  float fVar187;
  vint4 bi;
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [32];
  undefined1 auVar186 [32];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [32];
  undefined1 auVar192 [32];
  undefined1 auVar193 [32];
  vint4 ai_2;
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  undefined1 auVar197 [16];
  undefined1 auVar198 [16];
  undefined1 auVar199 [16];
  undefined1 auVar200 [16];
  undefined1 auVar201 [16];
  undefined1 auVar202 [32];
  undefined1 auVar203 [32];
  undefined1 auVar204 [32];
  undefined1 auVar205 [32];
  undefined1 auVar206 [32];
  undefined1 auVar207 [32];
  undefined1 auVar208 [64];
  vint4 ai_1;
  undefined1 auVar209 [16];
  undefined1 auVar210 [16];
  undefined1 auVar211 [16];
  undefined1 auVar212 [16];
  undefined1 auVar213 [16];
  undefined1 auVar214 [16];
  undefined1 auVar215 [16];
  undefined1 auVar218 [64];
  vint4 ai;
  undefined1 auVar219 [16];
  undefined1 auVar220 [16];
  undefined1 auVar221 [16];
  undefined1 auVar222 [16];
  undefined1 auVar223 [64];
  float fVar226;
  float fVar227;
  undefined1 auVar224 [16];
  float fVar228;
  undefined1 auVar225 [64];
  undefined1 auVar229 [16];
  undefined1 auVar230 [32];
  undefined1 auVar231 [32];
  undefined1 auVar232 [16];
  undefined1 auVar233 [16];
  undefined1 auVar234 [16];
  undefined1 auVar235 [16];
  undefined1 auVar236 [16];
  undefined1 auVar239 [32];
  undefined1 auVar240 [32];
  undefined1 auVar237 [32];
  undefined1 auVar241 [64];
  undefined1 auVar242 [16];
  undefined1 auVar243 [64];
  undefined1 auVar244 [64];
  RTCFilterFunctionNArguments args;
  undefined8 local_6a0;
  undefined8 uStack_698;
  undefined8 local_690;
  undefined8 uStack_688;
  undefined8 local_680;
  undefined8 uStack_678;
  undefined8 local_670;
  undefined8 uStack_668;
  RTCFilterFunctionNArguments local_660;
  Geometry *local_630;
  undefined1 (*local_628) [32];
  undefined1 local_620 [32];
  LinearSpace3fa *local_5e8;
  undefined1 local_5e0 [32];
  undefined1 local_5c0 [32];
  undefined1 local_5a0 [32];
  undefined1 local_580 [32];
  undefined4 local_560;
  undefined4 uStack_55c;
  undefined4 uStack_558;
  undefined4 uStack_554;
  undefined4 uStack_550;
  undefined4 uStack_54c;
  undefined4 uStack_548;
  undefined4 uStack_544;
  undefined1 local_540 [32];
  undefined1 local_520 [32];
  undefined1 local_500 [8];
  float fStack_4f8;
  float fStack_4f4;
  float fStack_4f0;
  float fStack_4ec;
  float fStack_4e8;
  undefined4 uStack_4e4;
  undefined1 local_4e0 [8];
  float fStack_4d8;
  float fStack_4d4;
  float fStack_4d0;
  float fStack_4cc;
  float fStack_4c8;
  undefined1 local_4c0 [32];
  undefined1 local_4a0 [32];
  undefined1 local_480 [32];
  undefined1 local_460 [32];
  undefined1 local_440 [32];
  undefined1 local_420 [32];
  undefined1 local_400 [32];
  undefined1 local_3e0 [32];
  undefined1 local_3c0 [32];
  undefined4 local_3a0;
  int local_39c;
  undefined8 local_390;
  undefined8 uStack_388;
  undefined8 local_380;
  undefined8 uStack_378;
  undefined8 local_370;
  undefined8 uStack_368;
  undefined8 local_360;
  undefined8 uStack_358;
  float local_340 [4];
  float fStack_330;
  float fStack_32c;
  float fStack_328;
  float fStack_324;
  undefined1 local_320 [32];
  undefined1 local_300 [32];
  undefined1 local_2d0 [16];
  undefined1 local_2c0 [32];
  undefined1 local_2a0 [32];
  undefined1 local_280 [32];
  undefined1 local_260 [32];
  undefined1 local_240 [32];
  int local_220;
  int iStack_21c;
  int iStack_218;
  int iStack_214;
  int iStack_210;
  int iStack_20c;
  int iStack_208;
  int iStack_204;
  undefined1 local_200 [32];
  undefined1 local_1e0 [32];
  undefined1 local_1c0 [32];
  undefined4 local_1a0;
  undefined4 uStack_19c;
  undefined4 uStack_198;
  undefined4 uStack_194;
  undefined4 uStack_190;
  undefined4 uStack_18c;
  undefined4 uStack_188;
  undefined4 uStack_184;
  undefined8 local_180;
  undefined8 uStack_178;
  undefined8 uStack_170;
  undefined8 uStack_168;
  undefined1 local_160 [32];
  uint local_140;
  uint uStack_13c;
  uint uStack_138;
  uint uStack_134;
  uint uStack_130;
  uint uStack_12c;
  uint uStack_128;
  uint uStack_124;
  uint local_120;
  uint uStack_11c;
  uint uStack_118;
  uint uStack_114;
  uint uStack_110;
  uint uStack_10c;
  uint uStack_108;
  uint uStack_104;
  float local_100;
  float fStack_fc;
  float fStack_f8;
  float fStack_f4;
  float fStack_f0;
  float fStack_ec;
  float fStack_e8;
  float fStack_e4;
  undefined1 local_e0 [32];
  undefined1 local_c0 [32];
  undefined1 local_a0 [32];
  undefined1 local_80 [32];
  undefined1 auVar216 [32];
  undefined1 auVar217 [32];
  undefined1 auVar238 [32];
  
  PVar6 = prim[1];
  uVar74 = (ulong)(byte)PVar6;
  lVar30 = uVar74 * 0x25;
  fVar146 = *(float *)(prim + lVar30 + 0x12);
  auVar86 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x20)),
                          0x10);
  auVar86 = vinsertps_avx(auVar86,ZEXT416(*(uint *)(ray + k * 4 + 0x40)),0x20);
  auVar87 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x80)),
                          ZEXT416(*(uint *)(ray + k * 4 + 0xa0)),0x10);
  auVar87 = vinsertps_avx(auVar87,ZEXT416(*(uint *)(ray + k * 4 + 0xc0)),0x20);
  auVar86 = vsubps_avx(auVar86,*(undefined1 (*) [16])(prim + lVar30 + 6));
  auVar188._0_4_ = fVar146 * auVar86._0_4_;
  auVar188._4_4_ = fVar146 * auVar86._4_4_;
  auVar188._8_4_ = fVar146 * auVar86._8_4_;
  auVar188._12_4_ = fVar146 * auVar86._12_4_;
  auVar86 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar74 * 4 + 6)));
  auVar96._0_4_ = fVar146 * auVar87._0_4_;
  auVar96._4_4_ = fVar146 * auVar87._4_4_;
  auVar96._8_4_ = fVar146 * auVar87._8_4_;
  auVar96._12_4_ = fVar146 * auVar87._12_4_;
  auVar86 = vcvtdq2ps_avx(auVar86);
  auVar87 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar74 * 5 + 6)));
  auVar87 = vcvtdq2ps_avx(auVar87);
  auVar93 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar74 * 6 + 6)));
  auVar20 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar74 * 0xf + 6)));
  auVar93 = vcvtdq2ps_avx(auVar93);
  auVar20 = vcvtdq2ps_avx(auVar20);
  auVar21 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (ulong)(byte)PVar6 * 0x10 + 6)));
  auVar21 = vcvtdq2ps_avx(auVar21);
  auVar22 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (ulong)(byte)PVar6 * 0x10 + uVar74 + 6)));
  auVar22 = vcvtdq2ps_avx(auVar22);
  auVar23 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar74 * 0x1a + 6)));
  auVar23 = vcvtdq2ps_avx(auVar23);
  auVar24 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar74 * 0x1b + 6)));
  auVar24 = vcvtdq2ps_avx(auVar24);
  auVar25 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar74 * 0x1c + 6)));
  auVar25 = vcvtdq2ps_avx(auVar25);
  auVar209._4_4_ = auVar96._0_4_;
  auVar209._0_4_ = auVar96._0_4_;
  auVar209._8_4_ = auVar96._0_4_;
  auVar209._12_4_ = auVar96._0_4_;
  auVar26 = vshufps_avx(auVar96,auVar96,0x55);
  auVar27 = vshufps_avx(auVar96,auVar96,0xaa);
  fVar146 = auVar27._0_4_;
  auVar176._0_4_ = fVar146 * auVar93._0_4_;
  fVar163 = auVar27._4_4_;
  auVar176._4_4_ = fVar163 * auVar93._4_4_;
  fVar164 = auVar27._8_4_;
  auVar176._8_4_ = fVar164 * auVar93._8_4_;
  fVar165 = auVar27._12_4_;
  auVar176._12_4_ = fVar165 * auVar93._12_4_;
  auVar167._0_4_ = auVar22._0_4_ * fVar146;
  auVar167._4_4_ = auVar22._4_4_ * fVar163;
  auVar167._8_4_ = auVar22._8_4_ * fVar164;
  auVar167._12_4_ = auVar22._12_4_ * fVar165;
  auVar148._0_4_ = auVar25._0_4_ * fVar146;
  auVar148._4_4_ = auVar25._4_4_ * fVar163;
  auVar148._8_4_ = auVar25._8_4_ * fVar164;
  auVar148._12_4_ = auVar25._12_4_ * fVar165;
  auVar27 = vfmadd231ps_fma(auVar176,auVar26,auVar87);
  auVar91 = vfmadd231ps_fma(auVar167,auVar26,auVar21);
  auVar26 = vfmadd231ps_fma(auVar148,auVar24,auVar26);
  auVar92 = vfmadd231ps_fma(auVar27,auVar209,auVar86);
  auVar91 = vfmadd231ps_fma(auVar91,auVar209,auVar20);
  auVar94 = vfmadd231ps_fma(auVar26,auVar23,auVar209);
  auVar235._4_4_ = auVar188._0_4_;
  auVar235._0_4_ = auVar188._0_4_;
  auVar235._8_4_ = auVar188._0_4_;
  auVar235._12_4_ = auVar188._0_4_;
  auVar26 = vshufps_avx(auVar188,auVar188,0x55);
  auVar27 = vshufps_avx(auVar188,auVar188,0xaa);
  fVar146 = auVar27._0_4_;
  auVar210._0_4_ = fVar146 * auVar93._0_4_;
  fVar163 = auVar27._4_4_;
  auVar210._4_4_ = fVar163 * auVar93._4_4_;
  fVar164 = auVar27._8_4_;
  auVar210._8_4_ = fVar164 * auVar93._8_4_;
  fVar165 = auVar27._12_4_;
  auVar210._12_4_ = fVar165 * auVar93._12_4_;
  auVar194._0_4_ = auVar22._0_4_ * fVar146;
  auVar194._4_4_ = auVar22._4_4_ * fVar163;
  auVar194._8_4_ = auVar22._8_4_ * fVar164;
  auVar194._12_4_ = auVar22._12_4_ * fVar165;
  auVar189._0_4_ = auVar25._0_4_ * fVar146;
  auVar189._4_4_ = auVar25._4_4_ * fVar163;
  auVar189._8_4_ = auVar25._8_4_ * fVar164;
  auVar189._12_4_ = auVar25._12_4_ * fVar165;
  auVar87 = vfmadd231ps_fma(auVar210,auVar26,auVar87);
  auVar93 = vfmadd231ps_fma(auVar194,auVar26,auVar21);
  auVar21 = vfmadd231ps_fma(auVar189,auVar26,auVar24);
  auVar95 = vfmadd231ps_fma(auVar87,auVar235,auVar86);
  auVar96 = vfmadd231ps_fma(auVar93,auVar235,auVar20);
  auVar86 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
  auVar243 = ZEXT1664(auVar86);
  auVar148 = vfmadd231ps_fma(auVar21,auVar235,auVar23);
  auVar87 = vandps_avx512vl(auVar92,auVar86);
  auVar221._8_4_ = 0x219392ef;
  auVar221._0_8_ = 0x219392ef219392ef;
  auVar221._12_4_ = 0x219392ef;
  uVar81 = vcmpps_avx512vl(auVar87,auVar221,1);
  bVar13 = (bool)((byte)uVar81 & 1);
  auVar88._0_4_ = (uint)bVar13 * 0x219392ef | (uint)!bVar13 * auVar92._0_4_;
  bVar13 = (bool)((byte)(uVar81 >> 1) & 1);
  auVar88._4_4_ = (uint)bVar13 * 0x219392ef | (uint)!bVar13 * auVar92._4_4_;
  bVar13 = (bool)((byte)(uVar81 >> 2) & 1);
  auVar88._8_4_ = (uint)bVar13 * 0x219392ef | (uint)!bVar13 * auVar92._8_4_;
  bVar13 = (bool)((byte)(uVar81 >> 3) & 1);
  auVar88._12_4_ = (uint)bVar13 * 0x219392ef | (uint)!bVar13 * auVar92._12_4_;
  auVar87 = vandps_avx512vl(auVar91,auVar86);
  uVar81 = vcmpps_avx512vl(auVar87,auVar221,1);
  bVar13 = (bool)((byte)uVar81 & 1);
  auVar89._0_4_ = (uint)bVar13 * 0x219392ef | (uint)!bVar13 * auVar91._0_4_;
  bVar13 = (bool)((byte)(uVar81 >> 1) & 1);
  auVar89._4_4_ = (uint)bVar13 * 0x219392ef | (uint)!bVar13 * auVar91._4_4_;
  bVar13 = (bool)((byte)(uVar81 >> 2) & 1);
  auVar89._8_4_ = (uint)bVar13 * 0x219392ef | (uint)!bVar13 * auVar91._8_4_;
  bVar13 = (bool)((byte)(uVar81 >> 3) & 1);
  auVar89._12_4_ = (uint)bVar13 * 0x219392ef | (uint)!bVar13 * auVar91._12_4_;
  auVar86 = vandps_avx512vl(auVar94,auVar86);
  uVar81 = vcmpps_avx512vl(auVar86,auVar221,1);
  bVar13 = (bool)((byte)uVar81 & 1);
  auVar90._0_4_ = (uint)bVar13 * 0x219392ef | (uint)!bVar13 * auVar94._0_4_;
  bVar13 = (bool)((byte)(uVar81 >> 1) & 1);
  auVar90._4_4_ = (uint)bVar13 * 0x219392ef | (uint)!bVar13 * auVar94._4_4_;
  bVar13 = (bool)((byte)(uVar81 >> 2) & 1);
  auVar90._8_4_ = (uint)bVar13 * 0x219392ef | (uint)!bVar13 * auVar94._8_4_;
  bVar13 = (bool)((byte)(uVar81 >> 3) & 1);
  auVar90._12_4_ = (uint)bVar13 * 0x219392ef | (uint)!bVar13 * auVar94._12_4_;
  auVar87 = vrcp14ps_avx512vl(auVar88);
  auVar222._8_4_ = 0x3f800000;
  auVar222._0_8_ = 0x3f8000003f800000;
  auVar222._12_4_ = 0x3f800000;
  auVar86 = vfnmadd213ps_fma(auVar88,auVar87,auVar222);
  auVar92 = vfmadd132ps_fma(auVar86,auVar87,auVar87);
  auVar87 = vrcp14ps_avx512vl(auVar89);
  auVar86 = vfnmadd213ps_fma(auVar89,auVar87,auVar222);
  auVar94 = vfmadd132ps_fma(auVar86,auVar87,auVar87);
  auVar87 = vrcp14ps_avx512vl(auVar90);
  auVar86 = vfnmadd213ps_fma(auVar90,auVar87,auVar222);
  auVar242 = vfmadd132ps_fma(auVar86,auVar87,auVar87);
  fVar146 = (*(float *)(ray + k * 4 + 0xe0) - *(float *)(prim + lVar30 + 0x16)) *
            *(float *)(prim + lVar30 + 0x1a);
  auVar219._4_4_ = fVar146;
  auVar219._0_4_ = fVar146;
  auVar219._8_4_ = fVar146;
  auVar219._12_4_ = fVar146;
  auVar86._8_8_ = 0;
  auVar86._0_8_ = *(ulong *)(prim + uVar74 * 7 + 6);
  auVar86 = vpmovsxwd_avx(auVar86);
  auVar86 = vcvtdq2ps_avx(auVar86);
  auVar87._8_8_ = 0;
  auVar87._0_8_ = *(ulong *)(prim + uVar74 * 0xb + 6);
  auVar87 = vpmovsxwd_avx(auVar87);
  auVar87 = vcvtdq2ps_avx(auVar87);
  auVar20 = vsubps_avx(auVar87,auVar86);
  auVar93._8_8_ = 0;
  auVar93._0_8_ = *(ulong *)(prim + uVar74 * 9 + 6);
  auVar87 = vpmovsxwd_avx(auVar93);
  auVar93 = vfmadd213ps_fma(auVar20,auVar219,auVar86);
  auVar86 = vcvtdq2ps_avx(auVar87);
  auVar20._8_8_ = 0;
  auVar20._0_8_ = *(ulong *)(prim + uVar74 * 0xd + 6);
  auVar87 = vpmovsxwd_avx(auVar20);
  auVar87 = vcvtdq2ps_avx(auVar87);
  auVar87 = vsubps_avx(auVar87,auVar86);
  auVar20 = vfmadd213ps_fma(auVar87,auVar219,auVar86);
  auVar21._8_8_ = 0;
  auVar21._0_8_ = *(ulong *)(prim + uVar74 * 0x12 + 6);
  auVar86 = vpmovsxwd_avx(auVar21);
  auVar86 = vcvtdq2ps_avx(auVar86);
  uVar81 = (ulong)(uint)((int)(uVar74 * 5) << 2);
  auVar22._8_8_ = 0;
  auVar22._0_8_ = *(ulong *)(prim + uVar74 * 2 + uVar81 + 6);
  auVar87 = vpmovsxwd_avx(auVar22);
  auVar87 = vcvtdq2ps_avx(auVar87);
  auVar87 = vsubps_avx(auVar87,auVar86);
  auVar21 = vfmadd213ps_fma(auVar87,auVar219,auVar86);
  auVar23._8_8_ = 0;
  auVar23._0_8_ = *(ulong *)(prim + uVar81 + 6);
  auVar86 = vpmovsxwd_avx(auVar23);
  auVar86 = vcvtdq2ps_avx(auVar86);
  auVar24._8_8_ = 0;
  auVar24._0_8_ = *(ulong *)(prim + uVar74 * 0x18 + 6);
  auVar87 = vpmovsxwd_avx(auVar24);
  auVar87 = vcvtdq2ps_avx(auVar87);
  auVar87 = vsubps_avx(auVar87,auVar86);
  auVar22 = vfmadd213ps_fma(auVar87,auVar219,auVar86);
  auVar25._8_8_ = 0;
  auVar25._0_8_ = *(ulong *)(prim + uVar74 * 0x1d + 6);
  auVar86 = vpmovsxwd_avx(auVar25);
  auVar86 = vcvtdq2ps_avx(auVar86);
  auVar26._8_8_ = 0;
  auVar26._0_8_ = *(ulong *)(prim + uVar74 + (ulong)(byte)PVar6 * 0x20 + 6);
  auVar87 = vpmovsxwd_avx(auVar26);
  auVar87 = vcvtdq2ps_avx(auVar87);
  auVar87 = vsubps_avx(auVar87,auVar86);
  auVar23 = vfmadd213ps_fma(auVar87,auVar219,auVar86);
  auVar27._8_8_ = 0;
  auVar27._0_8_ = *(ulong *)(prim + ((ulong)(byte)PVar6 * 0x20 - uVar74) + 6);
  auVar86 = vpmovsxwd_avx(auVar27);
  auVar86 = vcvtdq2ps_avx(auVar86);
  auVar91._8_8_ = 0;
  auVar91._0_8_ = *(ulong *)(prim + uVar74 * 0x23 + 6);
  auVar87 = vpmovsxwd_avx(auVar91);
  auVar87 = vcvtdq2ps_avx(auVar87);
  auVar87 = vsubps_avx(auVar87,auVar86);
  auVar87 = vfmadd213ps_fma(auVar87,auVar219,auVar86);
  auVar86 = vsubps_avx(auVar93,auVar95);
  auVar220._0_4_ = auVar92._0_4_ * auVar86._0_4_;
  auVar220._4_4_ = auVar92._4_4_ * auVar86._4_4_;
  auVar220._8_4_ = auVar92._8_4_ * auVar86._8_4_;
  auVar220._12_4_ = auVar92._12_4_ * auVar86._12_4_;
  auVar86 = vsubps_avx(auVar20,auVar95);
  auVar177._0_4_ = auVar92._0_4_ * auVar86._0_4_;
  auVar177._4_4_ = auVar92._4_4_ * auVar86._4_4_;
  auVar177._8_4_ = auVar92._8_4_ * auVar86._8_4_;
  auVar177._12_4_ = auVar92._12_4_ * auVar86._12_4_;
  auVar86 = vsubps_avx(auVar21,auVar96);
  auVar211._0_4_ = auVar94._0_4_ * auVar86._0_4_;
  auVar211._4_4_ = auVar94._4_4_ * auVar86._4_4_;
  auVar211._8_4_ = auVar94._8_4_ * auVar86._8_4_;
  auVar211._12_4_ = auVar94._12_4_ * auVar86._12_4_;
  auVar86 = vsubps_avx(auVar22,auVar96);
  auVar168._0_4_ = auVar94._0_4_ * auVar86._0_4_;
  auVar168._4_4_ = auVar94._4_4_ * auVar86._4_4_;
  auVar168._8_4_ = auVar94._8_4_ * auVar86._8_4_;
  auVar168._12_4_ = auVar94._12_4_ * auVar86._12_4_;
  auVar86 = vsubps_avx(auVar23,auVar148);
  auVar195._0_4_ = auVar242._0_4_ * auVar86._0_4_;
  auVar195._4_4_ = auVar242._4_4_ * auVar86._4_4_;
  auVar195._8_4_ = auVar242._8_4_ * auVar86._8_4_;
  auVar195._12_4_ = auVar242._12_4_ * auVar86._12_4_;
  auVar86 = vsubps_avx(auVar87,auVar148);
  auVar149._0_4_ = auVar242._0_4_ * auVar86._0_4_;
  auVar149._4_4_ = auVar242._4_4_ * auVar86._4_4_;
  auVar149._8_4_ = auVar242._8_4_ * auVar86._8_4_;
  auVar149._12_4_ = auVar242._12_4_ * auVar86._12_4_;
  auVar86 = vpminsd_avx(auVar220,auVar177);
  auVar87 = vpminsd_avx(auVar211,auVar168);
  auVar86 = vmaxps_avx(auVar86,auVar87);
  auVar87 = vpminsd_avx(auVar195,auVar149);
  uVar147 = *(undefined4 *)(ray + k * 4 + 0x60);
  auVar92._4_4_ = uVar147;
  auVar92._0_4_ = uVar147;
  auVar92._8_4_ = uVar147;
  auVar92._12_4_ = uVar147;
  auVar87 = vmaxps_avx512vl(auVar87,auVar92);
  auVar86 = vmaxps_avx(auVar86,auVar87);
  auVar94._8_4_ = 0x3f7ffffa;
  auVar94._0_8_ = 0x3f7ffffa3f7ffffa;
  auVar94._12_4_ = 0x3f7ffffa;
  local_2d0 = vmulps_avx512vl(auVar86,auVar94);
  auVar86 = vpmaxsd_avx(auVar220,auVar177);
  auVar87 = vpmaxsd_avx(auVar211,auVar168);
  auVar86 = vminps_avx(auVar86,auVar87);
  auVar87 = vpmaxsd_avx(auVar195,auVar149);
  uVar147 = *(undefined4 *)(ray + k * 4 + 0x100);
  auVar242._4_4_ = uVar147;
  auVar242._0_4_ = uVar147;
  auVar242._8_4_ = uVar147;
  auVar242._12_4_ = uVar147;
  auVar87 = vminps_avx512vl(auVar87,auVar242);
  auVar86 = vminps_avx(auVar86,auVar87);
  auVar95._8_4_ = 0x3f800003;
  auVar95._0_8_ = 0x3f8000033f800003;
  auVar95._12_4_ = 0x3f800003;
  auVar86 = vmulps_avx512vl(auVar86,auVar95);
  auVar87 = vpbroadcastd_avx512vl();
  uVar166 = vcmpps_avx512vl(local_2d0,auVar86,2);
  uVar81 = vpcmpgtd_avx512vl(auVar87,_DAT_01f7fcf0);
  uVar81 = ((byte)uVar166 & 0xf) & uVar81;
  if ((char)uVar81 != '\0') {
    local_5e8 = pre->ray_space + k;
    local_628 = (undefined1 (*) [32])&local_140;
    local_2c0 = vpmovm2d_avx512vl((ulong)(uint)(1 << ((uint)k & 0x1f)));
    auVar244 = ZEXT464(0xbf800000);
    do {
      lVar30 = 0;
      for (uVar74 = uVar81; (uVar74 & 1) == 0; uVar74 = uVar74 >> 1 | 0x8000000000000000) {
        lVar30 = lVar30 + 1;
      }
      uVar80 = *(uint *)(prim + 2);
      uVar7 = *(uint *)(prim + lVar30 * 4 + 6);
      pGVar79 = (context->scene->geometries).items[uVar80].ptr;
      uVar74 = (ulong)*(uint *)(*(long *)&pGVar79->field_0x58 +
                               (ulong)uVar7 *
                               pGVar79[1].super_RefCount.refCounter.
                               super___atomic_base<unsigned_long>._M_i);
      fVar146 = (pGVar79->time_range).lower;
      fVar146 = pGVar79->fnumTimeSegments *
                ((*(float *)(ray + k * 4 + 0xe0) - fVar146) /
                ((pGVar79->time_range).upper - fVar146));
      auVar86 = vroundss_avx(ZEXT416((uint)fVar146),ZEXT416((uint)fVar146),9);
      auVar87 = vaddss_avx512f(ZEXT416((uint)pGVar79->fnumTimeSegments),auVar244._0_16_);
      auVar86 = vminss_avx(auVar86,auVar87);
      auVar86 = vmaxss_avx(ZEXT816(0) << 0x20,auVar86);
      fVar146 = fVar146 - auVar86._0_4_;
      _Var10 = pGVar79[4].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
      lVar78 = (long)(int)auVar86._0_4_ * 0x38;
      lVar30 = *(long *)(_Var10 + 0x10 + lVar78);
      lVar77 = *(long *)(_Var10 + 0x38 + lVar78);
      lVar11 = *(long *)(_Var10 + 0x48 + lVar78);
      auVar169._4_4_ = fVar146;
      auVar169._0_4_ = fVar146;
      auVar169._8_4_ = fVar146;
      auVar169._12_4_ = fVar146;
      pfVar3 = (float *)(lVar77 + uVar74 * lVar11);
      auVar224._0_4_ = fVar146 * *pfVar3;
      auVar224._4_4_ = fVar146 * pfVar3[1];
      auVar224._8_4_ = fVar146 * pfVar3[2];
      auVar224._12_4_ = fVar146 * pfVar3[3];
      pfVar3 = (float *)(lVar77 + (uVar74 + 1) * lVar11);
      auVar229._0_4_ = fVar146 * *pfVar3;
      auVar229._4_4_ = fVar146 * pfVar3[1];
      auVar229._8_4_ = fVar146 * pfVar3[2];
      auVar229._12_4_ = fVar146 * pfVar3[3];
      auVar86 = vmulps_avx512vl(auVar169,*(undefined1 (*) [16])(lVar77 + (uVar74 + 2) * lVar11));
      auVar87 = vmulps_avx512vl(auVar169,*(undefined1 (*) [16])(lVar77 + lVar11 * (uVar74 + 3)));
      lVar77 = *(long *)(_Var10 + lVar78);
      fVar146 = 1.0 - fVar146;
      auVar150._4_4_ = fVar146;
      auVar150._0_4_ = fVar146;
      auVar150._8_4_ = fVar146;
      auVar150._12_4_ = fVar146;
      auVar20 = vfmadd231ps_fma(auVar224,auVar150,*(undefined1 (*) [16])(lVar77 + lVar30 * uVar74));
      auVar21 = vfmadd231ps_fma(auVar229,auVar150,
                                *(undefined1 (*) [16])(lVar77 + lVar30 * (uVar74 + 1)));
      auVar91 = vfmadd231ps_avx512vl
                          (auVar86,auVar150,*(undefined1 (*) [16])(lVar77 + lVar30 * (uVar74 + 2)));
      auVar92 = vfmadd231ps_avx512vl
                          (auVar87,auVar150,*(undefined1 (*) [16])(lVar77 + lVar30 * (uVar74 + 3)));
      iVar8 = (int)pGVar79[6].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
      auVar86 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x20))
                              ,0x1c);
      lVar30 = (long)iVar8 * 0x44;
      auVar86 = vinsertps_avx(auVar86,ZEXT416(*(uint *)(ray + k * 4 + 0x40)),0x28);
      auVar93 = vsubps_avx(auVar20,auVar86);
      uVar147 = auVar93._0_4_;
      auVar178._4_4_ = uVar147;
      auVar178._0_4_ = uVar147;
      auVar178._8_4_ = uVar147;
      auVar178._12_4_ = uVar147;
      auVar87 = vshufps_avx(auVar93,auVar93,0x55);
      aVar4 = (local_5e8->vx).field_0;
      aVar5 = (local_5e8->vy).field_0;
      fVar146 = (local_5e8->vz).field_0.m128[0];
      fVar163 = *(float *)((long)&(local_5e8->vz).field_0 + 4);
      fVar164 = *(float *)((long)&(local_5e8->vz).field_0 + 8);
      fVar165 = *(float *)((long)&(local_5e8->vz).field_0 + 0xc);
      auVar93 = vshufps_avx(auVar93,auVar93,0xaa);
      auVar232._0_4_ = fVar146 * auVar93._0_4_;
      auVar232._4_4_ = fVar163 * auVar93._4_4_;
      auVar232._8_4_ = fVar164 * auVar93._8_4_;
      auVar232._12_4_ = fVar165 * auVar93._12_4_;
      auVar87 = vfmadd231ps_fma(auVar232,(undefined1  [16])aVar5,auVar87);
      auVar22 = vfmadd231ps_fma(auVar87,(undefined1  [16])aVar4,auVar178);
      auVar93 = vsubps_avx(auVar21,auVar86);
      uVar147 = auVar93._0_4_;
      auVar179._4_4_ = uVar147;
      auVar179._0_4_ = uVar147;
      auVar179._8_4_ = uVar147;
      auVar179._12_4_ = uVar147;
      auVar87 = vshufps_avx(auVar93,auVar93,0x55);
      auVar93 = vshufps_avx(auVar93,auVar93,0xaa);
      auVar233._0_4_ = fVar146 * auVar93._0_4_;
      auVar233._4_4_ = fVar163 * auVar93._4_4_;
      auVar233._8_4_ = fVar164 * auVar93._8_4_;
      auVar233._12_4_ = fVar165 * auVar93._12_4_;
      auVar87 = vfmadd231ps_fma(auVar233,(undefined1  [16])aVar5,auVar87);
      auVar23 = vfmadd231ps_fma(auVar87,(undefined1  [16])aVar4,auVar179);
      auVar93 = vsubps_avx512vl(auVar91,auVar86);
      uVar147 = auVar93._0_4_;
      auVar180._4_4_ = uVar147;
      auVar180._0_4_ = uVar147;
      auVar180._8_4_ = uVar147;
      auVar180._12_4_ = uVar147;
      auVar87 = vshufps_avx(auVar93,auVar93,0x55);
      auVar93 = vshufps_avx(auVar93,auVar93,0xaa);
      auVar234._0_4_ = fVar146 * auVar93._0_4_;
      auVar234._4_4_ = fVar163 * auVar93._4_4_;
      auVar234._8_4_ = fVar164 * auVar93._8_4_;
      auVar234._12_4_ = fVar165 * auVar93._12_4_;
      auVar87 = vfmadd231ps_fma(auVar234,(undefined1  [16])aVar5,auVar87);
      auVar93 = vfmadd231ps_fma(auVar87,(undefined1  [16])aVar4,auVar180);
      auVar87 = vsubps_avx512vl(auVar92,auVar86);
      uVar147 = auVar87._0_4_;
      auVar170._4_4_ = uVar147;
      auVar170._0_4_ = uVar147;
      auVar170._8_4_ = uVar147;
      auVar170._12_4_ = uVar147;
      auVar86 = vshufps_avx(auVar87,auVar87,0x55);
      auVar87 = vshufps_avx(auVar87,auVar87,0xaa);
      auVar236._0_4_ = fVar146 * auVar87._0_4_;
      auVar236._4_4_ = fVar163 * auVar87._4_4_;
      auVar236._8_4_ = fVar164 * auVar87._8_4_;
      auVar236._12_4_ = fVar165 * auVar87._12_4_;
      auVar86 = vfmadd231ps_fma(auVar236,(undefined1  [16])aVar5,auVar86);
      auVar24 = vfmadd231ps_fma(auVar86,(undefined1  [16])aVar4,auVar170);
      auVar111 = *(undefined1 (*) [32])(bspline_basis0 + lVar30);
      uVar147 = auVar22._0_4_;
      local_420._4_4_ = uVar147;
      local_420._0_4_ = uVar147;
      local_420._8_4_ = uVar147;
      local_420._12_4_ = uVar147;
      local_420._16_4_ = uVar147;
      local_420._20_4_ = uVar147;
      local_420._24_4_ = uVar147;
      local_420._28_4_ = uVar147;
      auVar112 = *(undefined1 (*) [32])(bspline_basis0 + lVar30 + 0x484);
      auVar97._8_4_ = 1;
      auVar97._0_8_ = 0x100000001;
      auVar97._12_4_ = 1;
      auVar97._16_4_ = 1;
      auVar97._20_4_ = 1;
      auVar97._24_4_ = 1;
      auVar97._28_4_ = 1;
      local_440 = vpermps_avx2(auVar97,ZEXT1632(auVar22));
      uVar147 = auVar23._0_4_;
      auVar190._4_4_ = uVar147;
      auVar190._0_4_ = uVar147;
      auVar190._8_4_ = uVar147;
      auVar190._12_4_ = uVar147;
      local_460._16_4_ = uVar147;
      local_460._0_16_ = auVar190;
      local_460._20_4_ = uVar147;
      local_460._24_4_ = uVar147;
      local_460._28_4_ = uVar147;
      local_480 = vpermps_avx512vl(auVar97,ZEXT1632(auVar23));
      auVar110 = *(undefined1 (*) [32])(bspline_basis0 + lVar30 + 0x908);
      local_4a0 = vbroadcastss_avx512vl(auVar93);
      local_4c0 = vpermps_avx512vl(auVar97,ZEXT1632(auVar93));
      auVar109 = *(undefined1 (*) [32])(bspline_basis0 + lVar30 + 0xd8c);
      uVar147 = auVar24._0_4_;
      local_4e0._4_4_ = uVar147;
      local_4e0._0_4_ = uVar147;
      fStack_4d8 = (float)uVar147;
      fStack_4d4 = (float)uVar147;
      fStack_4d0 = (float)uVar147;
      fStack_4cc = (float)uVar147;
      fStack_4c8 = (float)uVar147;
      register0x0000139c = uVar147;
      _local_500 = vpermps_avx512vl(auVar97,ZEXT1632(auVar24));
      auVar97 = vmulps_avx512vl(_local_4e0,auVar109);
      auVar98 = vmulps_avx512vl(_local_500,auVar109);
      auVar97 = vfmadd231ps_avx512vl(auVar97,auVar110,local_4a0);
      auVar98 = vfmadd231ps_avx512vl(auVar98,auVar110,local_4c0);
      auVar86 = vfmadd231ps_fma(auVar97,auVar112,local_460);
      auVar99 = vfmadd231ps_avx512vl(auVar98,auVar112,local_480);
      auVar100 = vfmadd231ps_avx512vl(ZEXT1632(auVar86),auVar111,local_420);
      auVar218 = ZEXT3264(auVar100);
      auVar97 = *(undefined1 (*) [32])(bspline_basis1 + lVar30);
      auVar98 = *(undefined1 (*) [32])(bspline_basis1 + lVar30 + 0x484);
      auVar108 = *(undefined1 (*) [32])(bspline_basis1 + lVar30 + 0x908);
      auVar101 = vfmadd231ps_avx512vl(auVar99,auVar111,local_440);
      auVar208 = ZEXT3264(auVar101);
      auVar99 = *(undefined1 (*) [32])(bspline_basis1 + lVar30 + 0xd8c);
      auVar102 = vmulps_avx512vl(_local_4e0,auVar99);
      auVar103 = vmulps_avx512vl(_local_500,auVar99);
      auVar102 = vfmadd231ps_avx512vl(auVar102,auVar108,local_4a0);
      auVar103 = vfmadd231ps_avx512vl(auVar103,auVar108,local_4c0);
      auVar102 = vfmadd231ps_avx512vl(auVar102,auVar98,local_460);
      auVar103 = vfmadd231ps_avx512vl(auVar103,auVar98,local_480);
      auVar25 = vfmadd231ps_fma(auVar102,auVar97,local_420);
      auVar223 = ZEXT1664(auVar25);
      auVar26 = vfmadd231ps_fma(auVar103,auVar97,local_440);
      auVar103 = vsubps_avx512vl(ZEXT1632(auVar25),auVar100);
      auVar104 = vsubps_avx512vl(ZEXT1632(auVar26),auVar101);
      auVar102 = vmulps_avx512vl(auVar101,auVar103);
      auVar105 = vmulps_avx512vl(auVar100,auVar104);
      auVar102 = vsubps_avx512vl(auVar102,auVar105);
      auVar86 = vshufps_avx(auVar20,auVar20,0xff);
      uVar166 = auVar86._0_8_;
      local_80._8_8_ = uVar166;
      local_80._0_8_ = uVar166;
      local_80._16_8_ = uVar166;
      local_80._24_8_ = uVar166;
      auVar86 = vshufps_avx(auVar21,auVar21,0xff);
      local_a0 = vbroadcastsd_avx512vl(auVar86);
      auVar86 = vshufps_avx512vl(auVar91,auVar91,0xff);
      local_c0 = vbroadcastsd_avx512vl(auVar86);
      auVar86 = vshufps_avx512vl(auVar92,auVar92,0xff);
      uVar166 = auVar86._0_8_;
      local_e0._8_8_ = uVar166;
      local_e0._0_8_ = uVar166;
      local_e0._16_8_ = uVar166;
      local_e0._24_8_ = uVar166;
      auVar105 = vmulps_avx512vl(local_e0,auVar109);
      auVar105 = vfmadd231ps_avx512vl(auVar105,auVar110,local_c0);
      auVar105 = vfmadd231ps_avx512vl(auVar105,auVar112,local_a0);
      auVar105 = vfmadd231ps_avx512vl(auVar105,auVar111,local_80);
      auVar106 = vmulps_avx512vl(local_e0,auVar99);
      auVar106 = vfmadd231ps_avx512vl(auVar106,auVar108,local_c0);
      auVar106 = vfmadd231ps_avx512vl(auVar106,auVar98,local_a0);
      auVar27 = vfmadd231ps_fma(auVar106,auVar97,local_80);
      auVar106 = vmulps_avx512vl(auVar104,auVar104);
      auVar106 = vfmadd231ps_avx512vl(auVar106,auVar103,auVar103);
      auVar107 = vmaxps_avx512vl(auVar105,ZEXT1632(auVar27));
      auVar107 = vmulps_avx512vl(auVar107,auVar107);
      auVar106 = vmulps_avx512vl(auVar107,auVar106);
      auVar102 = vmulps_avx512vl(auVar102,auVar102);
      uVar166 = vcmpps_avx512vl(auVar102,auVar106,2);
      auVar86 = vblendps_avx(auVar22,auVar20,8);
      auVar242 = auVar243._0_16_;
      auVar87 = vandps_avx512vl(auVar86,auVar242);
      auVar86 = vblendps_avx(auVar23,auVar21,8);
      auVar86 = vandps_avx512vl(auVar86,auVar242);
      auVar87 = vmaxps_avx(auVar87,auVar86);
      auVar86 = vblendps_avx(auVar93,auVar91,8);
      auVar94 = vandps_avx512vl(auVar86,auVar242);
      auVar86 = vblendps_avx(auVar24,auVar92,8);
      auVar86 = vandps_avx512vl(auVar86,auVar242);
      auVar86 = vmaxps_avx(auVar94,auVar86);
      auVar86 = vmaxps_avx(auVar87,auVar86);
      auVar87 = vmovshdup_avx(auVar86);
      auVar87 = vmaxss_avx(auVar87,auVar86);
      auVar86 = vshufpd_avx(auVar86,auVar86,1);
      auVar86 = vmaxss_avx(auVar86,auVar87);
      auVar87 = vcvtsi2ss_avx512f(auVar242,iVar8);
      local_580._0_16_ = auVar87;
      auVar107._0_4_ = auVar87._0_4_;
      auVar107._4_4_ = auVar107._0_4_;
      auVar107._8_4_ = auVar107._0_4_;
      auVar107._12_4_ = auVar107._0_4_;
      auVar107._16_4_ = auVar107._0_4_;
      auVar107._20_4_ = auVar107._0_4_;
      auVar107._24_4_ = auVar107._0_4_;
      auVar107._28_4_ = auVar107._0_4_;
      uVar28 = vcmpps_avx512vl(auVar107,_DAT_01faff40,0xe);
      bVar82 = (byte)uVar166 & (byte)uVar28;
      auVar86 = vmulss_avx512f(auVar86,SUB6416(ZEXT464(0x35000000),0));
      local_5c0._0_16_ = auVar86;
      auVar102 = local_5c0;
      auVar106._8_4_ = 2;
      auVar106._0_8_ = 0x200000002;
      auVar106._12_4_ = 2;
      auVar106._16_4_ = 2;
      auVar106._20_4_ = 2;
      auVar106._24_4_ = 2;
      auVar106._28_4_ = 2;
      local_240 = vpermps_avx2(auVar106,ZEXT1632(auVar22));
      local_260 = vpermps_avx2(auVar106,ZEXT1632(auVar23));
      local_280 = vpermps_avx2(auVar106,ZEXT1632(auVar93));
      local_2a0 = vpermps_avx2(auVar106,ZEXT1632(auVar24));
      local_560 = *(undefined4 *)(ray + k * 4 + 0x60);
      uStack_55c = 0;
      uStack_558 = 0;
      uStack_554 = 0;
      local_670 = auVar20._0_8_;
      uStack_668 = auVar20._8_8_;
      local_680 = auVar21._0_8_;
      uStack_678 = auVar21._8_8_;
      local_690 = auVar91._0_8_;
      uStack_688 = auVar91._8_8_;
      local_6a0._0_4_ = auVar92._0_4_;
      fVar146 = (float)local_6a0;
      local_6a0._4_4_ = auVar92._4_4_;
      fVar163 = local_6a0._4_4_;
      uStack_698._0_4_ = auVar92._8_4_;
      fVar164 = (float)uStack_698;
      uStack_698._4_4_ = auVar92._12_4_;
      fVar165 = uStack_698._4_4_;
      local_6a0 = auVar92._0_8_;
      uStack_698 = auVar92._8_8_;
      local_5c0 = auVar102;
      if (bVar82 != 0) {
        auVar99 = vmulps_avx512vl(local_2a0,auVar99);
        auVar108 = vfmadd213ps_avx512vl(auVar108,local_280,auVar99);
        auVar98 = vfmadd213ps_avx512vl(auVar98,local_260,auVar108);
        auVar99 = vfmadd213ps_avx512vl(auVar97,local_240,auVar98);
        auVar109 = vmulps_avx512vl(local_2a0,auVar109);
        auVar110 = vfmadd213ps_avx512vl(auVar110,local_280,auVar109);
        auVar98 = vfmadd213ps_avx512vl(auVar112,local_260,auVar110);
        auVar112 = *(undefined1 (*) [32])(bspline_basis0 + lVar30 + 0x1210);
        auVar110 = *(undefined1 (*) [32])(bspline_basis0 + lVar30 + 0x1694);
        auVar109 = *(undefined1 (*) [32])(bspline_basis0 + lVar30 + 0x1b18);
        auVar97 = *(undefined1 (*) [32])(bspline_basis0 + lVar30 + 0x1f9c);
        auVar102 = vfmadd213ps_avx512vl(auVar111,local_240,auVar98);
        auVar111 = vmulps_avx512vl(_local_4e0,auVar97);
        auVar98 = vmulps_avx512vl(_local_500,auVar97);
        auVar97 = vmulps_avx512vl(local_2a0,auVar97);
        auVar111 = vfmadd231ps_avx512vl(auVar111,auVar109,local_4a0);
        auVar98 = vfmadd231ps_avx512vl(auVar98,auVar109,local_4c0);
        auVar109 = vfmadd231ps_avx512vl(auVar97,local_280,auVar109);
        auVar111 = vfmadd231ps_avx512vl(auVar111,auVar110,local_460);
        auVar97 = vfmadd231ps_avx512vl(auVar98,auVar110,local_480);
        auVar98 = vfmadd231ps_avx512vl(auVar109,local_260,auVar110);
        auVar87 = vfmadd231ps_fma(auVar111,auVar112,local_420);
        auVar97 = vfmadd231ps_avx512vl(auVar97,auVar112,local_440);
        auVar111 = *(undefined1 (*) [32])(bspline_basis1 + lVar30 + 0x1210);
        auVar110 = *(undefined1 (*) [32])(bspline_basis1 + lVar30 + 0x1b18);
        auVar109 = *(undefined1 (*) [32])(bspline_basis1 + lVar30 + 0x1f9c);
        auVar98 = vfmadd231ps_avx512vl(auVar98,local_240,auVar112);
        auVar112 = vmulps_avx512vl(_local_4e0,auVar109);
        auVar108 = vmulps_avx512vl(_local_500,auVar109);
        auVar109 = vmulps_avx512vl(local_2a0,auVar109);
        auVar106 = vfmadd231ps_avx512vl(auVar112,auVar110,local_4a0);
        auVar108 = vfmadd231ps_avx512vl(auVar108,auVar110,local_4c0);
        auVar110 = vfmadd231ps_avx512vl(auVar109,local_280,auVar110);
        auVar243 = ZEXT1664(auVar242);
        auVar112 = *(undefined1 (*) [32])(bspline_basis1 + lVar30 + 0x1694);
        auVar109 = vfmadd231ps_avx512vl(auVar106,auVar112,local_460);
        auVar108 = vfmadd231ps_avx512vl(auVar108,auVar112,local_480);
        auVar112 = vfmadd231ps_avx512vl(auVar110,local_260,auVar112);
        auVar244 = ZEXT1664(auVar244._0_16_);
        auVar93 = vfmadd231ps_fma(auVar109,auVar111,local_420);
        auVar110 = vfmadd231ps_avx512vl(auVar108,auVar111,local_440);
        auVar109 = vfmadd231ps_avx512vl(auVar112,local_240,auVar111);
        auVar237._8_4_ = 0x7fffffff;
        auVar237._0_8_ = 0x7fffffff7fffffff;
        auVar237._12_4_ = 0x7fffffff;
        auVar237._16_4_ = 0x7fffffff;
        auVar237._20_4_ = 0x7fffffff;
        auVar237._24_4_ = 0x7fffffff;
        auVar237._28_4_ = 0x7fffffff;
        auVar111 = vandps_avx(ZEXT1632(auVar87),auVar237);
        auVar112 = vandps_avx(auVar97,auVar237);
        auVar112 = vmaxps_avx(auVar111,auVar112);
        auVar111 = vandps_avx(auVar98,auVar237);
        auVar111 = vmaxps_avx(auVar112,auVar111);
        local_5c0._0_4_ = auVar86._0_4_;
        auVar230._4_4_ = local_5c0._0_4_;
        auVar230._0_4_ = local_5c0._0_4_;
        auVar230._8_4_ = local_5c0._0_4_;
        auVar230._12_4_ = local_5c0._0_4_;
        auVar230._16_4_ = local_5c0._0_4_;
        auVar230._20_4_ = local_5c0._0_4_;
        auVar230._24_4_ = local_5c0._0_4_;
        auVar230._28_4_ = local_5c0._0_4_;
        uVar74 = vcmpps_avx512vl(auVar111,auVar230,1);
        bVar13 = (bool)((byte)uVar74 & 1);
        auVar113._0_4_ = (float)((uint)bVar13 * auVar103._0_4_ | (uint)!bVar13 * auVar87._0_4_);
        bVar13 = (bool)((byte)(uVar74 >> 1) & 1);
        auVar113._4_4_ = (float)((uint)bVar13 * auVar103._4_4_ | (uint)!bVar13 * auVar87._4_4_);
        bVar13 = (bool)((byte)(uVar74 >> 2) & 1);
        auVar113._8_4_ = (float)((uint)bVar13 * auVar103._8_4_ | (uint)!bVar13 * auVar87._8_4_);
        bVar13 = (bool)((byte)(uVar74 >> 3) & 1);
        auVar113._12_4_ = (float)((uint)bVar13 * auVar103._12_4_ | (uint)!bVar13 * auVar87._12_4_);
        fVar226 = (float)((uint)((byte)(uVar74 >> 4) & 1) * auVar103._16_4_);
        auVar113._16_4_ = fVar226;
        fVar175 = (float)((uint)((byte)(uVar74 >> 5) & 1) * auVar103._20_4_);
        auVar113._20_4_ = fVar175;
        fVar227 = (float)((uint)((byte)(uVar74 >> 6) & 1) * auVar103._24_4_);
        auVar113._24_4_ = fVar227;
        auVar113._28_4_ = (uint)(byte)(uVar74 >> 7) * auVar103._28_4_;
        bVar13 = (bool)((byte)uVar74 & 1);
        auVar114._0_4_ = (float)((uint)bVar13 * auVar104._0_4_ | (uint)!bVar13 * auVar97._0_4_);
        bVar13 = (bool)((byte)(uVar74 >> 1) & 1);
        auVar114._4_4_ = (float)((uint)bVar13 * auVar104._4_4_ | (uint)!bVar13 * auVar97._4_4_);
        bVar13 = (bool)((byte)(uVar74 >> 2) & 1);
        auVar114._8_4_ = (float)((uint)bVar13 * auVar104._8_4_ | (uint)!bVar13 * auVar97._8_4_);
        bVar13 = (bool)((byte)(uVar74 >> 3) & 1);
        auVar114._12_4_ = (float)((uint)bVar13 * auVar104._12_4_ | (uint)!bVar13 * auVar97._12_4_);
        bVar13 = (bool)((byte)(uVar74 >> 4) & 1);
        auVar114._16_4_ = (float)((uint)bVar13 * auVar104._16_4_ | (uint)!bVar13 * auVar97._16_4_);
        bVar13 = (bool)((byte)(uVar74 >> 5) & 1);
        auVar114._20_4_ = (float)((uint)bVar13 * auVar104._20_4_ | (uint)!bVar13 * auVar97._20_4_);
        bVar13 = (bool)((byte)(uVar74 >> 6) & 1);
        auVar114._24_4_ = (float)((uint)bVar13 * auVar104._24_4_ | (uint)!bVar13 * auVar97._24_4_);
        bVar13 = SUB81(uVar74 >> 7,0);
        auVar114._28_4_ = (uint)bVar13 * auVar104._28_4_ | (uint)!bVar13 * auVar97._28_4_;
        auVar111 = vandps_avx(auVar237,ZEXT1632(auVar93));
        auVar112 = vandps_avx(auVar110,auVar237);
        auVar112 = vmaxps_avx(auVar111,auVar112);
        auVar111 = vandps_avx(auVar109,auVar237);
        auVar111 = vmaxps_avx(auVar112,auVar111);
        uVar74 = vcmpps_avx512vl(auVar111,auVar230,1);
        bVar13 = (bool)((byte)uVar74 & 1);
        auVar115._0_4_ = (float)((uint)bVar13 * auVar103._0_4_ | (uint)!bVar13 * auVar93._0_4_);
        bVar13 = (bool)((byte)(uVar74 >> 1) & 1);
        auVar115._4_4_ = (float)((uint)bVar13 * auVar103._4_4_ | (uint)!bVar13 * auVar93._4_4_);
        bVar13 = (bool)((byte)(uVar74 >> 2) & 1);
        auVar115._8_4_ = (float)((uint)bVar13 * auVar103._8_4_ | (uint)!bVar13 * auVar93._8_4_);
        bVar13 = (bool)((byte)(uVar74 >> 3) & 1);
        auVar115._12_4_ = (float)((uint)bVar13 * auVar103._12_4_ | (uint)!bVar13 * auVar93._12_4_);
        fVar228 = (float)((uint)((byte)(uVar74 >> 4) & 1) * auVar103._16_4_);
        auVar115._16_4_ = fVar228;
        fVar174 = (float)((uint)((byte)(uVar74 >> 5) & 1) * auVar103._20_4_);
        auVar115._20_4_ = fVar174;
        fVar187 = (float)((uint)((byte)(uVar74 >> 6) & 1) * auVar103._24_4_);
        auVar115._24_4_ = fVar187;
        uVar75 = (uint)(byte)(uVar74 >> 7) * auVar103._28_4_;
        auVar115._28_4_ = uVar75;
        bVar13 = (bool)((byte)uVar74 & 1);
        auVar116._0_4_ = (float)((uint)bVar13 * auVar104._0_4_ | (uint)!bVar13 * auVar110._0_4_);
        bVar13 = (bool)((byte)(uVar74 >> 1) & 1);
        auVar116._4_4_ = (float)((uint)bVar13 * auVar104._4_4_ | (uint)!bVar13 * auVar110._4_4_);
        bVar13 = (bool)((byte)(uVar74 >> 2) & 1);
        auVar116._8_4_ = (float)((uint)bVar13 * auVar104._8_4_ | (uint)!bVar13 * auVar110._8_4_);
        bVar13 = (bool)((byte)(uVar74 >> 3) & 1);
        auVar116._12_4_ = (float)((uint)bVar13 * auVar104._12_4_ | (uint)!bVar13 * auVar110._12_4_);
        bVar13 = (bool)((byte)(uVar74 >> 4) & 1);
        auVar116._16_4_ = (float)((uint)bVar13 * auVar104._16_4_ | (uint)!bVar13 * auVar110._16_4_);
        bVar13 = (bool)((byte)(uVar74 >> 5) & 1);
        auVar116._20_4_ = (float)((uint)bVar13 * auVar104._20_4_ | (uint)!bVar13 * auVar110._20_4_);
        bVar13 = (bool)((byte)(uVar74 >> 6) & 1);
        auVar116._24_4_ = (float)((uint)bVar13 * auVar104._24_4_ | (uint)!bVar13 * auVar110._24_4_);
        bVar13 = SUB81(uVar74 >> 7,0);
        auVar116._28_4_ = (uint)bVar13 * auVar104._28_4_ | (uint)!bVar13 * auVar110._28_4_;
        auVar95 = vxorps_avx512vl(auVar190,auVar190);
        auVar111 = vfmadd213ps_avx512vl(auVar113,auVar113,ZEXT1632(auVar95));
        auVar86 = vfmadd231ps_fma(auVar111,auVar114,auVar114);
        auVar112 = vrsqrt14ps_avx512vl(ZEXT1632(auVar86));
        fVar84 = auVar112._0_4_;
        fVar85 = auVar112._4_4_;
        fVar137 = auVar112._8_4_;
        fVar138 = auVar112._12_4_;
        fVar139 = auVar112._16_4_;
        fVar140 = auVar112._20_4_;
        fVar142 = auVar112._24_4_;
        auVar111._4_4_ = fVar85 * fVar85 * fVar85 * auVar86._4_4_ * -0.5;
        auVar111._0_4_ = fVar84 * fVar84 * fVar84 * auVar86._0_4_ * -0.5;
        auVar111._8_4_ = fVar137 * fVar137 * fVar137 * auVar86._8_4_ * -0.5;
        auVar111._12_4_ = fVar138 * fVar138 * fVar138 * auVar86._12_4_ * -0.5;
        auVar111._16_4_ = fVar139 * fVar139 * fVar139 * -0.0;
        auVar111._20_4_ = fVar140 * fVar140 * fVar140 * -0.0;
        auVar111._24_4_ = fVar142 * fVar142 * fVar142 * -0.0;
        auVar111._28_4_ = auVar109._28_4_;
        auVar97 = vbroadcastss_avx512vl(ZEXT416(0x3fc00000));
        auVar111 = vfmadd231ps_avx512vl(auVar111,auVar97,auVar112);
        auVar112._4_4_ = auVar114._4_4_ * auVar111._4_4_;
        auVar112._0_4_ = auVar114._0_4_ * auVar111._0_4_;
        auVar112._8_4_ = auVar114._8_4_ * auVar111._8_4_;
        auVar112._12_4_ = auVar114._12_4_ * auVar111._12_4_;
        auVar112._16_4_ = auVar114._16_4_ * auVar111._16_4_;
        auVar112._20_4_ = auVar114._20_4_ * auVar111._20_4_;
        auVar112._24_4_ = auVar114._24_4_ * auVar111._24_4_;
        auVar112._28_4_ = 0;
        auVar110._4_4_ = auVar111._4_4_ * -auVar113._4_4_;
        auVar110._0_4_ = auVar111._0_4_ * -auVar113._0_4_;
        auVar110._8_4_ = auVar111._8_4_ * -auVar113._8_4_;
        auVar110._12_4_ = auVar111._12_4_ * -auVar113._12_4_;
        auVar110._16_4_ = auVar111._16_4_ * -fVar226;
        auVar110._20_4_ = auVar111._20_4_ * -fVar175;
        auVar110._24_4_ = auVar111._24_4_ * -fVar227;
        auVar110._28_4_ = auVar114._28_4_;
        auVar111 = vmulps_avx512vl(auVar111,ZEXT1632(auVar95));
        auVar104 = ZEXT1632(auVar95);
        auVar109 = vfmadd213ps_avx512vl(auVar115,auVar115,auVar104);
        auVar86 = vfmadd231ps_fma(auVar109,auVar116,auVar116);
        auVar108 = vrsqrt14ps_avx512vl(ZEXT1632(auVar86));
        fVar175 = auVar108._0_4_;
        fVar226 = auVar108._4_4_;
        fVar227 = auVar108._8_4_;
        fVar84 = auVar108._12_4_;
        fVar85 = auVar108._16_4_;
        fVar137 = auVar108._20_4_;
        fVar138 = auVar108._24_4_;
        auVar109._4_4_ = fVar226 * fVar226 * fVar226 * auVar86._4_4_ * -0.5;
        auVar109._0_4_ = fVar175 * fVar175 * fVar175 * auVar86._0_4_ * -0.5;
        auVar109._8_4_ = fVar227 * fVar227 * fVar227 * auVar86._8_4_ * -0.5;
        auVar109._12_4_ = fVar84 * fVar84 * fVar84 * auVar86._12_4_ * -0.5;
        auVar109._16_4_ = fVar85 * fVar85 * fVar85 * -0.0;
        auVar109._20_4_ = fVar137 * fVar137 * fVar137 * -0.0;
        auVar109._24_4_ = fVar138 * fVar138 * fVar138 * -0.0;
        auVar109._28_4_ = 0;
        auVar109 = vfmadd231ps_avx512vl(auVar109,auVar97,auVar108);
        auVar98._4_4_ = auVar116._4_4_ * auVar109._4_4_;
        auVar98._0_4_ = auVar116._0_4_ * auVar109._0_4_;
        auVar98._8_4_ = auVar116._8_4_ * auVar109._8_4_;
        auVar98._12_4_ = auVar116._12_4_ * auVar109._12_4_;
        auVar98._16_4_ = auVar116._16_4_ * auVar109._16_4_;
        auVar98._20_4_ = auVar116._20_4_ * auVar109._20_4_;
        auVar98._24_4_ = auVar116._24_4_ * auVar109._24_4_;
        auVar98._28_4_ = auVar108._28_4_;
        auVar108._4_4_ = -auVar115._4_4_ * auVar109._4_4_;
        auVar108._0_4_ = -auVar115._0_4_ * auVar109._0_4_;
        auVar108._8_4_ = -auVar115._8_4_ * auVar109._8_4_;
        auVar108._12_4_ = -auVar115._12_4_ * auVar109._12_4_;
        auVar108._16_4_ = -fVar228 * auVar109._16_4_;
        auVar108._20_4_ = -fVar174 * auVar109._20_4_;
        auVar108._24_4_ = -fVar187 * auVar109._24_4_;
        auVar108._28_4_ = uVar75 ^ 0x80000000;
        auVar109 = vmulps_avx512vl(auVar109,auVar104);
        auVar86 = vfmadd213ps_fma(auVar112,auVar105,auVar100);
        auVar87 = vfmadd213ps_fma(auVar110,auVar105,auVar101);
        auVar97 = vfmadd213ps_avx512vl(auVar111,auVar105,auVar102);
        auVar103 = vfmadd213ps_avx512vl(auVar98,ZEXT1632(auVar27),ZEXT1632(auVar25));
        auVar92 = vfnmadd213ps_fma(auVar112,auVar105,auVar100);
        auVar100 = ZEXT1632(auVar27);
        auVar93 = vfmadd213ps_fma(auVar108,auVar100,ZEXT1632(auVar26));
        auVar94 = vfnmadd213ps_fma(auVar110,auVar105,auVar101);
        auVar22 = vfmadd213ps_fma(auVar109,auVar100,auVar99);
        auVar112 = vfnmadd231ps_avx512vl(auVar102,auVar105,auVar111);
        auVar25 = vfnmadd213ps_fma(auVar98,auVar100,ZEXT1632(auVar25));
        auVar26 = vfnmadd213ps_fma(auVar108,auVar100,ZEXT1632(auVar26));
        auVar242 = vfnmadd231ps_fma(auVar99,ZEXT1632(auVar27),auVar109);
        auVar110 = vsubps_avx512vl(auVar103,ZEXT1632(auVar92));
        auVar111 = vsubps_avx(ZEXT1632(auVar93),ZEXT1632(auVar94));
        auVar109 = vsubps_avx512vl(ZEXT1632(auVar22),auVar112);
        auVar98 = vmulps_avx512vl(auVar111,auVar112);
        auVar23 = vfmsub231ps_fma(auVar98,ZEXT1632(auVar94),auVar109);
        auVar99._4_4_ = auVar92._4_4_ * auVar109._4_4_;
        auVar99._0_4_ = auVar92._0_4_ * auVar109._0_4_;
        auVar99._8_4_ = auVar92._8_4_ * auVar109._8_4_;
        auVar99._12_4_ = auVar92._12_4_ * auVar109._12_4_;
        auVar99._16_4_ = auVar109._16_4_ * 0.0;
        auVar99._20_4_ = auVar109._20_4_ * 0.0;
        auVar99._24_4_ = auVar109._24_4_ * 0.0;
        auVar99._28_4_ = auVar109._28_4_;
        auVar109 = vfmsub231ps_avx512vl(auVar99,auVar112,auVar110);
        auVar102._4_4_ = auVar94._4_4_ * auVar110._4_4_;
        auVar102._0_4_ = auVar94._0_4_ * auVar110._0_4_;
        auVar102._8_4_ = auVar94._8_4_ * auVar110._8_4_;
        auVar102._12_4_ = auVar94._12_4_ * auVar110._12_4_;
        auVar102._16_4_ = auVar110._16_4_ * 0.0;
        auVar102._20_4_ = auVar110._20_4_ * 0.0;
        auVar102._24_4_ = auVar110._24_4_ * 0.0;
        auVar102._28_4_ = auVar110._28_4_;
        auVar24 = vfmsub231ps_fma(auVar102,ZEXT1632(auVar92),auVar111);
        auVar111 = vfmadd231ps_avx512vl(ZEXT1632(auVar24),auVar104,auVar109);
        auVar111 = vfmadd231ps_avx512vl(auVar111,auVar104,ZEXT1632(auVar23));
        auVar106 = ZEXT1632(auVar95);
        uVar74 = vcmpps_avx512vl(auVar111,auVar106,2);
        bVar73 = (byte)uVar74;
        fVar84 = (float)((uint)(bVar73 & 1) * auVar86._0_4_ |
                        (uint)!(bool)(bVar73 & 1) * auVar25._0_4_);
        bVar13 = (bool)((byte)(uVar74 >> 1) & 1);
        fVar137 = (float)((uint)bVar13 * auVar86._4_4_ | (uint)!bVar13 * auVar25._4_4_);
        bVar13 = (bool)((byte)(uVar74 >> 2) & 1);
        fVar139 = (float)((uint)bVar13 * auVar86._8_4_ | (uint)!bVar13 * auVar25._8_4_);
        bVar13 = (bool)((byte)(uVar74 >> 3) & 1);
        fVar142 = (float)((uint)bVar13 * auVar86._12_4_ | (uint)!bVar13 * auVar25._12_4_);
        auVar108 = ZEXT1632(CONCAT412(fVar142,CONCAT48(fVar139,CONCAT44(fVar137,fVar84))));
        fVar85 = (float)((uint)(bVar73 & 1) * auVar87._0_4_ |
                        (uint)!(bool)(bVar73 & 1) * auVar26._0_4_);
        bVar13 = (bool)((byte)(uVar74 >> 1) & 1);
        fVar138 = (float)((uint)bVar13 * auVar87._4_4_ | (uint)!bVar13 * auVar26._4_4_);
        bVar13 = (bool)((byte)(uVar74 >> 2) & 1);
        fVar140 = (float)((uint)bVar13 * auVar87._8_4_ | (uint)!bVar13 * auVar26._8_4_);
        bVar13 = (bool)((byte)(uVar74 >> 3) & 1);
        fVar143 = (float)((uint)bVar13 * auVar87._12_4_ | (uint)!bVar13 * auVar26._12_4_);
        auVar99 = ZEXT1632(CONCAT412(fVar143,CONCAT48(fVar140,CONCAT44(fVar138,fVar85))));
        auVar104._0_4_ =
             (float)((uint)(bVar73 & 1) * auVar97._0_4_ | (uint)!(bool)(bVar73 & 1) * auVar242._0_4_
                    );
        bVar13 = (bool)((byte)(uVar74 >> 1) & 1);
        auVar104._4_4_ = (float)((uint)bVar13 * auVar97._4_4_ | (uint)!bVar13 * auVar242._4_4_);
        bVar13 = (bool)((byte)(uVar74 >> 2) & 1);
        auVar104._8_4_ = (float)((uint)bVar13 * auVar97._8_4_ | (uint)!bVar13 * auVar242._8_4_);
        bVar13 = (bool)((byte)(uVar74 >> 3) & 1);
        auVar104._12_4_ = (float)((uint)bVar13 * auVar97._12_4_ | (uint)!bVar13 * auVar242._12_4_);
        fVar226 = (float)((uint)((byte)(uVar74 >> 4) & 1) * auVar97._16_4_);
        auVar104._16_4_ = fVar226;
        fVar175 = (float)((uint)((byte)(uVar74 >> 5) & 1) * auVar97._20_4_);
        auVar104._20_4_ = fVar175;
        fVar227 = (float)((uint)((byte)(uVar74 >> 6) & 1) * auVar97._24_4_);
        auVar104._24_4_ = fVar227;
        iVar1 = (uint)(byte)(uVar74 >> 7) * auVar97._28_4_;
        auVar104._28_4_ = iVar1;
        auVar110 = vblendmps_avx512vl(ZEXT1632(auVar92),auVar103);
        auVar117._0_4_ =
             (uint)(bVar73 & 1) * auVar110._0_4_ | (uint)!(bool)(bVar73 & 1) * auVar23._0_4_;
        bVar13 = (bool)((byte)(uVar74 >> 1) & 1);
        auVar117._4_4_ = (uint)bVar13 * auVar110._4_4_ | (uint)!bVar13 * auVar23._4_4_;
        bVar13 = (bool)((byte)(uVar74 >> 2) & 1);
        auVar117._8_4_ = (uint)bVar13 * auVar110._8_4_ | (uint)!bVar13 * auVar23._8_4_;
        bVar13 = (bool)((byte)(uVar74 >> 3) & 1);
        auVar117._12_4_ = (uint)bVar13 * auVar110._12_4_ | (uint)!bVar13 * auVar23._12_4_;
        auVar117._16_4_ = (uint)((byte)(uVar74 >> 4) & 1) * auVar110._16_4_;
        auVar117._20_4_ = (uint)((byte)(uVar74 >> 5) & 1) * auVar110._20_4_;
        auVar117._24_4_ = (uint)((byte)(uVar74 >> 6) & 1) * auVar110._24_4_;
        auVar117._28_4_ = (uint)(byte)(uVar74 >> 7) * auVar110._28_4_;
        auVar110 = vblendmps_avx512vl(ZEXT1632(auVar94),ZEXT1632(auVar93));
        auVar118._0_4_ =
             (float)((uint)(bVar73 & 1) * auVar110._0_4_ | (uint)!(bool)(bVar73 & 1) * auVar87._0_4_
                    );
        bVar13 = (bool)((byte)(uVar74 >> 1) & 1);
        auVar118._4_4_ = (float)((uint)bVar13 * auVar110._4_4_ | (uint)!bVar13 * auVar87._4_4_);
        bVar13 = (bool)((byte)(uVar74 >> 2) & 1);
        auVar118._8_4_ = (float)((uint)bVar13 * auVar110._8_4_ | (uint)!bVar13 * auVar87._8_4_);
        bVar13 = (bool)((byte)(uVar74 >> 3) & 1);
        auVar118._12_4_ = (float)((uint)bVar13 * auVar110._12_4_ | (uint)!bVar13 * auVar87._12_4_);
        fVar187 = (float)((uint)((byte)(uVar74 >> 4) & 1) * auVar110._16_4_);
        auVar118._16_4_ = fVar187;
        fVar174 = (float)((uint)((byte)(uVar74 >> 5) & 1) * auVar110._20_4_);
        auVar118._20_4_ = fVar174;
        fVar228 = (float)((uint)((byte)(uVar74 >> 6) & 1) * auVar110._24_4_);
        auVar118._24_4_ = fVar228;
        auVar118._28_4_ = (uint)(byte)(uVar74 >> 7) * auVar110._28_4_;
        auVar110 = vblendmps_avx512vl(auVar112,ZEXT1632(auVar22));
        auVar119._0_4_ =
             (float)((uint)(bVar73 & 1) * auVar110._0_4_ | (uint)!(bool)(bVar73 & 1) * auVar97._0_4_
                    );
        bVar13 = (bool)((byte)(uVar74 >> 1) & 1);
        auVar119._4_4_ = (float)((uint)bVar13 * auVar110._4_4_ | (uint)!bVar13 * auVar97._4_4_);
        bVar13 = (bool)((byte)(uVar74 >> 2) & 1);
        auVar119._8_4_ = (float)((uint)bVar13 * auVar110._8_4_ | (uint)!bVar13 * auVar97._8_4_);
        bVar13 = (bool)((byte)(uVar74 >> 3) & 1);
        auVar119._12_4_ = (float)((uint)bVar13 * auVar110._12_4_ | (uint)!bVar13 * auVar97._12_4_);
        bVar13 = (bool)((byte)(uVar74 >> 4) & 1);
        auVar119._16_4_ = (float)((uint)bVar13 * auVar110._16_4_ | (uint)!bVar13 * auVar97._16_4_);
        bVar13 = (bool)((byte)(uVar74 >> 5) & 1);
        auVar119._20_4_ = (float)((uint)bVar13 * auVar110._20_4_ | (uint)!bVar13 * auVar97._20_4_);
        bVar13 = (bool)((byte)(uVar74 >> 6) & 1);
        auVar119._24_4_ = (float)((uint)bVar13 * auVar110._24_4_ | (uint)!bVar13 * auVar97._24_4_);
        bVar13 = SUB81(uVar74 >> 7,0);
        auVar119._28_4_ = (uint)bVar13 * auVar110._28_4_ | (uint)!bVar13 * auVar97._28_4_;
        auVar120._0_4_ =
             (uint)(bVar73 & 1) * (int)auVar92._0_4_ | (uint)!(bool)(bVar73 & 1) * auVar103._0_4_;
        bVar13 = (bool)((byte)(uVar74 >> 1) & 1);
        auVar120._4_4_ = (uint)bVar13 * (int)auVar92._4_4_ | (uint)!bVar13 * auVar103._4_4_;
        bVar13 = (bool)((byte)(uVar74 >> 2) & 1);
        auVar120._8_4_ = (uint)bVar13 * (int)auVar92._8_4_ | (uint)!bVar13 * auVar103._8_4_;
        bVar13 = (bool)((byte)(uVar74 >> 3) & 1);
        auVar120._12_4_ = (uint)bVar13 * (int)auVar92._12_4_ | (uint)!bVar13 * auVar103._12_4_;
        auVar120._16_4_ = (uint)!(bool)((byte)(uVar74 >> 4) & 1) * auVar103._16_4_;
        auVar120._20_4_ = (uint)!(bool)((byte)(uVar74 >> 5) & 1) * auVar103._20_4_;
        auVar120._24_4_ = (uint)!(bool)((byte)(uVar74 >> 6) & 1) * auVar103._24_4_;
        auVar120._28_4_ = (uint)!SUB81(uVar74 >> 7,0) * auVar103._28_4_;
        bVar13 = (bool)((byte)(uVar74 >> 1) & 1);
        bVar15 = (bool)((byte)(uVar74 >> 2) & 1);
        bVar16 = (bool)((byte)(uVar74 >> 3) & 1);
        auVar121._0_4_ =
             (uint)(bVar73 & 1) * auVar112._0_4_ | (uint)!(bool)(bVar73 & 1) * auVar22._0_4_;
        bVar14 = (bool)((byte)(uVar74 >> 1) & 1);
        auVar121._4_4_ = (uint)bVar14 * auVar112._4_4_ | (uint)!bVar14 * auVar22._4_4_;
        bVar14 = (bool)((byte)(uVar74 >> 2) & 1);
        auVar121._8_4_ = (uint)bVar14 * auVar112._8_4_ | (uint)!bVar14 * auVar22._8_4_;
        bVar14 = (bool)((byte)(uVar74 >> 3) & 1);
        auVar121._12_4_ = (uint)bVar14 * auVar112._12_4_ | (uint)!bVar14 * auVar22._12_4_;
        auVar121._16_4_ = (uint)((byte)(uVar74 >> 4) & 1) * auVar112._16_4_;
        auVar121._20_4_ = (uint)((byte)(uVar74 >> 5) & 1) * auVar112._20_4_;
        auVar121._24_4_ = (uint)((byte)(uVar74 >> 6) & 1) * auVar112._24_4_;
        iVar2 = (uint)(byte)(uVar74 >> 7) * auVar112._28_4_;
        auVar121._28_4_ = iVar2;
        auVar102 = vsubps_avx512vl(auVar120,auVar108);
        auVar112 = vsubps_avx(ZEXT1632(CONCAT412((uint)bVar16 * (int)auVar94._12_4_ |
                                                 (uint)!bVar16 * auVar93._12_4_,
                                                 CONCAT48((uint)bVar15 * (int)auVar94._8_4_ |
                                                          (uint)!bVar15 * auVar93._8_4_,
                                                          CONCAT44((uint)bVar13 * (int)auVar94._4_4_
                                                                   | (uint)!bVar13 * auVar93._4_4_,
                                                                   (uint)(bVar73 & 1) *
                                                                   (int)auVar94._0_4_ |
                                                                   (uint)!(bool)(bVar73 & 1) *
                                                                   auVar93._0_4_)))),auVar99);
        auVar218 = ZEXT3264(auVar112);
        auVar110 = vsubps_avx(auVar121,auVar104);
        auVar109 = vsubps_avx(auVar108,auVar117);
        auVar223 = ZEXT3264(auVar109);
        auVar97 = vsubps_avx(auVar99,auVar118);
        auVar98 = vsubps_avx(auVar104,auVar119);
        auVar100._4_4_ = auVar110._4_4_ * fVar137;
        auVar100._0_4_ = auVar110._0_4_ * fVar84;
        auVar100._8_4_ = auVar110._8_4_ * fVar139;
        auVar100._12_4_ = auVar110._12_4_ * fVar142;
        auVar100._16_4_ = auVar110._16_4_ * 0.0;
        auVar100._20_4_ = auVar110._20_4_ * 0.0;
        auVar100._24_4_ = auVar110._24_4_ * 0.0;
        auVar100._28_4_ = iVar2;
        auVar86 = vfmsub231ps_fma(auVar100,auVar104,auVar102);
        auVar101._4_4_ = fVar138 * auVar102._4_4_;
        auVar101._0_4_ = fVar85 * auVar102._0_4_;
        auVar101._8_4_ = fVar140 * auVar102._8_4_;
        auVar101._12_4_ = fVar143 * auVar102._12_4_;
        auVar101._16_4_ = auVar102._16_4_ * 0.0;
        auVar101._20_4_ = auVar102._20_4_ * 0.0;
        auVar101._24_4_ = auVar102._24_4_ * 0.0;
        auVar101._28_4_ = auVar111._28_4_;
        auVar87 = vfmsub231ps_fma(auVar101,auVar108,auVar112);
        auVar111 = vfmadd231ps_avx512vl(ZEXT1632(auVar87),auVar106,ZEXT1632(auVar86));
        auVar202._0_4_ = auVar112._0_4_ * auVar104._0_4_;
        auVar202._4_4_ = auVar112._4_4_ * auVar104._4_4_;
        auVar202._8_4_ = auVar112._8_4_ * auVar104._8_4_;
        auVar202._12_4_ = auVar112._12_4_ * auVar104._12_4_;
        auVar202._16_4_ = auVar112._16_4_ * fVar226;
        auVar202._20_4_ = auVar112._20_4_ * fVar175;
        auVar202._24_4_ = auVar112._24_4_ * fVar227;
        auVar202._28_4_ = 0;
        auVar86 = vfmsub231ps_fma(auVar202,auVar99,auVar110);
        auVar100 = vfmadd231ps_avx512vl(auVar111,auVar106,ZEXT1632(auVar86));
        auVar111 = vmulps_avx512vl(auVar98,auVar117);
        auVar111 = vfmsub231ps_avx512vl(auVar111,auVar109,auVar119);
        auVar103._4_4_ = auVar97._4_4_ * auVar119._4_4_;
        auVar103._0_4_ = auVar97._0_4_ * auVar119._0_4_;
        auVar103._8_4_ = auVar97._8_4_ * auVar119._8_4_;
        auVar103._12_4_ = auVar97._12_4_ * auVar119._12_4_;
        auVar103._16_4_ = auVar97._16_4_ * auVar119._16_4_;
        auVar103._20_4_ = auVar97._20_4_ * auVar119._20_4_;
        auVar103._24_4_ = auVar97._24_4_ * auVar119._24_4_;
        auVar103._28_4_ = auVar119._28_4_;
        auVar86 = vfmsub231ps_fma(auVar103,auVar118,auVar98);
        auVar203._0_4_ = auVar118._0_4_ * auVar109._0_4_;
        auVar203._4_4_ = auVar118._4_4_ * auVar109._4_4_;
        auVar203._8_4_ = auVar118._8_4_ * auVar109._8_4_;
        auVar203._12_4_ = auVar118._12_4_ * auVar109._12_4_;
        auVar203._16_4_ = fVar187 * auVar109._16_4_;
        auVar203._20_4_ = fVar174 * auVar109._20_4_;
        auVar203._24_4_ = fVar228 * auVar109._24_4_;
        auVar203._28_4_ = 0;
        auVar87 = vfmsub231ps_fma(auVar203,auVar97,auVar117);
        auVar111 = vfmadd231ps_avx512vl(ZEXT1632(auVar87),auVar106,auVar111);
        auVar101 = vfmadd231ps_avx512vl(auVar111,auVar106,ZEXT1632(auVar86));
        auVar208 = ZEXT3264(auVar101);
        auVar111 = vmaxps_avx(auVar100,auVar101);
        uVar166 = vcmpps_avx512vl(auVar111,auVar106,2);
        bVar82 = bVar82 & (byte)uVar166;
        if (bVar82 != 0) {
          uVar147 = *(undefined4 *)(ray + k * 4 + 0x100);
          auVar238._4_4_ = uVar147;
          auVar238._0_4_ = uVar147;
          auVar238._8_4_ = uVar147;
          auVar238._12_4_ = uVar147;
          auVar238._16_4_ = uVar147;
          auVar238._20_4_ = uVar147;
          auVar238._24_4_ = uVar147;
          auVar238._28_4_ = uVar147;
          auVar241 = ZEXT3264(auVar238);
          auVar41._4_4_ = auVar98._4_4_ * auVar112._4_4_;
          auVar41._0_4_ = auVar98._0_4_ * auVar112._0_4_;
          auVar41._8_4_ = auVar98._8_4_ * auVar112._8_4_;
          auVar41._12_4_ = auVar98._12_4_ * auVar112._12_4_;
          auVar41._16_4_ = auVar98._16_4_ * auVar112._16_4_;
          auVar41._20_4_ = auVar98._20_4_ * auVar112._20_4_;
          auVar41._24_4_ = auVar98._24_4_ * auVar112._24_4_;
          auVar41._28_4_ = auVar111._28_4_;
          auVar22 = vfmsub231ps_fma(auVar41,auVar97,auVar110);
          auVar42._4_4_ = auVar110._4_4_ * auVar109._4_4_;
          auVar42._0_4_ = auVar110._0_4_ * auVar109._0_4_;
          auVar42._8_4_ = auVar110._8_4_ * auVar109._8_4_;
          auVar42._12_4_ = auVar110._12_4_ * auVar109._12_4_;
          auVar42._16_4_ = auVar110._16_4_ * auVar109._16_4_;
          auVar42._20_4_ = auVar110._20_4_ * auVar109._20_4_;
          auVar42._24_4_ = auVar110._24_4_ * auVar109._24_4_;
          auVar42._28_4_ = auVar110._28_4_;
          auVar93 = vfmsub231ps_fma(auVar42,auVar102,auVar98);
          auVar43._4_4_ = auVar97._4_4_ * auVar102._4_4_;
          auVar43._0_4_ = auVar97._0_4_ * auVar102._0_4_;
          auVar43._8_4_ = auVar97._8_4_ * auVar102._8_4_;
          auVar43._12_4_ = auVar97._12_4_ * auVar102._12_4_;
          auVar43._16_4_ = auVar97._16_4_ * auVar102._16_4_;
          auVar43._20_4_ = auVar97._20_4_ * auVar102._20_4_;
          auVar43._24_4_ = auVar97._24_4_ * auVar102._24_4_;
          auVar43._28_4_ = auVar97._28_4_;
          auVar23 = vfmsub231ps_fma(auVar43,auVar109,auVar112);
          auVar86 = vfmadd213ps_fma(ZEXT832(0) << 0x20,ZEXT1632(auVar93),ZEXT1632(auVar23));
          auVar87 = vfmadd231ps_fma(ZEXT1632(auVar86),ZEXT1632(auVar22),ZEXT1232(ZEXT412(0)) << 0x20
                                   );
          auVar111 = vrcp14ps_avx512vl(ZEXT1632(auVar87));
          auVar223 = ZEXT3264(auVar111);
          auVar36._8_4_ = 0x3f800000;
          auVar36._0_8_ = 0x3f8000003f800000;
          auVar36._12_4_ = 0x3f800000;
          auVar36._16_4_ = 0x3f800000;
          auVar36._20_4_ = 0x3f800000;
          auVar36._24_4_ = 0x3f800000;
          auVar36._28_4_ = 0x3f800000;
          auVar112 = vfnmadd213ps_avx512vl(auVar111,ZEXT1632(auVar87),auVar36);
          auVar86 = vfmadd132ps_fma(auVar112,auVar111,auVar111);
          auVar218 = ZEXT1664(auVar86);
          auVar44._4_4_ = auVar23._4_4_ * auVar104._4_4_;
          auVar44._0_4_ = auVar23._0_4_ * auVar104._0_4_;
          auVar44._8_4_ = auVar23._8_4_ * auVar104._8_4_;
          auVar44._12_4_ = auVar23._12_4_ * auVar104._12_4_;
          auVar44._16_4_ = fVar226 * 0.0;
          auVar44._20_4_ = fVar175 * 0.0;
          auVar44._24_4_ = fVar227 * 0.0;
          auVar44._28_4_ = iVar1;
          auVar93 = vfmadd231ps_fma(auVar44,auVar99,ZEXT1632(auVar93));
          auVar93 = vfmadd231ps_fma(ZEXT1632(auVar93),auVar108,ZEXT1632(auVar22));
          fVar175 = auVar86._0_4_;
          fVar226 = auVar86._4_4_;
          fVar227 = auVar86._8_4_;
          fVar228 = auVar86._12_4_;
          local_5e0 = ZEXT1632(CONCAT412(auVar93._12_4_ * fVar228,
                                         CONCAT48(auVar93._8_4_ * fVar227,
                                                  CONCAT44(auVar93._4_4_ * fVar226,
                                                           auVar93._0_4_ * fVar175))));
          auVar225 = ZEXT3264(local_5e0);
          auVar155._4_4_ = local_560;
          auVar155._0_4_ = local_560;
          auVar155._8_4_ = local_560;
          auVar155._12_4_ = local_560;
          auVar155._16_4_ = local_560;
          auVar155._20_4_ = local_560;
          auVar155._24_4_ = local_560;
          auVar155._28_4_ = local_560;
          uVar166 = vcmpps_avx512vl(local_5e0,auVar238,2);
          uVar28 = vcmpps_avx512vl(auVar155,local_5e0,2);
          bVar82 = (byte)uVar166 & (byte)uVar28 & bVar82;
          if (bVar82 != 0) {
            uVar83 = vcmpps_avx512vl(ZEXT1632(auVar87),ZEXT1232(ZEXT412(0)) << 0x20,4);
            uVar83 = bVar82 & uVar83;
            if ((char)uVar83 != '\0') {
              fVar174 = auVar100._0_4_ * fVar175;
              fVar187 = auVar100._4_4_ * fVar226;
              auVar45._4_4_ = fVar187;
              auVar45._0_4_ = fVar174;
              fVar84 = auVar100._8_4_ * fVar227;
              auVar45._8_4_ = fVar84;
              fVar85 = auVar100._12_4_ * fVar228;
              auVar45._12_4_ = fVar85;
              fVar137 = auVar100._16_4_ * 0.0;
              auVar45._16_4_ = fVar137;
              fVar138 = auVar100._20_4_ * 0.0;
              auVar45._20_4_ = fVar138;
              fVar139 = auVar100._24_4_ * 0.0;
              auVar45._24_4_ = fVar139;
              auVar45._28_4_ = auVar100._28_4_;
              auVar156._8_4_ = 0x3f800000;
              auVar156._0_8_ = 0x3f8000003f800000;
              auVar156._12_4_ = 0x3f800000;
              auVar156._16_4_ = 0x3f800000;
              auVar156._20_4_ = 0x3f800000;
              auVar156._24_4_ = 0x3f800000;
              auVar156._28_4_ = 0x3f800000;
              auVar111 = vsubps_avx(auVar156,auVar45);
              local_400._0_4_ =
                   (float)((uint)(bVar73 & 1) * (int)fVar174 |
                          (uint)!(bool)(bVar73 & 1) * auVar111._0_4_);
              bVar13 = (bool)((byte)(uVar74 >> 1) & 1);
              local_400._4_4_ =
                   (float)((uint)bVar13 * (int)fVar187 | (uint)!bVar13 * auVar111._4_4_);
              bVar13 = (bool)((byte)(uVar74 >> 2) & 1);
              local_400._8_4_ = (float)((uint)bVar13 * (int)fVar84 | (uint)!bVar13 * auVar111._8_4_)
              ;
              bVar13 = (bool)((byte)(uVar74 >> 3) & 1);
              local_400._12_4_ =
                   (float)((uint)bVar13 * (int)fVar85 | (uint)!bVar13 * auVar111._12_4_);
              bVar13 = (bool)((byte)(uVar74 >> 4) & 1);
              local_400._16_4_ =
                   (float)((uint)bVar13 * (int)fVar137 | (uint)!bVar13 * auVar111._16_4_);
              bVar13 = (bool)((byte)(uVar74 >> 5) & 1);
              local_400._20_4_ =
                   (float)((uint)bVar13 * (int)fVar138 | (uint)!bVar13 * auVar111._20_4_);
              bVar13 = (bool)((byte)(uVar74 >> 6) & 1);
              local_400._24_4_ =
                   (float)((uint)bVar13 * (int)fVar139 | (uint)!bVar13 * auVar111._24_4_);
              bVar13 = SUB81(uVar74 >> 7,0);
              local_400._28_4_ =
                   (float)((uint)bVar13 * auVar100._28_4_ | (uint)!bVar13 * auVar111._28_4_);
              auVar111 = vsubps_avx(ZEXT1632(auVar27),auVar105);
              auVar86 = vfmadd213ps_fma(auVar111,local_400,auVar105);
              uVar147 = *(undefined4 *)((long)pre->ray_space + k * 4 + -0x20);
              auVar105._4_4_ = uVar147;
              auVar105._0_4_ = uVar147;
              auVar105._8_4_ = uVar147;
              auVar105._12_4_ = uVar147;
              auVar105._16_4_ = uVar147;
              auVar105._20_4_ = uVar147;
              auVar105._24_4_ = uVar147;
              auVar105._28_4_ = uVar147;
              auVar111 = vmulps_avx512vl(ZEXT1632(CONCAT412(auVar86._12_4_ + auVar86._12_4_,
                                                            CONCAT48(auVar86._8_4_ + auVar86._8_4_,
                                                                     CONCAT44(auVar86._4_4_ +
                                                                              auVar86._4_4_,
                                                                              auVar86._0_4_ +
                                                                              auVar86._0_4_)))),
                                         auVar105);
              uVar29 = vcmpps_avx512vl(local_5e0,auVar111,6);
              uVar83 = uVar83 & uVar29;
              bVar82 = (byte)uVar83;
              if (bVar82 != 0) {
                auVar185._0_4_ = auVar101._0_4_ * fVar175;
                auVar185._4_4_ = auVar101._4_4_ * fVar226;
                auVar185._8_4_ = auVar101._8_4_ * fVar227;
                auVar185._12_4_ = auVar101._12_4_ * fVar228;
                auVar185._16_4_ = auVar101._16_4_ * 0.0;
                auVar185._20_4_ = auVar101._20_4_ * 0.0;
                auVar185._24_4_ = auVar101._24_4_ * 0.0;
                auVar185._28_4_ = 0;
                auVar191._8_4_ = 0x3f800000;
                auVar191._0_8_ = 0x3f8000003f800000;
                auVar191._12_4_ = 0x3f800000;
                auVar191._16_4_ = 0x3f800000;
                auVar191._20_4_ = 0x3f800000;
                auVar191._24_4_ = 0x3f800000;
                auVar191._28_4_ = 0x3f800000;
                auVar111 = vsubps_avx(auVar191,auVar185);
                auVar122._0_4_ =
                     (uint)(bVar73 & 1) * (int)auVar185._0_4_ |
                     (uint)!(bool)(bVar73 & 1) * auVar111._0_4_;
                bVar13 = (bool)((byte)(uVar74 >> 1) & 1);
                auVar122._4_4_ = (uint)bVar13 * (int)auVar185._4_4_ | (uint)!bVar13 * auVar111._4_4_
                ;
                bVar13 = (bool)((byte)(uVar74 >> 2) & 1);
                auVar122._8_4_ = (uint)bVar13 * (int)auVar185._8_4_ | (uint)!bVar13 * auVar111._8_4_
                ;
                bVar13 = (bool)((byte)(uVar74 >> 3) & 1);
                auVar122._12_4_ =
                     (uint)bVar13 * (int)auVar185._12_4_ | (uint)!bVar13 * auVar111._12_4_;
                bVar13 = (bool)((byte)(uVar74 >> 4) & 1);
                auVar122._16_4_ =
                     (uint)bVar13 * (int)auVar185._16_4_ | (uint)!bVar13 * auVar111._16_4_;
                bVar13 = (bool)((byte)(uVar74 >> 5) & 1);
                auVar122._20_4_ =
                     (uint)bVar13 * (int)auVar185._20_4_ | (uint)!bVar13 * auVar111._20_4_;
                bVar13 = (bool)((byte)(uVar74 >> 6) & 1);
                auVar122._24_4_ =
                     (uint)bVar13 * (int)auVar185._24_4_ | (uint)!bVar13 * auVar111._24_4_;
                auVar122._28_4_ = (uint)!SUB81(uVar74 >> 7,0) * auVar111._28_4_;
                auVar37._8_4_ = 0x40000000;
                auVar37._0_8_ = 0x4000000040000000;
                auVar37._12_4_ = 0x40000000;
                auVar37._16_4_ = 0x40000000;
                auVar37._20_4_ = 0x40000000;
                auVar37._24_4_ = 0x40000000;
                auVar37._28_4_ = 0x40000000;
                local_3e0 = vfmsub132ps_avx512vl(auVar122,auVar191,auVar37);
                local_3a0 = 0;
                local_390 = local_670;
                uStack_388 = uStack_668;
                local_380 = local_680;
                uStack_378 = uStack_678;
                local_370 = local_690;
                uStack_368 = uStack_688;
                local_360 = local_6a0;
                uStack_358 = uStack_698;
                if ((pGVar79->mask & *(uint *)(ray + k * 4 + 0x120)) != 0) {
                  fVar175 = 1.0 / auVar107._0_4_;
                  local_340[0] = fVar175 * (local_400._0_4_ + 0.0);
                  local_340[1] = fVar175 * (local_400._4_4_ + 1.0);
                  local_340[2] = fVar175 * (local_400._8_4_ + 2.0);
                  local_340[3] = fVar175 * (local_400._12_4_ + 3.0);
                  fStack_330 = fVar175 * (local_400._16_4_ + 4.0);
                  fStack_32c = fVar175 * (local_400._20_4_ + 5.0);
                  fStack_328 = fVar175 * (local_400._24_4_ + 6.0);
                  fStack_324 = local_400._28_4_ + 7.0;
                  local_320 = local_3e0;
                  local_300 = local_5e0;
                  auVar157._8_4_ = 0x7f800000;
                  auVar157._0_8_ = 0x7f8000007f800000;
                  auVar157._12_4_ = 0x7f800000;
                  auVar157._16_4_ = 0x7f800000;
                  auVar157._20_4_ = 0x7f800000;
                  auVar157._24_4_ = 0x7f800000;
                  auVar157._28_4_ = 0x7f800000;
                  auVar111 = vblendmps_avx512vl(auVar157,local_5e0);
                  auVar123._0_4_ =
                       (uint)(bVar82 & 1) * auVar111._0_4_ | (uint)!(bool)(bVar82 & 1) * 0x7f800000;
                  bVar13 = (bool)((byte)(uVar83 >> 1) & 1);
                  auVar123._4_4_ = (uint)bVar13 * auVar111._4_4_ | (uint)!bVar13 * 0x7f800000;
                  bVar13 = (bool)((byte)(uVar83 >> 2) & 1);
                  auVar123._8_4_ = (uint)bVar13 * auVar111._8_4_ | (uint)!bVar13 * 0x7f800000;
                  bVar13 = (bool)((byte)(uVar83 >> 3) & 1);
                  auVar123._12_4_ = (uint)bVar13 * auVar111._12_4_ | (uint)!bVar13 * 0x7f800000;
                  bVar13 = (bool)((byte)(uVar83 >> 4) & 1);
                  auVar123._16_4_ = (uint)bVar13 * auVar111._16_4_ | (uint)!bVar13 * 0x7f800000;
                  bVar13 = (bool)((byte)(uVar83 >> 5) & 1);
                  auVar123._20_4_ = (uint)bVar13 * auVar111._20_4_ | (uint)!bVar13 * 0x7f800000;
                  bVar13 = (bool)((byte)(uVar83 >> 6) & 1);
                  auVar123._24_4_ = (uint)bVar13 * auVar111._24_4_ | (uint)!bVar13 * 0x7f800000;
                  bVar13 = SUB81(uVar83 >> 7,0);
                  auVar123._28_4_ = (uint)bVar13 * auVar111._28_4_ | (uint)!bVar13 * 0x7f800000;
                  auVar111 = vshufps_avx(auVar123,auVar123,0xb1);
                  auVar111 = vminps_avx(auVar123,auVar111);
                  auVar112 = vshufpd_avx(auVar111,auVar111,5);
                  auVar111 = vminps_avx(auVar111,auVar112);
                  auVar112 = vpermpd_avx2(auVar111,0x4e);
                  auVar111 = vminps_avx(auVar111,auVar112);
                  uVar166 = vcmpps_avx512vl(auVar123,auVar111,0);
                  uVar75 = (uint)uVar83;
                  if (((byte)uVar166 & bVar82) != 0) {
                    uVar75 = (uint)((byte)uVar166 & bVar82);
                  }
                  uVar76 = 0;
                  for (; (uVar75 & 1) == 0; uVar75 = uVar75 >> 1 | 0x80000000) {
                    uVar76 = uVar76 + 1;
                  }
                  uVar74 = (ulong)uVar76;
                  if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                     (pGVar79->intersectionFilterN != (RTCFilterFunctionN)0x0)) {
                    local_520 = vpbroadcastd_avx512vl();
                    local_540 = vpbroadcastd_avx512vl();
                    local_3c0 = local_5e0;
                    local_39c = iVar8;
                    do {
                      fVar175 = local_340[uVar74];
                      auVar172._4_4_ = fVar175;
                      auVar172._0_4_ = fVar175;
                      auVar172._8_4_ = fVar175;
                      auVar172._12_4_ = fVar175;
                      local_1c0._16_4_ = fVar175;
                      local_1c0._0_16_ = auVar172;
                      local_1c0._20_4_ = fVar175;
                      local_1c0._24_4_ = fVar175;
                      local_1c0._28_4_ = fVar175;
                      local_1a0 = *(undefined4 *)(local_320 + uVar74 * 4);
                      *(undefined4 *)(ray + k * 4 + 0x100) = *(undefined4 *)(local_300 + uVar74 * 4)
                      ;
                      local_660.context = context->user;
                      fVar226 = 1.0 - fVar175;
                      auVar35._8_4_ = 0x80000000;
                      auVar35._0_8_ = 0x8000000080000000;
                      auVar35._12_4_ = 0x80000000;
                      auVar93 = vxorps_avx512vl(ZEXT416((uint)fVar226),auVar35);
                      auVar86 = ZEXT416((uint)(fVar175 * fVar226 * 4.0));
                      auVar87 = vfnmsub213ss_fma(auVar172,auVar172,auVar86);
                      auVar86 = vfmadd213ss_fma(ZEXT416((uint)fVar226),ZEXT416((uint)fVar226),
                                                auVar86);
                      auVar223 = ZEXT464(0x3f000000);
                      fVar226 = fVar226 * auVar93._0_4_ * 0.5;
                      fVar227 = auVar87._0_4_ * 0.5;
                      fVar228 = auVar86._0_4_ * 0.5;
                      fVar175 = fVar175 * fVar175 * 0.5;
                      auVar214._0_4_ = fVar175 * fVar146;
                      auVar214._4_4_ = fVar175 * fVar163;
                      auVar214._8_4_ = fVar175 * fVar164;
                      auVar214._12_4_ = fVar175 * fVar165;
                      auVar153._4_4_ = fVar228;
                      auVar153._0_4_ = fVar228;
                      auVar153._8_4_ = fVar228;
                      auVar153._12_4_ = fVar228;
                      auVar86 = vfmadd132ps_fma(auVar153,auVar214,auVar91);
                      auVar201._4_4_ = fVar227;
                      auVar201._0_4_ = fVar227;
                      auVar201._8_4_ = fVar227;
                      auVar201._12_4_ = fVar227;
                      auVar86 = vfmadd132ps_fma(auVar201,auVar86,auVar21);
                      auVar154._4_4_ = fVar226;
                      auVar154._0_4_ = fVar226;
                      auVar154._8_4_ = fVar226;
                      auVar154._12_4_ = fVar226;
                      auVar86 = vfmadd132ps_fma(auVar154,auVar86,auVar20);
                      local_220 = auVar86._0_4_;
                      auVar207._8_4_ = 1;
                      auVar207._0_8_ = 0x100000001;
                      auVar207._12_4_ = 1;
                      auVar207._16_4_ = 1;
                      auVar207._20_4_ = 1;
                      auVar207._24_4_ = 1;
                      auVar207._28_4_ = 1;
                      local_200 = vpermps_avx2(auVar207,ZEXT1632(auVar86));
                      auVar208 = ZEXT3264(local_200);
                      auVar215._8_4_ = 2;
                      auVar215._0_8_ = 0x200000002;
                      auVar215._12_4_ = 2;
                      auVar217._16_4_ = 2;
                      auVar217._0_16_ = auVar215;
                      auVar217._20_4_ = 2;
                      auVar217._24_4_ = 2;
                      auVar217._28_4_ = 2;
                      auVar218 = ZEXT3264(auVar217);
                      local_1e0 = vpermps_avx2(auVar217,ZEXT1632(auVar86));
                      iStack_21c = local_220;
                      iStack_218 = local_220;
                      iStack_214 = local_220;
                      iStack_210 = local_220;
                      iStack_20c = local_220;
                      iStack_208 = local_220;
                      iStack_204 = local_220;
                      uStack_19c = local_1a0;
                      uStack_198 = local_1a0;
                      uStack_194 = local_1a0;
                      uStack_190 = local_1a0;
                      uStack_18c = local_1a0;
                      uStack_188 = local_1a0;
                      uStack_184 = local_1a0;
                      local_180 = local_540._0_8_;
                      uStack_178 = local_540._8_8_;
                      uStack_170 = local_540._16_8_;
                      uStack_168 = local_540._24_8_;
                      local_160 = local_520;
                      auVar111 = vpcmpeqd_avx2(local_520,local_520);
                      local_628[1] = auVar111;
                      *local_628 = auVar111;
                      local_140 = (local_660.context)->instID[0];
                      uStack_13c = local_140;
                      uStack_138 = local_140;
                      uStack_134 = local_140;
                      uStack_130 = local_140;
                      uStack_12c = local_140;
                      uStack_128 = local_140;
                      uStack_124 = local_140;
                      local_120 = (local_660.context)->instPrimID[0];
                      uStack_11c = local_120;
                      uStack_118 = local_120;
                      uStack_114 = local_120;
                      uStack_110 = local_120;
                      uStack_10c = local_120;
                      uStack_108 = local_120;
                      uStack_104 = local_120;
                      local_620 = local_2c0;
                      local_660.valid = (int *)local_620;
                      local_660.geometryUserPtr = pGVar79->userPtr;
                      local_660.hit = (RTCHitN *)&local_220;
                      local_660.N = 8;
                      local_5a0 = auVar241._0_32_;
                      local_660.ray = (RTCRayN *)ray;
                      if (pGVar79->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                        auVar208 = ZEXT1664(local_200._0_16_);
                        auVar218 = ZEXT1664(auVar215);
                        auVar223 = ZEXT1664(auVar223._0_16_);
                        (*pGVar79->intersectionFilterN)(&local_660);
                        auVar225 = ZEXT3264(local_5e0);
                        auVar241 = ZEXT3264(local_5a0);
                        auVar244 = ZEXT464(0xbf800000);
                        auVar86 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                        auVar243 = ZEXT1664(auVar86);
                      }
                      if (local_620 == (undefined1  [32])0x0) {
LAB_01bb96f1:
                        *(int *)(ray + k * 4 + 0x100) = auVar241._0_4_;
                      }
                      else {
                        p_Var12 = context->args->filter;
                        if ((p_Var12 != (RTCFilterFunctionN)0x0) &&
                           (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                             RTC_RAY_QUERY_FLAG_INCOHERENT ||
                            (((pGVar79->field_8).field_0x2 & 0x40) != 0)))) {
                          auVar208 = ZEXT1664(auVar208._0_16_);
                          auVar218 = ZEXT1664(auVar218._0_16_);
                          auVar223 = ZEXT1664(auVar223._0_16_);
                          (*p_Var12)(&local_660);
                          auVar225 = ZEXT3264(local_5e0);
                          auVar241 = ZEXT3264(local_5a0);
                          auVar244 = ZEXT464(0xbf800000);
                          auVar86 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                          auVar243 = ZEXT1664(auVar86);
                        }
                        if (local_620 == (undefined1  [32])0x0) goto LAB_01bb96f1;
                        uVar29 = vptestmd_avx512vl(local_620,local_620);
                        iVar1 = *(int *)(local_660.hit + 4);
                        iVar2 = *(int *)(local_660.hit + 8);
                        iVar66 = *(int *)(local_660.hit + 0xc);
                        iVar67 = *(int *)(local_660.hit + 0x10);
                        iVar68 = *(int *)(local_660.hit + 0x14);
                        iVar69 = *(int *)(local_660.hit + 0x18);
                        iVar70 = *(int *)(local_660.hit + 0x1c);
                        bVar82 = (byte)uVar29;
                        bVar13 = (bool)((byte)(uVar29 >> 1) & 1);
                        bVar14 = (bool)((byte)(uVar29 >> 2) & 1);
                        bVar15 = (bool)((byte)(uVar29 >> 3) & 1);
                        bVar16 = (bool)((byte)(uVar29 >> 4) & 1);
                        bVar17 = (bool)((byte)(uVar29 >> 5) & 1);
                        bVar18 = (bool)((byte)(uVar29 >> 6) & 1);
                        bVar19 = SUB81(uVar29 >> 7,0);
                        *(uint *)(local_660.ray + 0x180) =
                             (uint)(bVar82 & 1) * *(int *)local_660.hit |
                             (uint)!(bool)(bVar82 & 1) * *(int *)(local_660.ray + 0x180);
                        *(uint *)(local_660.ray + 0x184) =
                             (uint)bVar13 * iVar1 | (uint)!bVar13 * *(int *)(local_660.ray + 0x184);
                        *(uint *)(local_660.ray + 0x188) =
                             (uint)bVar14 * iVar2 | (uint)!bVar14 * *(int *)(local_660.ray + 0x188);
                        *(uint *)(local_660.ray + 0x18c) =
                             (uint)bVar15 * iVar66 | (uint)!bVar15 * *(int *)(local_660.ray + 0x18c)
                        ;
                        *(uint *)(local_660.ray + 400) =
                             (uint)bVar16 * iVar67 | (uint)!bVar16 * *(int *)(local_660.ray + 400);
                        *(uint *)(local_660.ray + 0x194) =
                             (uint)bVar17 * iVar68 | (uint)!bVar17 * *(int *)(local_660.ray + 0x194)
                        ;
                        *(uint *)(local_660.ray + 0x198) =
                             (uint)bVar18 * iVar69 | (uint)!bVar18 * *(int *)(local_660.ray + 0x198)
                        ;
                        *(uint *)(local_660.ray + 0x19c) =
                             (uint)bVar19 * iVar70 | (uint)!bVar19 * *(int *)(local_660.ray + 0x19c)
                        ;
                        iVar1 = *(int *)(local_660.hit + 0x24);
                        iVar2 = *(int *)(local_660.hit + 0x28);
                        iVar66 = *(int *)(local_660.hit + 0x2c);
                        iVar67 = *(int *)(local_660.hit + 0x30);
                        iVar68 = *(int *)(local_660.hit + 0x34);
                        iVar69 = *(int *)(local_660.hit + 0x38);
                        iVar70 = *(int *)(local_660.hit + 0x3c);
                        bVar13 = (bool)((byte)(uVar29 >> 1) & 1);
                        bVar14 = (bool)((byte)(uVar29 >> 2) & 1);
                        bVar15 = (bool)((byte)(uVar29 >> 3) & 1);
                        bVar16 = (bool)((byte)(uVar29 >> 4) & 1);
                        bVar17 = (bool)((byte)(uVar29 >> 5) & 1);
                        bVar18 = (bool)((byte)(uVar29 >> 6) & 1);
                        bVar19 = SUB81(uVar29 >> 7,0);
                        *(uint *)(local_660.ray + 0x1a0) =
                             (uint)(bVar82 & 1) * *(int *)(local_660.hit + 0x20) |
                             (uint)!(bool)(bVar82 & 1) * *(int *)(local_660.ray + 0x1a0);
                        *(uint *)(local_660.ray + 0x1a4) =
                             (uint)bVar13 * iVar1 | (uint)!bVar13 * *(int *)(local_660.ray + 0x1a4);
                        *(uint *)(local_660.ray + 0x1a8) =
                             (uint)bVar14 * iVar2 | (uint)!bVar14 * *(int *)(local_660.ray + 0x1a8);
                        *(uint *)(local_660.ray + 0x1ac) =
                             (uint)bVar15 * iVar66 | (uint)!bVar15 * *(int *)(local_660.ray + 0x1ac)
                        ;
                        *(uint *)(local_660.ray + 0x1b0) =
                             (uint)bVar16 * iVar67 | (uint)!bVar16 * *(int *)(local_660.ray + 0x1b0)
                        ;
                        *(uint *)(local_660.ray + 0x1b4) =
                             (uint)bVar17 * iVar68 | (uint)!bVar17 * *(int *)(local_660.ray + 0x1b4)
                        ;
                        *(uint *)(local_660.ray + 0x1b8) =
                             (uint)bVar18 * iVar69 | (uint)!bVar18 * *(int *)(local_660.ray + 0x1b8)
                        ;
                        *(uint *)(local_660.ray + 0x1bc) =
                             (uint)bVar19 * iVar70 | (uint)!bVar19 * *(int *)(local_660.ray + 0x1bc)
                        ;
                        iVar1 = *(int *)(local_660.hit + 0x44);
                        iVar2 = *(int *)(local_660.hit + 0x48);
                        iVar66 = *(int *)(local_660.hit + 0x4c);
                        iVar67 = *(int *)(local_660.hit + 0x50);
                        iVar68 = *(int *)(local_660.hit + 0x54);
                        iVar69 = *(int *)(local_660.hit + 0x58);
                        iVar70 = *(int *)(local_660.hit + 0x5c);
                        bVar13 = (bool)((byte)(uVar29 >> 1) & 1);
                        bVar14 = (bool)((byte)(uVar29 >> 2) & 1);
                        bVar15 = (bool)((byte)(uVar29 >> 3) & 1);
                        bVar16 = (bool)((byte)(uVar29 >> 4) & 1);
                        bVar17 = (bool)((byte)(uVar29 >> 5) & 1);
                        bVar18 = (bool)((byte)(uVar29 >> 6) & 1);
                        bVar19 = SUB81(uVar29 >> 7,0);
                        *(uint *)(local_660.ray + 0x1c0) =
                             (uint)(bVar82 & 1) * *(int *)(local_660.hit + 0x40) |
                             (uint)!(bool)(bVar82 & 1) * *(int *)(local_660.ray + 0x1c0);
                        *(uint *)(local_660.ray + 0x1c4) =
                             (uint)bVar13 * iVar1 | (uint)!bVar13 * *(int *)(local_660.ray + 0x1c4);
                        *(uint *)(local_660.ray + 0x1c8) =
                             (uint)bVar14 * iVar2 | (uint)!bVar14 * *(int *)(local_660.ray + 0x1c8);
                        *(uint *)(local_660.ray + 0x1cc) =
                             (uint)bVar15 * iVar66 | (uint)!bVar15 * *(int *)(local_660.ray + 0x1cc)
                        ;
                        *(uint *)(local_660.ray + 0x1d0) =
                             (uint)bVar16 * iVar67 | (uint)!bVar16 * *(int *)(local_660.ray + 0x1d0)
                        ;
                        *(uint *)(local_660.ray + 0x1d4) =
                             (uint)bVar17 * iVar68 | (uint)!bVar17 * *(int *)(local_660.ray + 0x1d4)
                        ;
                        *(uint *)(local_660.ray + 0x1d8) =
                             (uint)bVar18 * iVar69 | (uint)!bVar18 * *(int *)(local_660.ray + 0x1d8)
                        ;
                        *(uint *)(local_660.ray + 0x1dc) =
                             (uint)bVar19 * iVar70 | (uint)!bVar19 * *(int *)(local_660.ray + 0x1dc)
                        ;
                        iVar1 = *(int *)(local_660.hit + 100);
                        iVar2 = *(int *)(local_660.hit + 0x68);
                        iVar66 = *(int *)(local_660.hit + 0x6c);
                        iVar67 = *(int *)(local_660.hit + 0x70);
                        iVar68 = *(int *)(local_660.hit + 0x74);
                        iVar69 = *(int *)(local_660.hit + 0x78);
                        iVar70 = *(int *)(local_660.hit + 0x7c);
                        bVar13 = (bool)((byte)(uVar29 >> 1) & 1);
                        bVar14 = (bool)((byte)(uVar29 >> 2) & 1);
                        bVar15 = (bool)((byte)(uVar29 >> 3) & 1);
                        bVar16 = (bool)((byte)(uVar29 >> 4) & 1);
                        bVar17 = (bool)((byte)(uVar29 >> 5) & 1);
                        bVar18 = (bool)((byte)(uVar29 >> 6) & 1);
                        bVar19 = SUB81(uVar29 >> 7,0);
                        *(uint *)(local_660.ray + 0x1e0) =
                             (uint)(bVar82 & 1) * *(int *)(local_660.hit + 0x60) |
                             (uint)!(bool)(bVar82 & 1) * *(int *)(local_660.ray + 0x1e0);
                        *(uint *)(local_660.ray + 0x1e4) =
                             (uint)bVar13 * iVar1 | (uint)!bVar13 * *(int *)(local_660.ray + 0x1e4);
                        *(uint *)(local_660.ray + 0x1e8) =
                             (uint)bVar14 * iVar2 | (uint)!bVar14 * *(int *)(local_660.ray + 0x1e8);
                        *(uint *)(local_660.ray + 0x1ec) =
                             (uint)bVar15 * iVar66 | (uint)!bVar15 * *(int *)(local_660.ray + 0x1ec)
                        ;
                        *(uint *)(local_660.ray + 0x1f0) =
                             (uint)bVar16 * iVar67 | (uint)!bVar16 * *(int *)(local_660.ray + 0x1f0)
                        ;
                        *(uint *)(local_660.ray + 500) =
                             (uint)bVar17 * iVar68 | (uint)!bVar17 * *(int *)(local_660.ray + 500);
                        *(uint *)(local_660.ray + 0x1f8) =
                             (uint)bVar18 * iVar69 | (uint)!bVar18 * *(int *)(local_660.ray + 0x1f8)
                        ;
                        *(uint *)(local_660.ray + 0x1fc) =
                             (uint)bVar19 * iVar70 | (uint)!bVar19 * *(int *)(local_660.ray + 0x1fc)
                        ;
                        iVar1 = *(int *)(local_660.hit + 0x84);
                        iVar2 = *(int *)(local_660.hit + 0x88);
                        iVar66 = *(int *)(local_660.hit + 0x8c);
                        iVar67 = *(int *)(local_660.hit + 0x90);
                        iVar68 = *(int *)(local_660.hit + 0x94);
                        iVar69 = *(int *)(local_660.hit + 0x98);
                        iVar70 = *(int *)(local_660.hit + 0x9c);
                        bVar13 = (bool)((byte)(uVar29 >> 1) & 1);
                        bVar14 = (bool)((byte)(uVar29 >> 2) & 1);
                        bVar15 = (bool)((byte)(uVar29 >> 3) & 1);
                        bVar16 = (bool)((byte)(uVar29 >> 4) & 1);
                        bVar17 = (bool)((byte)(uVar29 >> 5) & 1);
                        bVar18 = (bool)((byte)(uVar29 >> 6) & 1);
                        bVar19 = SUB81(uVar29 >> 7,0);
                        *(uint *)(local_660.ray + 0x200) =
                             (uint)(bVar82 & 1) * *(int *)(local_660.hit + 0x80) |
                             (uint)!(bool)(bVar82 & 1) * *(int *)(local_660.ray + 0x200);
                        *(uint *)(local_660.ray + 0x204) =
                             (uint)bVar13 * iVar1 | (uint)!bVar13 * *(int *)(local_660.ray + 0x204);
                        *(uint *)(local_660.ray + 0x208) =
                             (uint)bVar14 * iVar2 | (uint)!bVar14 * *(int *)(local_660.ray + 0x208);
                        *(uint *)(local_660.ray + 0x20c) =
                             (uint)bVar15 * iVar66 | (uint)!bVar15 * *(int *)(local_660.ray + 0x20c)
                        ;
                        *(uint *)(local_660.ray + 0x210) =
                             (uint)bVar16 * iVar67 | (uint)!bVar16 * *(int *)(local_660.ray + 0x210)
                        ;
                        *(uint *)(local_660.ray + 0x214) =
                             (uint)bVar17 * iVar68 | (uint)!bVar17 * *(int *)(local_660.ray + 0x214)
                        ;
                        *(uint *)(local_660.ray + 0x218) =
                             (uint)bVar18 * iVar69 | (uint)!bVar18 * *(int *)(local_660.ray + 0x218)
                        ;
                        *(uint *)(local_660.ray + 0x21c) =
                             (uint)bVar19 * iVar70 | (uint)!bVar19 * *(int *)(local_660.ray + 0x21c)
                        ;
                        auVar111 = vmovdqu32_avx512vl(*(undefined1 (*) [32])(local_660.hit + 0xa0));
                        *(undefined1 (*) [32])(local_660.ray + 0x220) = auVar111;
                        auVar111 = vmovdqu32_avx512vl(*(undefined1 (*) [32])(local_660.hit + 0xc0));
                        *(undefined1 (*) [32])(local_660.ray + 0x240) = auVar111;
                        auVar111 = vmovdqa32_avx512vl(*(undefined1 (*) [32])(local_660.hit + 0xe0));
                        *(undefined1 (*) [32])(local_660.ray + 0x260) = auVar111;
                        auVar111 = vmovdqa32_avx512vl(*(undefined1 (*) [32])(local_660.hit + 0x100))
                        ;
                        *(undefined1 (*) [32])(local_660.ray + 0x280) = auVar111;
                        auVar241 = ZEXT464(*(uint *)(ray + k * 4 + 0x100));
                      }
                      bVar82 = ~(byte)(1 << ((uint)uVar74 & 0x1f)) & (byte)uVar83;
                      uVar147 = auVar241._0_4_;
                      auVar161._4_4_ = uVar147;
                      auVar161._0_4_ = uVar147;
                      auVar161._8_4_ = uVar147;
                      auVar161._12_4_ = uVar147;
                      auVar161._16_4_ = uVar147;
                      auVar161._20_4_ = uVar147;
                      auVar161._24_4_ = uVar147;
                      auVar161._28_4_ = uVar147;
                      uVar166 = vcmpps_avx512vl(auVar225._0_32_,auVar161,2);
                      if ((bVar82 & (byte)uVar166) == 0) goto LAB_01bb862c;
                      bVar82 = bVar82 & (byte)uVar166;
                      uVar83 = (ulong)bVar82;
                      auVar162._8_4_ = 0x7f800000;
                      auVar162._0_8_ = 0x7f8000007f800000;
                      auVar162._12_4_ = 0x7f800000;
                      auVar162._16_4_ = 0x7f800000;
                      auVar162._20_4_ = 0x7f800000;
                      auVar162._24_4_ = 0x7f800000;
                      auVar162._28_4_ = 0x7f800000;
                      auVar111 = vblendmps_avx512vl(auVar162,auVar225._0_32_);
                      auVar136._0_4_ =
                           (uint)(bVar82 & 1) * auVar111._0_4_ |
                           (uint)!(bool)(bVar82 & 1) * 0x7f800000;
                      bVar13 = (bool)(bVar82 >> 1 & 1);
                      auVar136._4_4_ = (uint)bVar13 * auVar111._4_4_ | (uint)!bVar13 * 0x7f800000;
                      bVar13 = (bool)(bVar82 >> 2 & 1);
                      auVar136._8_4_ = (uint)bVar13 * auVar111._8_4_ | (uint)!bVar13 * 0x7f800000;
                      bVar13 = (bool)(bVar82 >> 3 & 1);
                      auVar136._12_4_ = (uint)bVar13 * auVar111._12_4_ | (uint)!bVar13 * 0x7f800000;
                      bVar13 = (bool)(bVar82 >> 4 & 1);
                      auVar136._16_4_ = (uint)bVar13 * auVar111._16_4_ | (uint)!bVar13 * 0x7f800000;
                      bVar13 = (bool)(bVar82 >> 5 & 1);
                      auVar136._20_4_ = (uint)bVar13 * auVar111._20_4_ | (uint)!bVar13 * 0x7f800000;
                      bVar13 = (bool)(bVar82 >> 6 & 1);
                      auVar136._24_4_ = (uint)bVar13 * auVar111._24_4_ | (uint)!bVar13 * 0x7f800000;
                      auVar136._28_4_ =
                           (uint)(bVar82 >> 7) * auVar111._28_4_ |
                           (uint)!(bool)(bVar82 >> 7) * 0x7f800000;
                      auVar111 = vshufps_avx(auVar136,auVar136,0xb1);
                      auVar111 = vminps_avx(auVar136,auVar111);
                      auVar112 = vshufpd_avx(auVar111,auVar111,5);
                      auVar111 = vminps_avx(auVar111,auVar112);
                      auVar112 = vpermpd_avx2(auVar111,0x4e);
                      auVar111 = vminps_avx(auVar111,auVar112);
                      uVar166 = vcmpps_avx512vl(auVar136,auVar111,0);
                      bVar73 = (byte)uVar166 & bVar82;
                      if (bVar73 != 0) {
                        bVar82 = bVar73;
                      }
                      uVar75 = 0;
                      for (uVar76 = (uint)bVar82; (uVar76 & 1) == 0;
                          uVar76 = uVar76 >> 1 | 0x80000000) {
                        uVar75 = uVar75 + 1;
                      }
                      uVar74 = (ulong)uVar75;
                    } while( true );
                  }
                  fVar175 = local_340[uVar74];
                  uVar147 = *(undefined4 *)(local_320 + uVar74 * 4);
                  fVar226 = 1.0 - fVar175;
                  auVar31._8_4_ = 0x80000000;
                  auVar31._0_8_ = 0x8000000080000000;
                  auVar31._12_4_ = 0x80000000;
                  auVar93 = vxorps_avx512vl(ZEXT416((uint)fVar226),auVar31);
                  auVar86 = ZEXT416((uint)(fVar175 * fVar226 * 4.0));
                  auVar87 = vfnmsub213ss_fma(ZEXT416((uint)fVar175),ZEXT416((uint)fVar175),auVar86);
                  auVar86 = vfmadd213ss_fma(ZEXT416((uint)fVar226),ZEXT416((uint)fVar226),auVar86);
                  fVar226 = fVar226 * auVar93._0_4_ * 0.5;
                  fVar227 = auVar87._0_4_ * 0.5;
                  auVar218 = ZEXT464((uint)fVar227);
                  fVar228 = auVar86._0_4_ * 0.5;
                  fVar174 = fVar175 * fVar175 * 0.5;
                  auVar196._0_4_ = fVar174 * fVar146;
                  auVar196._4_4_ = fVar174 * fVar163;
                  auVar196._8_4_ = fVar174 * fVar164;
                  auVar196._12_4_ = fVar174 * fVar165;
                  auVar181._4_4_ = fVar228;
                  auVar181._0_4_ = fVar228;
                  auVar181._8_4_ = fVar228;
                  auVar181._12_4_ = fVar228;
                  auVar86 = vfmadd132ps_fma(auVar181,auVar196,auVar91);
                  auVar197._4_4_ = fVar227;
                  auVar197._0_4_ = fVar227;
                  auVar197._8_4_ = fVar227;
                  auVar197._12_4_ = fVar227;
                  auVar86 = vfmadd132ps_fma(auVar197,auVar86,auVar21);
                  auVar208 = ZEXT1664(auVar86);
                  auVar182._4_4_ = fVar226;
                  auVar182._0_4_ = fVar226;
                  auVar182._8_4_ = fVar226;
                  auVar182._12_4_ = fVar226;
                  auVar86 = vfmadd132ps_fma(auVar182,auVar86,auVar20);
                  *(undefined4 *)(ray + k * 4 + 0x100) = *(undefined4 *)(local_300 + uVar74 * 4);
                  *(int *)(ray + k * 4 + 0x180) = auVar86._0_4_;
                  uVar9 = vextractps_avx(auVar86,1);
                  *(undefined4 *)(ray + k * 4 + 0x1a0) = uVar9;
                  uVar9 = vextractps_avx(auVar86,2);
                  *(undefined4 *)(ray + k * 4 + 0x1c0) = uVar9;
                  *(float *)(ray + k * 4 + 0x1e0) = fVar175;
                  *(undefined4 *)(ray + k * 4 + 0x200) = uVar147;
                  *(uint *)(ray + k * 4 + 0x220) = uVar7;
                  *(uint *)(ray + k * 4 + 0x240) = uVar80;
                  *(uint *)(ray + k * 4 + 0x260) = context->user->instID[0];
                  *(uint *)(ray + k * 4 + 0x280) = context->user->instPrimID[0];
                }
              }
            }
          }
        }
      }
LAB_01bb862c:
      if (8 < iVar8) {
        local_5a0 = vpbroadcastd_avx512vl();
        local_520._4_4_ = local_5c0._0_4_;
        local_520._0_4_ = local_5c0._0_4_;
        local_520._8_4_ = local_5c0._0_4_;
        local_520._12_4_ = local_5c0._0_4_;
        local_520._16_4_ = local_5c0._0_4_;
        local_520._20_4_ = local_5c0._0_4_;
        local_520._24_4_ = local_5c0._0_4_;
        local_520._28_4_ = local_5c0._0_4_;
        uStack_55c = local_560;
        uStack_558 = local_560;
        uStack_554 = local_560;
        uStack_550 = local_560;
        uStack_54c = local_560;
        uStack_548 = local_560;
        uStack_544 = local_560;
        local_100 = 1.0 / (float)local_580._0_4_;
        fStack_fc = local_100;
        fStack_f8 = local_100;
        fStack_f4 = local_100;
        fStack_f0 = local_100;
        fStack_ec = local_100;
        fStack_e8 = local_100;
        fStack_e4 = local_100;
        local_580 = vpbroadcastd_avx512vl();
        local_540 = vpbroadcastd_avx512vl();
        lVar77 = 8;
LAB_01bb86e8:
        auVar111 = vpbroadcastd_avx512vl();
        auVar111 = vpor_avx2(auVar111,_DAT_01fe9900);
        uVar28 = vpcmpd_avx512vl(auVar111,local_5a0,1);
        auVar111 = *(undefined1 (*) [32])(bspline_basis0 + lVar77 * 4 + lVar30);
        auVar112 = *(undefined1 (*) [32])(lVar30 + 0x21aefac + lVar77 * 4);
        auVar110 = *(undefined1 (*) [32])(lVar30 + 0x21af430 + lVar77 * 4);
        auVar109 = *(undefined1 (*) [32])(lVar30 + 0x21af8b4 + lVar77 * 4);
        fVar175 = auVar109._0_4_;
        auVar225._0_4_ = fVar175 * (float)local_4e0._0_4_;
        fVar226 = auVar109._4_4_;
        auVar225._4_4_ = fVar226 * (float)local_4e0._4_4_;
        fVar227 = auVar109._8_4_;
        auVar225._8_4_ = fVar227 * fStack_4d8;
        fVar228 = auVar109._12_4_;
        auVar225._12_4_ = fVar228 * fStack_4d4;
        fVar174 = auVar109._16_4_;
        auVar225._16_4_ = fVar174 * fStack_4d0;
        fVar187 = auVar109._20_4_;
        auVar225._20_4_ = fVar187 * fStack_4cc;
        auVar225._28_36_ = auVar218._28_36_;
        fVar84 = auVar109._24_4_;
        auVar225._24_4_ = fVar84 * fStack_4c8;
        auVar218._0_4_ = fVar175 * (float)local_500._0_4_;
        auVar218._4_4_ = fVar226 * (float)local_500._4_4_;
        auVar218._8_4_ = fVar227 * fStack_4f8;
        auVar218._12_4_ = fVar228 * fStack_4f4;
        auVar218._16_4_ = fVar174 * fStack_4f0;
        auVar218._20_4_ = fVar187 * fStack_4ec;
        auVar218._28_36_ = auVar208._28_36_;
        auVar218._24_4_ = fVar84 * fStack_4e8;
        auVar97 = vmulps_avx512vl(local_e0,auVar109);
        auVar98 = vfmadd231ps_avx512vl(auVar225._0_32_,auVar110,local_4a0);
        auVar108 = vfmadd231ps_avx512vl(auVar218._0_32_,auVar110,local_4c0);
        auVar97 = vfmadd231ps_avx512vl(auVar97,auVar110,local_c0);
        auVar98 = vfmadd231ps_avx512vl(auVar98,auVar112,local_460);
        auVar108 = vfmadd231ps_avx512vl(auVar108,auVar112,local_480);
        auVar99 = vfmadd231ps_avx512vl(auVar97,auVar112,local_a0);
        auVar86 = vfmadd231ps_fma(auVar98,auVar111,local_420);
        auVar218 = ZEXT1664(auVar86);
        auVar87 = vfmadd231ps_fma(auVar108,auVar111,local_440);
        auVar208 = ZEXT1664(auVar87);
        auVar97 = *(undefined1 (*) [32])(bspline_basis1 + lVar77 * 4 + lVar30);
        auVar98 = *(undefined1 (*) [32])(lVar30 + 0x21b13cc + lVar77 * 4);
        auVar100 = vfmadd231ps_avx512vl(auVar99,auVar111,local_80);
        auVar108 = *(undefined1 (*) [32])(lVar30 + 0x21b1850 + lVar77 * 4);
        auVar99 = *(undefined1 (*) [32])(lVar30 + 0x21b1cd4 + lVar77 * 4);
        fVar85 = auVar99._0_4_;
        auVar241._0_4_ = fVar85 * (float)local_4e0._0_4_;
        fVar137 = auVar99._4_4_;
        auVar241._4_4_ = fVar137 * (float)local_4e0._4_4_;
        fVar138 = auVar99._8_4_;
        auVar241._8_4_ = fVar138 * fStack_4d8;
        fVar139 = auVar99._12_4_;
        auVar241._12_4_ = fVar139 * fStack_4d4;
        fVar140 = auVar99._16_4_;
        auVar241._16_4_ = fVar140 * fStack_4d0;
        fVar142 = auVar99._20_4_;
        auVar241._20_4_ = fVar142 * fStack_4cc;
        auVar241._28_36_ = auVar223._28_36_;
        fVar143 = auVar99._24_4_;
        auVar241._24_4_ = fVar143 * fStack_4c8;
        auVar46._4_4_ = fVar137 * (float)local_500._4_4_;
        auVar46._0_4_ = fVar85 * (float)local_500._0_4_;
        auVar46._8_4_ = fVar138 * fStack_4f8;
        auVar46._12_4_ = fVar139 * fStack_4f4;
        auVar46._16_4_ = fVar140 * fStack_4f0;
        auVar46._20_4_ = fVar142 * fStack_4ec;
        auVar46._24_4_ = fVar143 * fStack_4e8;
        auVar46._28_4_ = uStack_4e4;
        auVar102 = vmulps_avx512vl(local_e0,auVar99);
        auVar101 = vfmadd231ps_avx512vl(auVar241._0_32_,auVar108,local_4a0);
        auVar103 = vfmadd231ps_avx512vl(auVar46,auVar108,local_4c0);
        auVar102 = vfmadd231ps_avx512vl(auVar102,auVar108,local_c0);
        auVar101 = vfmadd231ps_avx512vl(auVar101,auVar98,local_460);
        auVar103 = vfmadd231ps_avx512vl(auVar103,auVar98,local_480);
        auVar102 = vfmadd231ps_avx512vl(auVar102,auVar98,local_a0);
        auVar93 = vfmadd231ps_fma(auVar101,auVar97,local_420);
        auVar223 = ZEXT1664(auVar93);
        auVar22 = vfmadd231ps_fma(auVar103,auVar97,local_440);
        auVar101 = vfmadd231ps_avx512vl(auVar102,auVar97,local_80);
        auVar103 = vmaxps_avx512vl(auVar100,auVar101);
        auVar102 = vsubps_avx(ZEXT1632(auVar93),ZEXT1632(auVar86));
        auVar104 = vsubps_avx512vl(ZEXT1632(auVar22),ZEXT1632(auVar87));
        auVar105 = vmulps_avx512vl(ZEXT1632(auVar87),auVar102);
        auVar106 = vmulps_avx512vl(ZEXT1632(auVar86),auVar104);
        auVar105 = vsubps_avx512vl(auVar105,auVar106);
        auVar106 = vmulps_avx512vl(auVar104,auVar104);
        auVar106 = vfmadd231ps_avx512vl(auVar106,auVar102,auVar102);
        auVar103 = vmulps_avx512vl(auVar103,auVar103);
        auVar103 = vmulps_avx512vl(auVar103,auVar106);
        auVar105 = vmulps_avx512vl(auVar105,auVar105);
        uVar166 = vcmpps_avx512vl(auVar105,auVar103,2);
        bVar82 = (byte)uVar28 & (byte)uVar166;
        if (bVar82 != 0) {
          fVar141 = local_2a0._0_4_;
          fVar144 = local_2a0._4_4_;
          auVar47._4_4_ = fVar144 * fVar137;
          auVar47._0_4_ = fVar141 * fVar85;
          fVar85 = local_2a0._8_4_;
          auVar47._8_4_ = fVar85 * fVar138;
          fVar137 = local_2a0._12_4_;
          auVar47._12_4_ = fVar137 * fVar139;
          fVar138 = local_2a0._16_4_;
          auVar47._16_4_ = fVar138 * fVar140;
          fVar139 = local_2a0._20_4_;
          auVar47._20_4_ = fVar139 * fVar142;
          fVar140 = local_2a0._24_4_;
          auVar47._24_4_ = fVar140 * fVar143;
          auVar47._28_4_ = auVar99._28_4_;
          auVar108 = vfmadd213ps_avx512vl(auVar108,local_280,auVar47);
          auVar98 = vfmadd213ps_avx512vl(auVar98,local_260,auVar108);
          auVar97 = vfmadd213ps_avx512vl(auVar97,local_240,auVar98);
          auVar48._4_4_ = fVar144 * fVar226;
          auVar48._0_4_ = fVar141 * fVar175;
          auVar48._8_4_ = fVar85 * fVar227;
          auVar48._12_4_ = fVar137 * fVar228;
          auVar48._16_4_ = fVar138 * fVar174;
          auVar48._20_4_ = fVar139 * fVar187;
          auVar48._24_4_ = fVar140 * fVar84;
          auVar48._28_4_ = auVar109._28_4_;
          auVar110 = vfmadd213ps_avx512vl(auVar110,local_280,auVar48);
          auVar112 = vfmadd213ps_avx512vl(auVar112,local_260,auVar110);
          auVar98 = vfmadd213ps_avx512vl(auVar111,local_240,auVar112);
          auVar111 = *(undefined1 (*) [32])(lVar30 + 0x21afd38 + lVar77 * 4);
          auVar112 = *(undefined1 (*) [32])(lVar30 + 0x21b01bc + lVar77 * 4);
          auVar110 = *(undefined1 (*) [32])(lVar30 + 0x21b0640 + lVar77 * 4);
          auVar109 = *(undefined1 (*) [32])(lVar30 + 0x21b0ac4 + lVar77 * 4);
          auVar108 = vmulps_avx512vl(_local_4e0,auVar109);
          auVar99 = vmulps_avx512vl(_local_500,auVar109);
          auVar49._4_4_ = fVar144 * auVar109._4_4_;
          auVar49._0_4_ = fVar141 * auVar109._0_4_;
          auVar49._8_4_ = fVar85 * auVar109._8_4_;
          auVar49._12_4_ = fVar137 * auVar109._12_4_;
          auVar49._16_4_ = fVar138 * auVar109._16_4_;
          auVar49._20_4_ = fVar139 * auVar109._20_4_;
          auVar49._24_4_ = fVar140 * auVar109._24_4_;
          auVar49._28_4_ = auVar109._28_4_;
          auVar109 = vfmadd231ps_avx512vl(auVar108,auVar110,local_4a0);
          auVar108 = vfmadd231ps_avx512vl(auVar99,auVar110,local_4c0);
          auVar110 = vfmadd231ps_avx512vl(auVar49,local_280,auVar110);
          auVar109 = vfmadd231ps_avx512vl(auVar109,auVar112,local_460);
          auVar108 = vfmadd231ps_avx512vl(auVar108,auVar112,local_480);
          auVar112 = vfmadd231ps_avx512vl(auVar110,local_260,auVar112);
          auVar109 = vfmadd231ps_avx512vl(auVar109,auVar111,local_420);
          auVar108 = vfmadd231ps_avx512vl(auVar108,auVar111,local_440);
          auVar99 = vfmadd231ps_avx512vl(auVar112,local_240,auVar111);
          auVar111 = *(undefined1 (*) [32])(lVar30 + 0x21b2158 + lVar77 * 4);
          auVar112 = *(undefined1 (*) [32])(lVar30 + 0x21b2a60 + lVar77 * 4);
          auVar110 = *(undefined1 (*) [32])(lVar30 + 0x21b2ee4 + lVar77 * 4);
          auVar103 = vmulps_avx512vl(_local_4e0,auVar110);
          auVar105 = vmulps_avx512vl(_local_500,auVar110);
          auVar110 = vmulps_avx512vl(local_2a0,auVar110);
          auVar103 = vfmadd231ps_avx512vl(auVar103,auVar112,local_4a0);
          auVar105 = vfmadd231ps_avx512vl(auVar105,auVar112,local_4c0);
          auVar110 = vfmadd231ps_avx512vl(auVar110,local_280,auVar112);
          auVar243 = ZEXT1664(auVar243._0_16_);
          auVar112 = *(undefined1 (*) [32])(lVar30 + 0x21b25dc + lVar77 * 4);
          auVar103 = vfmadd231ps_avx512vl(auVar103,auVar112,local_460);
          auVar105 = vfmadd231ps_avx512vl(auVar105,auVar112,local_480);
          auVar112 = vfmadd231ps_avx512vl(auVar110,local_260,auVar112);
          auVar244 = ZEXT1664(auVar244._0_16_);
          auVar110 = vfmadd231ps_avx512vl(auVar103,auVar111,local_420);
          auVar103 = vfmadd231ps_avx512vl(auVar105,auVar111,local_440);
          auVar112 = vfmadd231ps_avx512vl(auVar112,local_240,auVar111);
          auVar105 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
          vandps_avx512vl(auVar109,auVar105);
          vandps_avx512vl(auVar108,auVar105);
          auVar111 = vmaxps_avx(auVar105,auVar105);
          vandps_avx512vl(auVar99,auVar105);
          auVar111 = vmaxps_avx(auVar111,auVar105);
          uVar74 = vcmpps_avx512vl(auVar111,local_520,1);
          bVar13 = (bool)((byte)uVar74 & 1);
          auVar124._0_4_ = (float)((uint)bVar13 * auVar102._0_4_ | (uint)!bVar13 * auVar109._0_4_);
          bVar13 = (bool)((byte)(uVar74 >> 1) & 1);
          auVar124._4_4_ = (float)((uint)bVar13 * auVar102._4_4_ | (uint)!bVar13 * auVar109._4_4_);
          bVar13 = (bool)((byte)(uVar74 >> 2) & 1);
          auVar124._8_4_ = (float)((uint)bVar13 * auVar102._8_4_ | (uint)!bVar13 * auVar109._8_4_);
          bVar13 = (bool)((byte)(uVar74 >> 3) & 1);
          auVar124._12_4_ =
               (float)((uint)bVar13 * auVar102._12_4_ | (uint)!bVar13 * auVar109._12_4_);
          bVar13 = (bool)((byte)(uVar74 >> 4) & 1);
          auVar124._16_4_ =
               (float)((uint)bVar13 * auVar102._16_4_ | (uint)!bVar13 * auVar109._16_4_);
          bVar13 = (bool)((byte)(uVar74 >> 5) & 1);
          auVar124._20_4_ =
               (float)((uint)bVar13 * auVar102._20_4_ | (uint)!bVar13 * auVar109._20_4_);
          bVar13 = (bool)((byte)(uVar74 >> 6) & 1);
          auVar124._24_4_ =
               (float)((uint)bVar13 * auVar102._24_4_ | (uint)!bVar13 * auVar109._24_4_);
          bVar13 = SUB81(uVar74 >> 7,0);
          auVar124._28_4_ = (uint)bVar13 * auVar102._28_4_ | (uint)!bVar13 * auVar109._28_4_;
          bVar13 = (bool)((byte)uVar74 & 1);
          auVar125._0_4_ = (float)((uint)bVar13 * auVar104._0_4_ | (uint)!bVar13 * auVar108._0_4_);
          bVar13 = (bool)((byte)(uVar74 >> 1) & 1);
          auVar125._4_4_ = (float)((uint)bVar13 * auVar104._4_4_ | (uint)!bVar13 * auVar108._4_4_);
          bVar13 = (bool)((byte)(uVar74 >> 2) & 1);
          auVar125._8_4_ = (float)((uint)bVar13 * auVar104._8_4_ | (uint)!bVar13 * auVar108._8_4_);
          bVar13 = (bool)((byte)(uVar74 >> 3) & 1);
          auVar125._12_4_ =
               (float)((uint)bVar13 * auVar104._12_4_ | (uint)!bVar13 * auVar108._12_4_);
          bVar13 = (bool)((byte)(uVar74 >> 4) & 1);
          auVar125._16_4_ =
               (float)((uint)bVar13 * auVar104._16_4_ | (uint)!bVar13 * auVar108._16_4_);
          bVar13 = (bool)((byte)(uVar74 >> 5) & 1);
          auVar125._20_4_ =
               (float)((uint)bVar13 * auVar104._20_4_ | (uint)!bVar13 * auVar108._20_4_);
          bVar13 = (bool)((byte)(uVar74 >> 6) & 1);
          auVar125._24_4_ =
               (float)((uint)bVar13 * auVar104._24_4_ | (uint)!bVar13 * auVar108._24_4_);
          bVar13 = SUB81(uVar74 >> 7,0);
          auVar125._28_4_ = (uint)bVar13 * auVar104._28_4_ | (uint)!bVar13 * auVar108._28_4_;
          vandps_avx512vl(auVar110,auVar105);
          vandps_avx512vl(auVar103,auVar105);
          auVar111 = vmaxps_avx(auVar125,auVar125);
          vandps_avx512vl(auVar112,auVar105);
          auVar111 = vmaxps_avx(auVar111,auVar125);
          uVar74 = vcmpps_avx512vl(auVar111,local_520,1);
          bVar13 = (bool)((byte)uVar74 & 1);
          auVar126._0_4_ = (uint)bVar13 * auVar102._0_4_ | (uint)!bVar13 * auVar110._0_4_;
          bVar13 = (bool)((byte)(uVar74 >> 1) & 1);
          auVar126._4_4_ = (uint)bVar13 * auVar102._4_4_ | (uint)!bVar13 * auVar110._4_4_;
          bVar13 = (bool)((byte)(uVar74 >> 2) & 1);
          auVar126._8_4_ = (uint)bVar13 * auVar102._8_4_ | (uint)!bVar13 * auVar110._8_4_;
          bVar13 = (bool)((byte)(uVar74 >> 3) & 1);
          auVar126._12_4_ = (uint)bVar13 * auVar102._12_4_ | (uint)!bVar13 * auVar110._12_4_;
          bVar13 = (bool)((byte)(uVar74 >> 4) & 1);
          auVar126._16_4_ = (uint)bVar13 * auVar102._16_4_ | (uint)!bVar13 * auVar110._16_4_;
          bVar13 = (bool)((byte)(uVar74 >> 5) & 1);
          auVar126._20_4_ = (uint)bVar13 * auVar102._20_4_ | (uint)!bVar13 * auVar110._20_4_;
          bVar13 = (bool)((byte)(uVar74 >> 6) & 1);
          auVar126._24_4_ = (uint)bVar13 * auVar102._24_4_ | (uint)!bVar13 * auVar110._24_4_;
          bVar13 = SUB81(uVar74 >> 7,0);
          auVar126._28_4_ = (uint)bVar13 * auVar102._28_4_ | (uint)!bVar13 * auVar110._28_4_;
          bVar13 = (bool)((byte)uVar74 & 1);
          auVar127._0_4_ = (float)((uint)bVar13 * auVar104._0_4_ | (uint)!bVar13 * auVar103._0_4_);
          bVar13 = (bool)((byte)(uVar74 >> 1) & 1);
          auVar127._4_4_ = (float)((uint)bVar13 * auVar104._4_4_ | (uint)!bVar13 * auVar103._4_4_);
          bVar13 = (bool)((byte)(uVar74 >> 2) & 1);
          auVar127._8_4_ = (float)((uint)bVar13 * auVar104._8_4_ | (uint)!bVar13 * auVar103._8_4_);
          bVar13 = (bool)((byte)(uVar74 >> 3) & 1);
          auVar127._12_4_ =
               (float)((uint)bVar13 * auVar104._12_4_ | (uint)!bVar13 * auVar103._12_4_);
          bVar13 = (bool)((byte)(uVar74 >> 4) & 1);
          auVar127._16_4_ =
               (float)((uint)bVar13 * auVar104._16_4_ | (uint)!bVar13 * auVar103._16_4_);
          bVar13 = (bool)((byte)(uVar74 >> 5) & 1);
          auVar127._20_4_ =
               (float)((uint)bVar13 * auVar104._20_4_ | (uint)!bVar13 * auVar103._20_4_);
          bVar13 = (bool)((byte)(uVar74 >> 6) & 1);
          auVar127._24_4_ =
               (float)((uint)bVar13 * auVar104._24_4_ | (uint)!bVar13 * auVar103._24_4_);
          bVar13 = SUB81(uVar74 >> 7,0);
          auVar127._28_4_ = (uint)bVar13 * auVar104._28_4_ | (uint)!bVar13 * auVar103._28_4_;
          auVar231._8_4_ = 0x80000000;
          auVar231._0_8_ = 0x8000000080000000;
          auVar231._12_4_ = 0x80000000;
          auVar231._16_4_ = 0x80000000;
          auVar231._20_4_ = 0x80000000;
          auVar231._24_4_ = 0x80000000;
          auVar231._28_4_ = 0x80000000;
          auVar111 = vxorps_avx512vl(auVar126,auVar231);
          auVar96 = vxorps_avx512vl(auVar105._0_16_,auVar105._0_16_);
          auVar112 = vfmadd213ps_avx512vl(auVar124,auVar124,ZEXT1632(auVar96));
          auVar23 = vfmadd231ps_fma(auVar112,auVar125,auVar125);
          auVar112 = vrsqrt14ps_avx512vl(ZEXT1632(auVar23));
          auVar239._8_4_ = 0xbf000000;
          auVar239._0_8_ = 0xbf000000bf000000;
          auVar239._12_4_ = 0xbf000000;
          auVar239._16_4_ = 0xbf000000;
          auVar239._20_4_ = 0xbf000000;
          auVar239._24_4_ = 0xbf000000;
          auVar239._28_4_ = 0xbf000000;
          fVar175 = auVar112._0_4_;
          fVar226 = auVar112._4_4_;
          fVar227 = auVar112._8_4_;
          fVar228 = auVar112._12_4_;
          fVar174 = auVar112._16_4_;
          fVar187 = auVar112._20_4_;
          fVar84 = auVar112._24_4_;
          auVar50._4_4_ = fVar226 * fVar226 * fVar226 * auVar23._4_4_ * -0.5;
          auVar50._0_4_ = fVar175 * fVar175 * fVar175 * auVar23._0_4_ * -0.5;
          auVar50._8_4_ = fVar227 * fVar227 * fVar227 * auVar23._8_4_ * -0.5;
          auVar50._12_4_ = fVar228 * fVar228 * fVar228 * auVar23._12_4_ * -0.5;
          auVar50._16_4_ = fVar174 * fVar174 * fVar174 * -0.0;
          auVar50._20_4_ = fVar187 * fVar187 * fVar187 * -0.0;
          auVar50._24_4_ = fVar84 * fVar84 * fVar84 * -0.0;
          auVar50._28_4_ = auVar125._28_4_;
          auVar110 = vbroadcastss_avx512vl(ZEXT416(0x3fc00000));
          auVar112 = vfmadd231ps_avx512vl(auVar50,auVar110,auVar112);
          auVar51._4_4_ = auVar125._4_4_ * auVar112._4_4_;
          auVar51._0_4_ = auVar125._0_4_ * auVar112._0_4_;
          auVar51._8_4_ = auVar125._8_4_ * auVar112._8_4_;
          auVar51._12_4_ = auVar125._12_4_ * auVar112._12_4_;
          auVar51._16_4_ = auVar125._16_4_ * auVar112._16_4_;
          auVar51._20_4_ = auVar125._20_4_ * auVar112._20_4_;
          auVar51._24_4_ = auVar125._24_4_ * auVar112._24_4_;
          auVar51._28_4_ = 0;
          auVar52._4_4_ = auVar112._4_4_ * -auVar124._4_4_;
          auVar52._0_4_ = auVar112._0_4_ * -auVar124._0_4_;
          auVar52._8_4_ = auVar112._8_4_ * -auVar124._8_4_;
          auVar52._12_4_ = auVar112._12_4_ * -auVar124._12_4_;
          auVar52._16_4_ = auVar112._16_4_ * -auVar124._16_4_;
          auVar52._20_4_ = auVar112._20_4_ * -auVar124._20_4_;
          auVar52._24_4_ = auVar112._24_4_ * -auVar124._24_4_;
          auVar52._28_4_ = auVar125._28_4_;
          auVar109 = vmulps_avx512vl(auVar112,ZEXT1632(auVar96));
          auVar99 = ZEXT1632(auVar96);
          auVar112 = vfmadd213ps_avx512vl(auVar126,auVar126,auVar99);
          auVar112 = vfmadd231ps_avx512vl(auVar112,auVar127,auVar127);
          auVar108 = vrsqrt14ps_avx512vl(auVar112);
          auVar112 = vmulps_avx512vl(auVar112,auVar239);
          fVar175 = auVar108._0_4_;
          fVar226 = auVar108._4_4_;
          fVar227 = auVar108._8_4_;
          fVar228 = auVar108._12_4_;
          fVar174 = auVar108._16_4_;
          fVar187 = auVar108._20_4_;
          fVar84 = auVar108._24_4_;
          auVar53._4_4_ = fVar226 * fVar226 * fVar226 * auVar112._4_4_;
          auVar53._0_4_ = fVar175 * fVar175 * fVar175 * auVar112._0_4_;
          auVar53._8_4_ = fVar227 * fVar227 * fVar227 * auVar112._8_4_;
          auVar53._12_4_ = fVar228 * fVar228 * fVar228 * auVar112._12_4_;
          auVar53._16_4_ = fVar174 * fVar174 * fVar174 * auVar112._16_4_;
          auVar53._20_4_ = fVar187 * fVar187 * fVar187 * auVar112._20_4_;
          auVar53._24_4_ = fVar84 * fVar84 * fVar84 * auVar112._24_4_;
          auVar53._28_4_ = auVar112._28_4_;
          auVar112 = vfmadd231ps_avx512vl(auVar53,auVar110,auVar108);
          auVar54._4_4_ = auVar127._4_4_ * auVar112._4_4_;
          auVar54._0_4_ = auVar127._0_4_ * auVar112._0_4_;
          auVar54._8_4_ = auVar127._8_4_ * auVar112._8_4_;
          auVar54._12_4_ = auVar127._12_4_ * auVar112._12_4_;
          auVar54._16_4_ = auVar127._16_4_ * auVar112._16_4_;
          auVar54._20_4_ = auVar127._20_4_ * auVar112._20_4_;
          auVar54._24_4_ = auVar127._24_4_ * auVar112._24_4_;
          auVar54._28_4_ = auVar108._28_4_;
          auVar55._4_4_ = auVar112._4_4_ * auVar111._4_4_;
          auVar55._0_4_ = auVar112._0_4_ * auVar111._0_4_;
          auVar55._8_4_ = auVar112._8_4_ * auVar111._8_4_;
          auVar55._12_4_ = auVar112._12_4_ * auVar111._12_4_;
          auVar55._16_4_ = auVar112._16_4_ * auVar111._16_4_;
          auVar55._20_4_ = auVar112._20_4_ * auVar111._20_4_;
          auVar55._24_4_ = auVar112._24_4_ * auVar111._24_4_;
          auVar55._28_4_ = auVar111._28_4_;
          auVar111 = vmulps_avx512vl(auVar112,auVar99);
          auVar23 = vfmadd213ps_fma(auVar51,auVar100,ZEXT1632(auVar86));
          auVar24 = vfmadd213ps_fma(auVar52,auVar100,ZEXT1632(auVar87));
          auVar110 = vfmadd213ps_avx512vl(auVar109,auVar100,auVar98);
          auVar108 = vfmadd213ps_avx512vl(auVar54,auVar101,ZEXT1632(auVar93));
          auVar26 = vfnmadd213ps_fma(auVar51,auVar100,ZEXT1632(auVar86));
          auVar86 = vfmadd213ps_fma(auVar55,auVar101,ZEXT1632(auVar22));
          auVar27 = vfnmadd213ps_fma(auVar52,auVar100,ZEXT1632(auVar87));
          auVar87 = vfmadd213ps_fma(auVar111,auVar101,auVar97);
          auVar242 = vfnmadd231ps_fma(auVar98,auVar100,auVar109);
          auVar92 = vfnmadd213ps_fma(auVar54,auVar101,ZEXT1632(auVar93));
          auVar94 = vfnmadd213ps_fma(auVar55,auVar101,ZEXT1632(auVar22));
          auVar95 = vfnmadd231ps_fma(auVar97,auVar101,auVar111);
          auVar97 = vsubps_avx512vl(auVar108,ZEXT1632(auVar26));
          auVar111 = vsubps_avx(ZEXT1632(auVar86),ZEXT1632(auVar27));
          auVar112 = vsubps_avx(ZEXT1632(auVar87),ZEXT1632(auVar242));
          auVar56._4_4_ = auVar111._4_4_ * auVar242._4_4_;
          auVar56._0_4_ = auVar111._0_4_ * auVar242._0_4_;
          auVar56._8_4_ = auVar111._8_4_ * auVar242._8_4_;
          auVar56._12_4_ = auVar111._12_4_ * auVar242._12_4_;
          auVar56._16_4_ = auVar111._16_4_ * 0.0;
          auVar56._20_4_ = auVar111._20_4_ * 0.0;
          auVar56._24_4_ = auVar111._24_4_ * 0.0;
          auVar56._28_4_ = auVar109._28_4_;
          auVar93 = vfmsub231ps_fma(auVar56,ZEXT1632(auVar27),auVar112);
          auVar57._4_4_ = auVar112._4_4_ * auVar26._4_4_;
          auVar57._0_4_ = auVar112._0_4_ * auVar26._0_4_;
          auVar57._8_4_ = auVar112._8_4_ * auVar26._8_4_;
          auVar57._12_4_ = auVar112._12_4_ * auVar26._12_4_;
          auVar57._16_4_ = auVar112._16_4_ * 0.0;
          auVar57._20_4_ = auVar112._20_4_ * 0.0;
          auVar57._24_4_ = auVar112._24_4_ * 0.0;
          auVar57._28_4_ = auVar112._28_4_;
          auVar22 = vfmsub231ps_fma(auVar57,ZEXT1632(auVar242),auVar97);
          auVar58._4_4_ = auVar27._4_4_ * auVar97._4_4_;
          auVar58._0_4_ = auVar27._0_4_ * auVar97._0_4_;
          auVar58._8_4_ = auVar27._8_4_ * auVar97._8_4_;
          auVar58._12_4_ = auVar27._12_4_ * auVar97._12_4_;
          auVar58._16_4_ = auVar97._16_4_ * 0.0;
          auVar58._20_4_ = auVar97._20_4_ * 0.0;
          auVar58._24_4_ = auVar97._24_4_ * 0.0;
          auVar58._28_4_ = auVar97._28_4_;
          auVar25 = vfmsub231ps_fma(auVar58,ZEXT1632(auVar26),auVar111);
          auVar111 = vfmadd231ps_avx512vl(ZEXT1632(auVar25),auVar99,ZEXT1632(auVar22));
          auVar111 = vfmadd231ps_avx512vl(auVar111,auVar99,ZEXT1632(auVar93));
          auVar105 = ZEXT1632(auVar96);
          uVar74 = vcmpps_avx512vl(auVar111,auVar105,2);
          bVar73 = (byte)uVar74;
          fVar138 = (float)((uint)(bVar73 & 1) * auVar23._0_4_ |
                           (uint)!(bool)(bVar73 & 1) * auVar92._0_4_);
          bVar13 = (bool)((byte)(uVar74 >> 1) & 1);
          fVar140 = (float)((uint)bVar13 * auVar23._4_4_ | (uint)!bVar13 * auVar92._4_4_);
          bVar13 = (bool)((byte)(uVar74 >> 2) & 1);
          fVar143 = (float)((uint)bVar13 * auVar23._8_4_ | (uint)!bVar13 * auVar92._8_4_);
          bVar13 = (bool)((byte)(uVar74 >> 3) & 1);
          fVar144 = (float)((uint)bVar13 * auVar23._12_4_ | (uint)!bVar13 * auVar92._12_4_);
          auVar99 = ZEXT1632(CONCAT412(fVar144,CONCAT48(fVar143,CONCAT44(fVar140,fVar138))));
          fVar139 = (float)((uint)(bVar73 & 1) * auVar24._0_4_ |
                           (uint)!(bool)(bVar73 & 1) * auVar94._0_4_);
          bVar13 = (bool)((byte)(uVar74 >> 1) & 1);
          fVar142 = (float)((uint)bVar13 * auVar24._4_4_ | (uint)!bVar13 * auVar94._4_4_);
          bVar13 = (bool)((byte)(uVar74 >> 2) & 1);
          fVar141 = (float)((uint)bVar13 * auVar24._8_4_ | (uint)!bVar13 * auVar94._8_4_);
          bVar13 = (bool)((byte)(uVar74 >> 3) & 1);
          fVar145 = (float)((uint)bVar13 * auVar24._12_4_ | (uint)!bVar13 * auVar94._12_4_);
          auVar102 = ZEXT1632(CONCAT412(fVar145,CONCAT48(fVar141,CONCAT44(fVar142,fVar139))));
          auVar128._0_4_ =
               (float)((uint)(bVar73 & 1) * auVar110._0_4_ |
                      (uint)!(bool)(bVar73 & 1) * auVar95._0_4_);
          bVar13 = (bool)((byte)(uVar74 >> 1) & 1);
          auVar128._4_4_ = (float)((uint)bVar13 * auVar110._4_4_ | (uint)!bVar13 * auVar95._4_4_);
          bVar13 = (bool)((byte)(uVar74 >> 2) & 1);
          auVar128._8_4_ = (float)((uint)bVar13 * auVar110._8_4_ | (uint)!bVar13 * auVar95._8_4_);
          bVar13 = (bool)((byte)(uVar74 >> 3) & 1);
          auVar128._12_4_ = (float)((uint)bVar13 * auVar110._12_4_ | (uint)!bVar13 * auVar95._12_4_)
          ;
          fVar175 = (float)((uint)((byte)(uVar74 >> 4) & 1) * auVar110._16_4_);
          auVar128._16_4_ = fVar175;
          fVar226 = (float)((uint)((byte)(uVar74 >> 5) & 1) * auVar110._20_4_);
          auVar128._20_4_ = fVar226;
          fVar227 = (float)((uint)((byte)(uVar74 >> 6) & 1) * auVar110._24_4_);
          auVar128._24_4_ = fVar227;
          iVar1 = (uint)(byte)(uVar74 >> 7) * auVar110._28_4_;
          auVar128._28_4_ = iVar1;
          auVar111 = vblendmps_avx512vl(ZEXT1632(auVar26),auVar108);
          auVar129._0_4_ =
               (uint)(bVar73 & 1) * auVar111._0_4_ | (uint)!(bool)(bVar73 & 1) * auVar93._0_4_;
          bVar13 = (bool)((byte)(uVar74 >> 1) & 1);
          auVar129._4_4_ = (uint)bVar13 * auVar111._4_4_ | (uint)!bVar13 * auVar93._4_4_;
          bVar13 = (bool)((byte)(uVar74 >> 2) & 1);
          auVar129._8_4_ = (uint)bVar13 * auVar111._8_4_ | (uint)!bVar13 * auVar93._8_4_;
          bVar13 = (bool)((byte)(uVar74 >> 3) & 1);
          auVar129._12_4_ = (uint)bVar13 * auVar111._12_4_ | (uint)!bVar13 * auVar93._12_4_;
          auVar129._16_4_ = (uint)((byte)(uVar74 >> 4) & 1) * auVar111._16_4_;
          auVar129._20_4_ = (uint)((byte)(uVar74 >> 5) & 1) * auVar111._20_4_;
          auVar129._24_4_ = (uint)((byte)(uVar74 >> 6) & 1) * auVar111._24_4_;
          auVar129._28_4_ = (uint)(byte)(uVar74 >> 7) * auVar111._28_4_;
          auVar111 = vblendmps_avx512vl(ZEXT1632(auVar27),ZEXT1632(auVar86));
          auVar130._0_4_ =
               (float)((uint)(bVar73 & 1) * auVar111._0_4_ |
                      (uint)!(bool)(bVar73 & 1) * auVar23._0_4_);
          bVar13 = (bool)((byte)(uVar74 >> 1) & 1);
          auVar130._4_4_ = (float)((uint)bVar13 * auVar111._4_4_ | (uint)!bVar13 * auVar23._4_4_);
          bVar13 = (bool)((byte)(uVar74 >> 2) & 1);
          auVar130._8_4_ = (float)((uint)bVar13 * auVar111._8_4_ | (uint)!bVar13 * auVar23._8_4_);
          bVar13 = (bool)((byte)(uVar74 >> 3) & 1);
          auVar130._12_4_ = (float)((uint)bVar13 * auVar111._12_4_ | (uint)!bVar13 * auVar23._12_4_)
          ;
          fVar228 = (float)((uint)((byte)(uVar74 >> 4) & 1) * auVar111._16_4_);
          auVar130._16_4_ = fVar228;
          fVar187 = (float)((uint)((byte)(uVar74 >> 5) & 1) * auVar111._20_4_);
          auVar130._20_4_ = fVar187;
          fVar174 = (float)((uint)((byte)(uVar74 >> 6) & 1) * auVar111._24_4_);
          auVar130._24_4_ = fVar174;
          auVar130._28_4_ = (uint)(byte)(uVar74 >> 7) * auVar111._28_4_;
          auVar111 = vblendmps_avx512vl(ZEXT1632(auVar242),ZEXT1632(auVar87));
          auVar131._0_4_ =
               (float)((uint)(bVar73 & 1) * auVar111._0_4_ |
                      (uint)!(bool)(bVar73 & 1) * auVar24._0_4_);
          bVar13 = (bool)((byte)(uVar74 >> 1) & 1);
          auVar131._4_4_ = (float)((uint)bVar13 * auVar111._4_4_ | (uint)!bVar13 * auVar24._4_4_);
          bVar13 = (bool)((byte)(uVar74 >> 2) & 1);
          auVar131._8_4_ = (float)((uint)bVar13 * auVar111._8_4_ | (uint)!bVar13 * auVar24._8_4_);
          bVar13 = (bool)((byte)(uVar74 >> 3) & 1);
          auVar131._12_4_ = (float)((uint)bVar13 * auVar111._12_4_ | (uint)!bVar13 * auVar24._12_4_)
          ;
          fVar137 = (float)((uint)((byte)(uVar74 >> 4) & 1) * auVar111._16_4_);
          auVar131._16_4_ = fVar137;
          fVar85 = (float)((uint)((byte)(uVar74 >> 5) & 1) * auVar111._20_4_);
          auVar131._20_4_ = fVar85;
          fVar84 = (float)((uint)((byte)(uVar74 >> 6) & 1) * auVar111._24_4_);
          auVar131._24_4_ = fVar84;
          iVar2 = (uint)(byte)(uVar74 >> 7) * auVar111._28_4_;
          auVar131._28_4_ = iVar2;
          auVar132._0_4_ =
               (uint)(bVar73 & 1) * (int)auVar26._0_4_ | (uint)!(bool)(bVar73 & 1) * auVar108._0_4_;
          bVar13 = (bool)((byte)(uVar74 >> 1) & 1);
          auVar132._4_4_ = (uint)bVar13 * (int)auVar26._4_4_ | (uint)!bVar13 * auVar108._4_4_;
          bVar13 = (bool)((byte)(uVar74 >> 2) & 1);
          auVar132._8_4_ = (uint)bVar13 * (int)auVar26._8_4_ | (uint)!bVar13 * auVar108._8_4_;
          bVar13 = (bool)((byte)(uVar74 >> 3) & 1);
          auVar132._12_4_ = (uint)bVar13 * (int)auVar26._12_4_ | (uint)!bVar13 * auVar108._12_4_;
          auVar132._16_4_ = (uint)!(bool)((byte)(uVar74 >> 4) & 1) * auVar108._16_4_;
          auVar132._20_4_ = (uint)!(bool)((byte)(uVar74 >> 5) & 1) * auVar108._20_4_;
          auVar132._24_4_ = (uint)!(bool)((byte)(uVar74 >> 6) & 1) * auVar108._24_4_;
          auVar132._28_4_ = (uint)!SUB81(uVar74 >> 7,0) * auVar108._28_4_;
          bVar13 = (bool)((byte)(uVar74 >> 1) & 1);
          bVar15 = (bool)((byte)(uVar74 >> 2) & 1);
          bVar17 = (bool)((byte)(uVar74 >> 3) & 1);
          bVar14 = (bool)((byte)(uVar74 >> 1) & 1);
          bVar16 = (bool)((byte)(uVar74 >> 2) & 1);
          bVar18 = (bool)((byte)(uVar74 >> 3) & 1);
          auVar108 = vsubps_avx512vl(auVar132,auVar99);
          auVar112 = vsubps_avx(ZEXT1632(CONCAT412((uint)bVar17 * (int)auVar27._12_4_ |
                                                   (uint)!bVar17 * auVar86._12_4_,
                                                   CONCAT48((uint)bVar15 * (int)auVar27._8_4_ |
                                                            (uint)!bVar15 * auVar86._8_4_,
                                                            CONCAT44((uint)bVar13 *
                                                                     (int)auVar27._4_4_ |
                                                                     (uint)!bVar13 * auVar86._4_4_,
                                                                     (uint)(bVar73 & 1) *
                                                                     (int)auVar27._0_4_ |
                                                                     (uint)!(bool)(bVar73 & 1) *
                                                                     auVar86._0_4_)))),auVar102);
          auVar218 = ZEXT3264(auVar112);
          auVar110 = vsubps_avx(ZEXT1632(CONCAT412((uint)bVar18 * (int)auVar242._12_4_ |
                                                   (uint)!bVar18 * auVar87._12_4_,
                                                   CONCAT48((uint)bVar16 * (int)auVar242._8_4_ |
                                                            (uint)!bVar16 * auVar87._8_4_,
                                                            CONCAT44((uint)bVar14 *
                                                                     (int)auVar242._4_4_ |
                                                                     (uint)!bVar14 * auVar87._4_4_,
                                                                     (uint)(bVar73 & 1) *
                                                                     (int)auVar242._0_4_ |
                                                                     (uint)!(bool)(bVar73 & 1) *
                                                                     auVar87._0_4_)))),auVar128);
          auVar109 = vsubps_avx(auVar99,auVar129);
          auVar223 = ZEXT3264(auVar109);
          auVar97 = vsubps_avx(auVar102,auVar130);
          auVar98 = vsubps_avx(auVar128,auVar131);
          auVar59._4_4_ = auVar110._4_4_ * fVar140;
          auVar59._0_4_ = auVar110._0_4_ * fVar138;
          auVar59._8_4_ = auVar110._8_4_ * fVar143;
          auVar59._12_4_ = auVar110._12_4_ * fVar144;
          auVar59._16_4_ = auVar110._16_4_ * 0.0;
          auVar59._20_4_ = auVar110._20_4_ * 0.0;
          auVar59._24_4_ = auVar110._24_4_ * 0.0;
          auVar59._28_4_ = 0;
          auVar86 = vfmsub231ps_fma(auVar59,auVar128,auVar108);
          auVar192._0_4_ = fVar139 * auVar108._0_4_;
          auVar192._4_4_ = fVar142 * auVar108._4_4_;
          auVar192._8_4_ = fVar141 * auVar108._8_4_;
          auVar192._12_4_ = fVar145 * auVar108._12_4_;
          auVar192._16_4_ = auVar108._16_4_ * 0.0;
          auVar192._20_4_ = auVar108._20_4_ * 0.0;
          auVar192._24_4_ = auVar108._24_4_ * 0.0;
          auVar192._28_4_ = 0;
          auVar87 = vfmsub231ps_fma(auVar192,auVar99,auVar112);
          auVar111 = vfmadd231ps_avx512vl(ZEXT1632(auVar87),auVar105,ZEXT1632(auVar86));
          auVar204._0_4_ = auVar112._0_4_ * auVar128._0_4_;
          auVar204._4_4_ = auVar112._4_4_ * auVar128._4_4_;
          auVar204._8_4_ = auVar112._8_4_ * auVar128._8_4_;
          auVar204._12_4_ = auVar112._12_4_ * auVar128._12_4_;
          auVar204._16_4_ = auVar112._16_4_ * fVar175;
          auVar204._20_4_ = auVar112._20_4_ * fVar226;
          auVar204._24_4_ = auVar112._24_4_ * fVar227;
          auVar204._28_4_ = 0;
          auVar86 = vfmsub231ps_fma(auVar204,auVar102,auVar110);
          auVar103 = vfmadd231ps_avx512vl(auVar111,auVar105,ZEXT1632(auVar86));
          auVar111 = vmulps_avx512vl(auVar98,auVar129);
          auVar111 = vfmsub231ps_avx512vl(auVar111,auVar109,auVar131);
          auVar60._4_4_ = auVar97._4_4_ * auVar131._4_4_;
          auVar60._0_4_ = auVar97._0_4_ * auVar131._0_4_;
          auVar60._8_4_ = auVar97._8_4_ * auVar131._8_4_;
          auVar60._12_4_ = auVar97._12_4_ * auVar131._12_4_;
          auVar60._16_4_ = auVar97._16_4_ * fVar137;
          auVar60._20_4_ = auVar97._20_4_ * fVar85;
          auVar60._24_4_ = auVar97._24_4_ * fVar84;
          auVar60._28_4_ = iVar2;
          auVar86 = vfmsub231ps_fma(auVar60,auVar130,auVar98);
          auVar205._0_4_ = auVar130._0_4_ * auVar109._0_4_;
          auVar205._4_4_ = auVar130._4_4_ * auVar109._4_4_;
          auVar205._8_4_ = auVar130._8_4_ * auVar109._8_4_;
          auVar205._12_4_ = auVar130._12_4_ * auVar109._12_4_;
          auVar205._16_4_ = fVar228 * auVar109._16_4_;
          auVar205._20_4_ = fVar187 * auVar109._20_4_;
          auVar205._24_4_ = fVar174 * auVar109._24_4_;
          auVar205._28_4_ = 0;
          auVar87 = vfmsub231ps_fma(auVar205,auVar97,auVar129);
          auVar111 = vfmadd231ps_avx512vl(ZEXT1632(auVar87),auVar105,auVar111);
          auVar104 = vfmadd231ps_avx512vl(auVar111,auVar105,ZEXT1632(auVar86));
          auVar208 = ZEXT3264(auVar104);
          auVar111 = vmaxps_avx(auVar103,auVar104);
          uVar166 = vcmpps_avx512vl(auVar111,auVar105,2);
          bVar82 = bVar82 & (byte)uVar166;
          if (bVar82 != 0) {
            uVar147 = *(undefined4 *)(ray + k * 4 + 0x100);
            auVar240._4_4_ = uVar147;
            auVar240._0_4_ = uVar147;
            auVar240._8_4_ = uVar147;
            auVar240._12_4_ = uVar147;
            auVar240._16_4_ = uVar147;
            auVar240._20_4_ = uVar147;
            auVar240._24_4_ = uVar147;
            auVar240._28_4_ = uVar147;
            auVar241 = ZEXT3264(auVar240);
            auVar61._4_4_ = auVar98._4_4_ * auVar112._4_4_;
            auVar61._0_4_ = auVar98._0_4_ * auVar112._0_4_;
            auVar61._8_4_ = auVar98._8_4_ * auVar112._8_4_;
            auVar61._12_4_ = auVar98._12_4_ * auVar112._12_4_;
            auVar61._16_4_ = auVar98._16_4_ * auVar112._16_4_;
            auVar61._20_4_ = auVar98._20_4_ * auVar112._20_4_;
            auVar61._24_4_ = auVar98._24_4_ * auVar112._24_4_;
            auVar61._28_4_ = auVar111._28_4_;
            auVar22 = vfmsub231ps_fma(auVar61,auVar97,auVar110);
            auVar62._4_4_ = auVar110._4_4_ * auVar109._4_4_;
            auVar62._0_4_ = auVar110._0_4_ * auVar109._0_4_;
            auVar62._8_4_ = auVar110._8_4_ * auVar109._8_4_;
            auVar62._12_4_ = auVar110._12_4_ * auVar109._12_4_;
            auVar62._16_4_ = auVar110._16_4_ * auVar109._16_4_;
            auVar62._20_4_ = auVar110._20_4_ * auVar109._20_4_;
            auVar62._24_4_ = auVar110._24_4_ * auVar109._24_4_;
            auVar62._28_4_ = auVar110._28_4_;
            auVar93 = vfmsub231ps_fma(auVar62,auVar108,auVar98);
            auVar63._4_4_ = auVar97._4_4_ * auVar108._4_4_;
            auVar63._0_4_ = auVar97._0_4_ * auVar108._0_4_;
            auVar63._8_4_ = auVar97._8_4_ * auVar108._8_4_;
            auVar63._12_4_ = auVar97._12_4_ * auVar108._12_4_;
            auVar63._16_4_ = auVar97._16_4_ * auVar108._16_4_;
            auVar63._20_4_ = auVar97._20_4_ * auVar108._20_4_;
            auVar63._24_4_ = auVar97._24_4_ * auVar108._24_4_;
            auVar63._28_4_ = auVar97._28_4_;
            auVar23 = vfmsub231ps_fma(auVar63,auVar109,auVar112);
            auVar86 = vfmadd213ps_fma(ZEXT832(0) << 0x20,ZEXT1632(auVar93),ZEXT1632(auVar23));
            auVar87 = vfmadd231ps_fma(ZEXT1632(auVar86),ZEXT1632(auVar22),
                                      ZEXT1232(ZEXT412(0)) << 0x20);
            auVar111 = vrcp14ps_avx512vl(ZEXT1632(auVar87));
            auVar223 = ZEXT3264(auVar111);
            auVar38._8_4_ = 0x3f800000;
            auVar38._0_8_ = 0x3f8000003f800000;
            auVar38._12_4_ = 0x3f800000;
            auVar38._16_4_ = 0x3f800000;
            auVar38._20_4_ = 0x3f800000;
            auVar38._24_4_ = 0x3f800000;
            auVar38._28_4_ = 0x3f800000;
            auVar112 = vfnmadd213ps_avx512vl(auVar111,ZEXT1632(auVar87),auVar38);
            auVar86 = vfmadd132ps_fma(auVar112,auVar111,auVar111);
            auVar218 = ZEXT1664(auVar86);
            auVar64._4_4_ = auVar23._4_4_ * auVar128._4_4_;
            auVar64._0_4_ = auVar23._0_4_ * auVar128._0_4_;
            auVar64._8_4_ = auVar23._8_4_ * auVar128._8_4_;
            auVar64._12_4_ = auVar23._12_4_ * auVar128._12_4_;
            auVar64._16_4_ = fVar175 * 0.0;
            auVar64._20_4_ = fVar226 * 0.0;
            auVar64._24_4_ = fVar227 * 0.0;
            auVar64._28_4_ = iVar1;
            auVar93 = vfmadd231ps_fma(auVar64,auVar102,ZEXT1632(auVar93));
            auVar93 = vfmadd231ps_fma(ZEXT1632(auVar93),auVar99,ZEXT1632(auVar22));
            fVar175 = auVar86._0_4_;
            fVar226 = auVar86._4_4_;
            fVar227 = auVar86._8_4_;
            fVar228 = auVar86._12_4_;
            local_5e0 = ZEXT1632(CONCAT412(auVar93._12_4_ * fVar228,
                                           CONCAT48(auVar93._8_4_ * fVar227,
                                                    CONCAT44(auVar93._4_4_ * fVar226,
                                                             auVar93._0_4_ * fVar175))));
            auVar225 = ZEXT3264(local_5e0);
            uVar166 = vcmpps_avx512vl(local_5e0,auVar240,2);
            auVar71._4_4_ = uStack_55c;
            auVar71._0_4_ = local_560;
            auVar71._8_4_ = uStack_558;
            auVar71._12_4_ = uStack_554;
            auVar71._16_4_ = uStack_550;
            auVar71._20_4_ = uStack_54c;
            auVar71._24_4_ = uStack_548;
            auVar71._28_4_ = uStack_544;
            uVar28 = vcmpps_avx512vl(local_5e0,auVar71,0xd);
            bVar82 = (byte)uVar166 & (byte)uVar28 & bVar82;
            if (bVar82 != 0) {
              uVar83 = vcmpps_avx512vl(ZEXT1632(auVar87),ZEXT1232(ZEXT412(0)) << 0x20,4);
              uVar83 = bVar82 & uVar83;
              if ((char)uVar83 != '\0') {
                fVar174 = auVar103._0_4_ * fVar175;
                fVar187 = auVar103._4_4_ * fVar226;
                auVar65._4_4_ = fVar187;
                auVar65._0_4_ = fVar174;
                fVar84 = auVar103._8_4_ * fVar227;
                auVar65._8_4_ = fVar84;
                fVar85 = auVar103._12_4_ * fVar228;
                auVar65._12_4_ = fVar85;
                fVar137 = auVar103._16_4_ * 0.0;
                auVar65._16_4_ = fVar137;
                fVar138 = auVar103._20_4_ * 0.0;
                auVar65._20_4_ = fVar138;
                fVar139 = auVar103._24_4_ * 0.0;
                auVar65._24_4_ = fVar139;
                auVar65._28_4_ = auVar103._28_4_;
                auVar186._8_4_ = 0x3f800000;
                auVar186._0_8_ = 0x3f8000003f800000;
                auVar186._12_4_ = 0x3f800000;
                auVar186._16_4_ = 0x3f800000;
                auVar186._20_4_ = 0x3f800000;
                auVar186._24_4_ = 0x3f800000;
                auVar186._28_4_ = 0x3f800000;
                auVar111 = vsubps_avx(auVar186,auVar65);
                local_400._0_4_ =
                     (float)((uint)(bVar73 & 1) * (int)fVar174 |
                            (uint)!(bool)(bVar73 & 1) * auVar111._0_4_);
                bVar13 = (bool)((byte)(uVar74 >> 1) & 1);
                local_400._4_4_ =
                     (float)((uint)bVar13 * (int)fVar187 | (uint)!bVar13 * auVar111._4_4_);
                bVar13 = (bool)((byte)(uVar74 >> 2) & 1);
                local_400._8_4_ =
                     (float)((uint)bVar13 * (int)fVar84 | (uint)!bVar13 * auVar111._8_4_);
                bVar13 = (bool)((byte)(uVar74 >> 3) & 1);
                local_400._12_4_ =
                     (float)((uint)bVar13 * (int)fVar85 | (uint)!bVar13 * auVar111._12_4_);
                bVar13 = (bool)((byte)(uVar74 >> 4) & 1);
                local_400._16_4_ =
                     (float)((uint)bVar13 * (int)fVar137 | (uint)!bVar13 * auVar111._16_4_);
                bVar13 = (bool)((byte)(uVar74 >> 5) & 1);
                local_400._20_4_ =
                     (float)((uint)bVar13 * (int)fVar138 | (uint)!bVar13 * auVar111._20_4_);
                bVar13 = (bool)((byte)(uVar74 >> 6) & 1);
                local_400._24_4_ =
                     (float)((uint)bVar13 * (int)fVar139 | (uint)!bVar13 * auVar111._24_4_);
                bVar13 = SUB81(uVar74 >> 7,0);
                local_400._28_4_ =
                     (float)((uint)bVar13 * auVar103._28_4_ | (uint)!bVar13 * auVar111._28_4_);
                auVar111 = vsubps_avx(auVar101,auVar100);
                auVar86 = vfmadd213ps_fma(auVar111,local_400,auVar100);
                uVar147 = *(undefined4 *)((long)pre->ray_space + k * 4 + -0x20);
                auVar39._4_4_ = uVar147;
                auVar39._0_4_ = uVar147;
                auVar39._8_4_ = uVar147;
                auVar39._12_4_ = uVar147;
                auVar39._16_4_ = uVar147;
                auVar39._20_4_ = uVar147;
                auVar39._24_4_ = uVar147;
                auVar39._28_4_ = uVar147;
                auVar111 = vmulps_avx512vl(ZEXT1632(CONCAT412(auVar86._12_4_ + auVar86._12_4_,
                                                              CONCAT48(auVar86._8_4_ + auVar86._8_4_
                                                                       ,CONCAT44(auVar86._4_4_ +
                                                                                 auVar86._4_4_,
                                                                                 auVar86._0_4_ +
                                                                                 auVar86._0_4_)))),
                                           auVar39);
                uVar29 = vcmpps_avx512vl(local_5e0,auVar111,6);
                uVar83 = uVar83 & uVar29;
                bVar82 = (byte)uVar83;
                if (bVar82 != 0) {
                  auVar173._0_4_ = auVar104._0_4_ * fVar175;
                  auVar173._4_4_ = auVar104._4_4_ * fVar226;
                  auVar173._8_4_ = auVar104._8_4_ * fVar227;
                  auVar173._12_4_ = auVar104._12_4_ * fVar228;
                  auVar173._16_4_ = auVar104._16_4_ * 0.0;
                  auVar173._20_4_ = auVar104._20_4_ * 0.0;
                  auVar173._24_4_ = auVar104._24_4_ * 0.0;
                  auVar173._28_4_ = 0;
                  auVar193._8_4_ = 0x3f800000;
                  auVar193._0_8_ = 0x3f8000003f800000;
                  auVar193._12_4_ = 0x3f800000;
                  auVar193._16_4_ = 0x3f800000;
                  auVar193._20_4_ = 0x3f800000;
                  auVar193._24_4_ = 0x3f800000;
                  auVar193._28_4_ = 0x3f800000;
                  auVar111 = vsubps_avx(auVar193,auVar173);
                  auVar133._0_4_ =
                       (uint)(bVar73 & 1) * (int)auVar173._0_4_ |
                       (uint)!(bool)(bVar73 & 1) * auVar111._0_4_;
                  bVar13 = (bool)((byte)(uVar74 >> 1) & 1);
                  auVar133._4_4_ =
                       (uint)bVar13 * (int)auVar173._4_4_ | (uint)!bVar13 * auVar111._4_4_;
                  bVar13 = (bool)((byte)(uVar74 >> 2) & 1);
                  auVar133._8_4_ =
                       (uint)bVar13 * (int)auVar173._8_4_ | (uint)!bVar13 * auVar111._8_4_;
                  bVar13 = (bool)((byte)(uVar74 >> 3) & 1);
                  auVar133._12_4_ =
                       (uint)bVar13 * (int)auVar173._12_4_ | (uint)!bVar13 * auVar111._12_4_;
                  bVar13 = (bool)((byte)(uVar74 >> 4) & 1);
                  auVar133._16_4_ =
                       (uint)bVar13 * (int)auVar173._16_4_ | (uint)!bVar13 * auVar111._16_4_;
                  bVar13 = (bool)((byte)(uVar74 >> 5) & 1);
                  auVar133._20_4_ =
                       (uint)bVar13 * (int)auVar173._20_4_ | (uint)!bVar13 * auVar111._20_4_;
                  bVar13 = (bool)((byte)(uVar74 >> 6) & 1);
                  auVar133._24_4_ =
                       (uint)bVar13 * (int)auVar173._24_4_ | (uint)!bVar13 * auVar111._24_4_;
                  auVar133._28_4_ = (uint)!SUB81(uVar74 >> 7,0) * auVar111._28_4_;
                  auVar40._8_4_ = 0x40000000;
                  auVar40._0_8_ = 0x4000000040000000;
                  auVar40._12_4_ = 0x40000000;
                  auVar40._16_4_ = 0x40000000;
                  auVar40._20_4_ = 0x40000000;
                  auVar40._24_4_ = 0x40000000;
                  auVar40._28_4_ = 0x40000000;
                  local_3e0 = vfmsub132ps_avx512vl(auVar133,auVar193,auVar40);
                  local_3a0 = (undefined4)lVar77;
                  local_390 = local_670;
                  uStack_388 = uStack_668;
                  local_380 = local_680;
                  uStack_378 = uStack_678;
                  local_370 = local_690;
                  uStack_368 = uStack_688;
                  local_360 = local_6a0;
                  uStack_358 = uStack_698;
                  pGVar79 = (context->scene->geometries).items[uVar80].ptr;
                  if ((pGVar79->mask & *(uint *)(ray + k * 4 + 0x120)) != 0) {
                    auVar86 = vcvtsi2ss_avx512f(auVar96,local_3a0);
                    fVar175 = auVar86._0_4_;
                    local_340[0] = (fVar175 + local_400._0_4_ + 0.0) * local_100;
                    local_340[1] = (fVar175 + local_400._4_4_ + 1.0) * fStack_fc;
                    local_340[2] = (fVar175 + local_400._8_4_ + 2.0) * fStack_f8;
                    local_340[3] = (fVar175 + local_400._12_4_ + 3.0) * fStack_f4;
                    fStack_330 = (fVar175 + local_400._16_4_ + 4.0) * fStack_f0;
                    fStack_32c = (fVar175 + local_400._20_4_ + 5.0) * fStack_ec;
                    fStack_328 = (fVar175 + local_400._24_4_ + 6.0) * fStack_e8;
                    fStack_324 = fVar175 + local_400._28_4_ + 7.0;
                    local_320 = local_3e0;
                    local_300 = local_5e0;
                    auVar158._8_4_ = 0x7f800000;
                    auVar158._0_8_ = 0x7f8000007f800000;
                    auVar158._12_4_ = 0x7f800000;
                    auVar158._16_4_ = 0x7f800000;
                    auVar158._20_4_ = 0x7f800000;
                    auVar158._24_4_ = 0x7f800000;
                    auVar158._28_4_ = 0x7f800000;
                    auVar111 = vblendmps_avx512vl(auVar158,local_5e0);
                    auVar134._0_4_ =
                         (uint)(bVar82 & 1) * auVar111._0_4_ |
                         (uint)!(bool)(bVar82 & 1) * 0x7f800000;
                    bVar13 = (bool)((byte)(uVar83 >> 1) & 1);
                    auVar134._4_4_ = (uint)bVar13 * auVar111._4_4_ | (uint)!bVar13 * 0x7f800000;
                    bVar13 = (bool)((byte)(uVar83 >> 2) & 1);
                    auVar134._8_4_ = (uint)bVar13 * auVar111._8_4_ | (uint)!bVar13 * 0x7f800000;
                    bVar13 = (bool)((byte)(uVar83 >> 3) & 1);
                    auVar134._12_4_ = (uint)bVar13 * auVar111._12_4_ | (uint)!bVar13 * 0x7f800000;
                    bVar13 = (bool)((byte)(uVar83 >> 4) & 1);
                    auVar134._16_4_ = (uint)bVar13 * auVar111._16_4_ | (uint)!bVar13 * 0x7f800000;
                    bVar13 = (bool)((byte)(uVar83 >> 5) & 1);
                    auVar134._20_4_ = (uint)bVar13 * auVar111._20_4_ | (uint)!bVar13 * 0x7f800000;
                    bVar13 = (bool)((byte)(uVar83 >> 6) & 1);
                    auVar134._24_4_ = (uint)bVar13 * auVar111._24_4_ | (uint)!bVar13 * 0x7f800000;
                    bVar13 = SUB81(uVar83 >> 7,0);
                    auVar134._28_4_ = (uint)bVar13 * auVar111._28_4_ | (uint)!bVar13 * 0x7f800000;
                    auVar111 = vshufps_avx(auVar134,auVar134,0xb1);
                    auVar111 = vminps_avx(auVar134,auVar111);
                    auVar112 = vshufpd_avx(auVar111,auVar111,5);
                    auVar111 = vminps_avx(auVar111,auVar112);
                    auVar112 = vpermpd_avx2(auVar111,0x4e);
                    auVar111 = vminps_avx(auVar111,auVar112);
                    uVar166 = vcmpps_avx512vl(auVar134,auVar111,0);
                    uVar75 = (uint)uVar83;
                    if (((byte)uVar166 & bVar82) != 0) {
                      uVar75 = (uint)((byte)uVar166 & bVar82);
                    }
                    uVar76 = 0;
                    for (; (uVar75 & 1) == 0; uVar75 = uVar75 >> 1 | 0x80000000) {
                      uVar76 = uVar76 + 1;
                    }
                    uVar74 = (ulong)uVar76;
                    pGVar72 = pGVar79;
                    local_3c0 = local_5e0;
                    local_39c = iVar8;
                    if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                       (pGVar79->intersectionFilterN != (RTCFilterFunctionN)0x0)) {
                      do {
                        local_630 = pGVar72;
                        fVar175 = local_340[uVar74];
                        auVar171._4_4_ = fVar175;
                        auVar171._0_4_ = fVar175;
                        auVar171._8_4_ = fVar175;
                        auVar171._12_4_ = fVar175;
                        local_1c0._16_4_ = fVar175;
                        local_1c0._0_16_ = auVar171;
                        local_1c0._20_4_ = fVar175;
                        local_1c0._24_4_ = fVar175;
                        local_1c0._28_4_ = fVar175;
                        local_1a0 = *(undefined4 *)(local_320 + uVar74 * 4);
                        *(undefined4 *)(ray + k * 4 + 0x100) =
                             *(undefined4 *)(local_300 + uVar74 * 4);
                        local_660.context = context->user;
                        fVar226 = 1.0 - fVar175;
                        auVar34._8_4_ = 0x80000000;
                        auVar34._0_8_ = 0x8000000080000000;
                        auVar34._12_4_ = 0x80000000;
                        auVar93 = vxorps_avx512vl(ZEXT416((uint)fVar226),auVar34);
                        auVar86 = ZEXT416((uint)(fVar175 * fVar226 * 4.0));
                        auVar87 = vfnmsub213ss_fma(auVar171,auVar171,auVar86);
                        auVar86 = vfmadd213ss_fma(ZEXT416((uint)fVar226),ZEXT416((uint)fVar226),
                                                  auVar86);
                        auVar223 = ZEXT464(0x3f000000);
                        fVar226 = fVar226 * auVar93._0_4_ * 0.5;
                        fVar227 = auVar87._0_4_ * 0.5;
                        fVar228 = auVar86._0_4_ * 0.5;
                        fVar175 = fVar175 * fVar175 * 0.5;
                        auVar212._0_4_ = fVar175 * fVar146;
                        auVar212._4_4_ = fVar175 * fVar163;
                        auVar212._8_4_ = fVar175 * fVar164;
                        auVar212._12_4_ = fVar175 * fVar165;
                        auVar151._4_4_ = fVar228;
                        auVar151._0_4_ = fVar228;
                        auVar151._8_4_ = fVar228;
                        auVar151._12_4_ = fVar228;
                        auVar86 = vfmadd132ps_fma(auVar151,auVar212,auVar91);
                        auVar200._4_4_ = fVar227;
                        auVar200._0_4_ = fVar227;
                        auVar200._8_4_ = fVar227;
                        auVar200._12_4_ = fVar227;
                        auVar86 = vfmadd132ps_fma(auVar200,auVar86,auVar21);
                        auVar152._4_4_ = fVar226;
                        auVar152._0_4_ = fVar226;
                        auVar152._8_4_ = fVar226;
                        auVar152._12_4_ = fVar226;
                        auVar86 = vfmadd132ps_fma(auVar152,auVar86,auVar20);
                        local_220 = auVar86._0_4_;
                        auVar206._8_4_ = 1;
                        auVar206._0_8_ = 0x100000001;
                        auVar206._12_4_ = 1;
                        auVar206._16_4_ = 1;
                        auVar206._20_4_ = 1;
                        auVar206._24_4_ = 1;
                        auVar206._28_4_ = 1;
                        local_200 = vpermps_avx2(auVar206,ZEXT1632(auVar86));
                        auVar208 = ZEXT3264(local_200);
                        auVar213._8_4_ = 2;
                        auVar213._0_8_ = 0x200000002;
                        auVar213._12_4_ = 2;
                        auVar216._16_4_ = 2;
                        auVar216._0_16_ = auVar213;
                        auVar216._20_4_ = 2;
                        auVar216._24_4_ = 2;
                        auVar216._28_4_ = 2;
                        auVar218 = ZEXT3264(auVar216);
                        local_1e0 = vpermps_avx2(auVar216,ZEXT1632(auVar86));
                        iStack_21c = local_220;
                        iStack_218 = local_220;
                        iStack_214 = local_220;
                        iStack_210 = local_220;
                        iStack_20c = local_220;
                        iStack_208 = local_220;
                        iStack_204 = local_220;
                        uStack_19c = local_1a0;
                        uStack_198 = local_1a0;
                        uStack_194 = local_1a0;
                        uStack_190 = local_1a0;
                        uStack_18c = local_1a0;
                        uStack_188 = local_1a0;
                        uStack_184 = local_1a0;
                        local_180 = local_540._0_8_;
                        uStack_178 = local_540._8_8_;
                        uStack_170 = local_540._16_8_;
                        uStack_168 = local_540._24_8_;
                        local_160 = local_580;
                        auVar111 = vpcmpeqd_avx2(local_580,local_580);
                        local_628[1] = auVar111;
                        *local_628 = auVar111;
                        local_140 = (local_660.context)->instID[0];
                        uStack_13c = local_140;
                        uStack_138 = local_140;
                        uStack_134 = local_140;
                        uStack_130 = local_140;
                        uStack_12c = local_140;
                        uStack_128 = local_140;
                        uStack_124 = local_140;
                        local_120 = (local_660.context)->instPrimID[0];
                        uStack_11c = local_120;
                        uStack_118 = local_120;
                        uStack_114 = local_120;
                        uStack_110 = local_120;
                        uStack_10c = local_120;
                        uStack_108 = local_120;
                        uStack_104 = local_120;
                        local_620 = local_2c0;
                        local_660.valid = (int *)local_620;
                        local_660.geometryUserPtr = pGVar79->userPtr;
                        local_660.hit = (RTCHitN *)&local_220;
                        local_660.N = 8;
                        local_5c0 = auVar241._0_32_;
                        local_660.ray = (RTCRayN *)ray;
                        if (pGVar79->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                          auVar208 = ZEXT1664(local_200._0_16_);
                          auVar218 = ZEXT1664(auVar213);
                          auVar223 = ZEXT1664(auVar223._0_16_);
                          (*pGVar79->intersectionFilterN)(&local_660);
                          auVar225 = ZEXT3264(local_5e0);
                          auVar241 = ZEXT3264(local_5c0);
                          pGVar79 = local_630;
                        }
                        if (local_620 == (undefined1  [32])0x0) {
LAB_01bb92dd:
                          *(int *)(ray + k * 4 + 0x100) = auVar241._0_4_;
                        }
                        else {
                          p_Var12 = context->args->filter;
                          if ((p_Var12 != (RTCFilterFunctionN)0x0) &&
                             (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                               RTC_RAY_QUERY_FLAG_INCOHERENT ||
                              (((pGVar79->field_8).field_0x2 & 0x40) != 0)))) {
                            auVar208 = ZEXT1664(auVar208._0_16_);
                            auVar218 = ZEXT1664(auVar218._0_16_);
                            auVar223 = ZEXT1664(auVar223._0_16_);
                            (*p_Var12)(&local_660);
                            auVar225 = ZEXT3264(local_5e0);
                            auVar241 = ZEXT3264(local_5c0);
                            pGVar79 = local_630;
                          }
                          if (local_620 == (undefined1  [32])0x0) goto LAB_01bb92dd;
                          uVar29 = vptestmd_avx512vl(local_620,local_620);
                          iVar1 = *(int *)(local_660.hit + 4);
                          iVar2 = *(int *)(local_660.hit + 8);
                          iVar66 = *(int *)(local_660.hit + 0xc);
                          iVar67 = *(int *)(local_660.hit + 0x10);
                          iVar68 = *(int *)(local_660.hit + 0x14);
                          iVar69 = *(int *)(local_660.hit + 0x18);
                          iVar70 = *(int *)(local_660.hit + 0x1c);
                          bVar82 = (byte)uVar29;
                          bVar13 = (bool)((byte)(uVar29 >> 1) & 1);
                          bVar14 = (bool)((byte)(uVar29 >> 2) & 1);
                          bVar15 = (bool)((byte)(uVar29 >> 3) & 1);
                          bVar16 = (bool)((byte)(uVar29 >> 4) & 1);
                          bVar17 = (bool)((byte)(uVar29 >> 5) & 1);
                          bVar18 = (bool)((byte)(uVar29 >> 6) & 1);
                          bVar19 = SUB81(uVar29 >> 7,0);
                          *(uint *)(local_660.ray + 0x180) =
                               (uint)(bVar82 & 1) * *(int *)local_660.hit |
                               (uint)!(bool)(bVar82 & 1) * *(int *)(local_660.ray + 0x180);
                          *(uint *)(local_660.ray + 0x184) =
                               (uint)bVar13 * iVar1 |
                               (uint)!bVar13 * *(int *)(local_660.ray + 0x184);
                          *(uint *)(local_660.ray + 0x188) =
                               (uint)bVar14 * iVar2 |
                               (uint)!bVar14 * *(int *)(local_660.ray + 0x188);
                          *(uint *)(local_660.ray + 0x18c) =
                               (uint)bVar15 * iVar66 |
                               (uint)!bVar15 * *(int *)(local_660.ray + 0x18c);
                          *(uint *)(local_660.ray + 400) =
                               (uint)bVar16 * iVar67 | (uint)!bVar16 * *(int *)(local_660.ray + 400)
                          ;
                          *(uint *)(local_660.ray + 0x194) =
                               (uint)bVar17 * iVar68 |
                               (uint)!bVar17 * *(int *)(local_660.ray + 0x194);
                          *(uint *)(local_660.ray + 0x198) =
                               (uint)bVar18 * iVar69 |
                               (uint)!bVar18 * *(int *)(local_660.ray + 0x198);
                          *(uint *)(local_660.ray + 0x19c) =
                               (uint)bVar19 * iVar70 |
                               (uint)!bVar19 * *(int *)(local_660.ray + 0x19c);
                          iVar1 = *(int *)(local_660.hit + 0x24);
                          iVar2 = *(int *)(local_660.hit + 0x28);
                          iVar66 = *(int *)(local_660.hit + 0x2c);
                          iVar67 = *(int *)(local_660.hit + 0x30);
                          iVar68 = *(int *)(local_660.hit + 0x34);
                          iVar69 = *(int *)(local_660.hit + 0x38);
                          iVar70 = *(int *)(local_660.hit + 0x3c);
                          bVar13 = (bool)((byte)(uVar29 >> 1) & 1);
                          bVar14 = (bool)((byte)(uVar29 >> 2) & 1);
                          bVar15 = (bool)((byte)(uVar29 >> 3) & 1);
                          bVar16 = (bool)((byte)(uVar29 >> 4) & 1);
                          bVar17 = (bool)((byte)(uVar29 >> 5) & 1);
                          bVar18 = (bool)((byte)(uVar29 >> 6) & 1);
                          bVar19 = SUB81(uVar29 >> 7,0);
                          *(uint *)(local_660.ray + 0x1a0) =
                               (uint)(bVar82 & 1) * *(int *)(local_660.hit + 0x20) |
                               (uint)!(bool)(bVar82 & 1) * *(int *)(local_660.ray + 0x1a0);
                          *(uint *)(local_660.ray + 0x1a4) =
                               (uint)bVar13 * iVar1 |
                               (uint)!bVar13 * *(int *)(local_660.ray + 0x1a4);
                          *(uint *)(local_660.ray + 0x1a8) =
                               (uint)bVar14 * iVar2 |
                               (uint)!bVar14 * *(int *)(local_660.ray + 0x1a8);
                          *(uint *)(local_660.ray + 0x1ac) =
                               (uint)bVar15 * iVar66 |
                               (uint)!bVar15 * *(int *)(local_660.ray + 0x1ac);
                          *(uint *)(local_660.ray + 0x1b0) =
                               (uint)bVar16 * iVar67 |
                               (uint)!bVar16 * *(int *)(local_660.ray + 0x1b0);
                          *(uint *)(local_660.ray + 0x1b4) =
                               (uint)bVar17 * iVar68 |
                               (uint)!bVar17 * *(int *)(local_660.ray + 0x1b4);
                          *(uint *)(local_660.ray + 0x1b8) =
                               (uint)bVar18 * iVar69 |
                               (uint)!bVar18 * *(int *)(local_660.ray + 0x1b8);
                          *(uint *)(local_660.ray + 0x1bc) =
                               (uint)bVar19 * iVar70 |
                               (uint)!bVar19 * *(int *)(local_660.ray + 0x1bc);
                          iVar1 = *(int *)(local_660.hit + 0x44);
                          iVar2 = *(int *)(local_660.hit + 0x48);
                          iVar66 = *(int *)(local_660.hit + 0x4c);
                          iVar67 = *(int *)(local_660.hit + 0x50);
                          iVar68 = *(int *)(local_660.hit + 0x54);
                          iVar69 = *(int *)(local_660.hit + 0x58);
                          iVar70 = *(int *)(local_660.hit + 0x5c);
                          bVar13 = (bool)((byte)(uVar29 >> 1) & 1);
                          bVar14 = (bool)((byte)(uVar29 >> 2) & 1);
                          bVar15 = (bool)((byte)(uVar29 >> 3) & 1);
                          bVar16 = (bool)((byte)(uVar29 >> 4) & 1);
                          bVar17 = (bool)((byte)(uVar29 >> 5) & 1);
                          bVar18 = (bool)((byte)(uVar29 >> 6) & 1);
                          bVar19 = SUB81(uVar29 >> 7,0);
                          *(uint *)(local_660.ray + 0x1c0) =
                               (uint)(bVar82 & 1) * *(int *)(local_660.hit + 0x40) |
                               (uint)!(bool)(bVar82 & 1) * *(int *)(local_660.ray + 0x1c0);
                          *(uint *)(local_660.ray + 0x1c4) =
                               (uint)bVar13 * iVar1 |
                               (uint)!bVar13 * *(int *)(local_660.ray + 0x1c4);
                          *(uint *)(local_660.ray + 0x1c8) =
                               (uint)bVar14 * iVar2 |
                               (uint)!bVar14 * *(int *)(local_660.ray + 0x1c8);
                          *(uint *)(local_660.ray + 0x1cc) =
                               (uint)bVar15 * iVar66 |
                               (uint)!bVar15 * *(int *)(local_660.ray + 0x1cc);
                          *(uint *)(local_660.ray + 0x1d0) =
                               (uint)bVar16 * iVar67 |
                               (uint)!bVar16 * *(int *)(local_660.ray + 0x1d0);
                          *(uint *)(local_660.ray + 0x1d4) =
                               (uint)bVar17 * iVar68 |
                               (uint)!bVar17 * *(int *)(local_660.ray + 0x1d4);
                          *(uint *)(local_660.ray + 0x1d8) =
                               (uint)bVar18 * iVar69 |
                               (uint)!bVar18 * *(int *)(local_660.ray + 0x1d8);
                          *(uint *)(local_660.ray + 0x1dc) =
                               (uint)bVar19 * iVar70 |
                               (uint)!bVar19 * *(int *)(local_660.ray + 0x1dc);
                          iVar1 = *(int *)(local_660.hit + 100);
                          iVar2 = *(int *)(local_660.hit + 0x68);
                          iVar66 = *(int *)(local_660.hit + 0x6c);
                          iVar67 = *(int *)(local_660.hit + 0x70);
                          iVar68 = *(int *)(local_660.hit + 0x74);
                          iVar69 = *(int *)(local_660.hit + 0x78);
                          iVar70 = *(int *)(local_660.hit + 0x7c);
                          bVar13 = (bool)((byte)(uVar29 >> 1) & 1);
                          bVar14 = (bool)((byte)(uVar29 >> 2) & 1);
                          bVar15 = (bool)((byte)(uVar29 >> 3) & 1);
                          bVar16 = (bool)((byte)(uVar29 >> 4) & 1);
                          bVar17 = (bool)((byte)(uVar29 >> 5) & 1);
                          bVar18 = (bool)((byte)(uVar29 >> 6) & 1);
                          bVar19 = SUB81(uVar29 >> 7,0);
                          *(uint *)(local_660.ray + 0x1e0) =
                               (uint)(bVar82 & 1) * *(int *)(local_660.hit + 0x60) |
                               (uint)!(bool)(bVar82 & 1) * *(int *)(local_660.ray + 0x1e0);
                          *(uint *)(local_660.ray + 0x1e4) =
                               (uint)bVar13 * iVar1 |
                               (uint)!bVar13 * *(int *)(local_660.ray + 0x1e4);
                          *(uint *)(local_660.ray + 0x1e8) =
                               (uint)bVar14 * iVar2 |
                               (uint)!bVar14 * *(int *)(local_660.ray + 0x1e8);
                          *(uint *)(local_660.ray + 0x1ec) =
                               (uint)bVar15 * iVar66 |
                               (uint)!bVar15 * *(int *)(local_660.ray + 0x1ec);
                          *(uint *)(local_660.ray + 0x1f0) =
                               (uint)bVar16 * iVar67 |
                               (uint)!bVar16 * *(int *)(local_660.ray + 0x1f0);
                          *(uint *)(local_660.ray + 500) =
                               (uint)bVar17 * iVar68 | (uint)!bVar17 * *(int *)(local_660.ray + 500)
                          ;
                          *(uint *)(local_660.ray + 0x1f8) =
                               (uint)bVar18 * iVar69 |
                               (uint)!bVar18 * *(int *)(local_660.ray + 0x1f8);
                          *(uint *)(local_660.ray + 0x1fc) =
                               (uint)bVar19 * iVar70 |
                               (uint)!bVar19 * *(int *)(local_660.ray + 0x1fc);
                          iVar1 = *(int *)(local_660.hit + 0x84);
                          iVar2 = *(int *)(local_660.hit + 0x88);
                          iVar66 = *(int *)(local_660.hit + 0x8c);
                          iVar67 = *(int *)(local_660.hit + 0x90);
                          iVar68 = *(int *)(local_660.hit + 0x94);
                          iVar69 = *(int *)(local_660.hit + 0x98);
                          iVar70 = *(int *)(local_660.hit + 0x9c);
                          bVar13 = (bool)((byte)(uVar29 >> 1) & 1);
                          bVar14 = (bool)((byte)(uVar29 >> 2) & 1);
                          bVar15 = (bool)((byte)(uVar29 >> 3) & 1);
                          bVar16 = (bool)((byte)(uVar29 >> 4) & 1);
                          bVar17 = (bool)((byte)(uVar29 >> 5) & 1);
                          bVar18 = (bool)((byte)(uVar29 >> 6) & 1);
                          bVar19 = SUB81(uVar29 >> 7,0);
                          *(uint *)(local_660.ray + 0x200) =
                               (uint)(bVar82 & 1) * *(int *)(local_660.hit + 0x80) |
                               (uint)!(bool)(bVar82 & 1) * *(int *)(local_660.ray + 0x200);
                          *(uint *)(local_660.ray + 0x204) =
                               (uint)bVar13 * iVar1 |
                               (uint)!bVar13 * *(int *)(local_660.ray + 0x204);
                          *(uint *)(local_660.ray + 0x208) =
                               (uint)bVar14 * iVar2 |
                               (uint)!bVar14 * *(int *)(local_660.ray + 0x208);
                          *(uint *)(local_660.ray + 0x20c) =
                               (uint)bVar15 * iVar66 |
                               (uint)!bVar15 * *(int *)(local_660.ray + 0x20c);
                          *(uint *)(local_660.ray + 0x210) =
                               (uint)bVar16 * iVar67 |
                               (uint)!bVar16 * *(int *)(local_660.ray + 0x210);
                          *(uint *)(local_660.ray + 0x214) =
                               (uint)bVar17 * iVar68 |
                               (uint)!bVar17 * *(int *)(local_660.ray + 0x214);
                          *(uint *)(local_660.ray + 0x218) =
                               (uint)bVar18 * iVar69 |
                               (uint)!bVar18 * *(int *)(local_660.ray + 0x218);
                          *(uint *)(local_660.ray + 0x21c) =
                               (uint)bVar19 * iVar70 |
                               (uint)!bVar19 * *(int *)(local_660.ray + 0x21c);
                          auVar111 = vmovdqu32_avx512vl(*(undefined1 (*) [32])(local_660.hit + 0xa0)
                                                       );
                          *(undefined1 (*) [32])(local_660.ray + 0x220) = auVar111;
                          auVar111 = vmovdqu32_avx512vl(*(undefined1 (*) [32])(local_660.hit + 0xc0)
                                                       );
                          *(undefined1 (*) [32])(local_660.ray + 0x240) = auVar111;
                          auVar111 = vmovdqa32_avx512vl(*(undefined1 (*) [32])(local_660.hit + 0xe0)
                                                       );
                          *(undefined1 (*) [32])(local_660.ray + 0x260) = auVar111;
                          auVar111 = vmovdqa32_avx512vl(*(undefined1 (*) [32])
                                                         (local_660.hit + 0x100));
                          *(undefined1 (*) [32])(local_660.ray + 0x280) = auVar111;
                          auVar241 = ZEXT464(*(uint *)(ray + k * 4 + 0x100));
                        }
                        bVar82 = ~(byte)(1 << ((uint)uVar74 & 0x1f)) & (byte)uVar83;
                        uVar147 = auVar241._0_4_;
                        auVar159._4_4_ = uVar147;
                        auVar159._0_4_ = uVar147;
                        auVar159._8_4_ = uVar147;
                        auVar159._12_4_ = uVar147;
                        auVar159._16_4_ = uVar147;
                        auVar159._20_4_ = uVar147;
                        auVar159._24_4_ = uVar147;
                        auVar159._28_4_ = uVar147;
                        uVar166 = vcmpps_avx512vl(auVar225._0_32_,auVar159,2);
                        if ((bVar82 & (byte)uVar166) == 0) goto LAB_01bb936c;
                        bVar82 = bVar82 & (byte)uVar166;
                        uVar83 = (ulong)bVar82;
                        auVar160._8_4_ = 0x7f800000;
                        auVar160._0_8_ = 0x7f8000007f800000;
                        auVar160._12_4_ = 0x7f800000;
                        auVar160._16_4_ = 0x7f800000;
                        auVar160._20_4_ = 0x7f800000;
                        auVar160._24_4_ = 0x7f800000;
                        auVar160._28_4_ = 0x7f800000;
                        auVar111 = vblendmps_avx512vl(auVar160,auVar225._0_32_);
                        auVar135._0_4_ =
                             (uint)(bVar82 & 1) * auVar111._0_4_ |
                             (uint)!(bool)(bVar82 & 1) * 0x7f800000;
                        bVar13 = (bool)(bVar82 >> 1 & 1);
                        auVar135._4_4_ = (uint)bVar13 * auVar111._4_4_ | (uint)!bVar13 * 0x7f800000;
                        bVar13 = (bool)(bVar82 >> 2 & 1);
                        auVar135._8_4_ = (uint)bVar13 * auVar111._8_4_ | (uint)!bVar13 * 0x7f800000;
                        bVar13 = (bool)(bVar82 >> 3 & 1);
                        auVar135._12_4_ =
                             (uint)bVar13 * auVar111._12_4_ | (uint)!bVar13 * 0x7f800000;
                        bVar13 = (bool)(bVar82 >> 4 & 1);
                        auVar135._16_4_ =
                             (uint)bVar13 * auVar111._16_4_ | (uint)!bVar13 * 0x7f800000;
                        bVar13 = (bool)(bVar82 >> 5 & 1);
                        auVar135._20_4_ =
                             (uint)bVar13 * auVar111._20_4_ | (uint)!bVar13 * 0x7f800000;
                        bVar13 = (bool)(bVar82 >> 6 & 1);
                        auVar135._24_4_ =
                             (uint)bVar13 * auVar111._24_4_ | (uint)!bVar13 * 0x7f800000;
                        auVar135._28_4_ =
                             (uint)(bVar82 >> 7) * auVar111._28_4_ |
                             (uint)!(bool)(bVar82 >> 7) * 0x7f800000;
                        auVar111 = vshufps_avx(auVar135,auVar135,0xb1);
                        auVar111 = vminps_avx(auVar135,auVar111);
                        auVar112 = vshufpd_avx(auVar111,auVar111,5);
                        auVar111 = vminps_avx(auVar111,auVar112);
                        auVar112 = vpermpd_avx2(auVar111,0x4e);
                        auVar111 = vminps_avx(auVar111,auVar112);
                        uVar166 = vcmpps_avx512vl(auVar135,auVar111,0);
                        bVar73 = (byte)uVar166 & bVar82;
                        if (bVar73 != 0) {
                          bVar82 = bVar73;
                        }
                        uVar75 = 0;
                        for (uVar76 = (uint)bVar82; (uVar76 & 1) == 0;
                            uVar76 = uVar76 >> 1 | 0x80000000) {
                          uVar75 = uVar75 + 1;
                        }
                        uVar74 = (ulong)uVar75;
                        pGVar72 = local_630;
                      } while( true );
                    }
                    fVar175 = local_340[uVar74];
                    uVar147 = *(undefined4 *)(local_320 + uVar74 * 4);
                    fVar226 = 1.0 - fVar175;
                    auVar33._8_4_ = 0x80000000;
                    auVar33._0_8_ = 0x8000000080000000;
                    auVar33._12_4_ = 0x80000000;
                    auVar93 = vxorps_avx512vl(ZEXT416((uint)fVar226),auVar33);
                    auVar86 = ZEXT416((uint)(fVar175 * fVar226 * 4.0));
                    auVar87 = vfnmsub213ss_fma(ZEXT416((uint)fVar175),ZEXT416((uint)fVar175),auVar86
                                              );
                    auVar86 = vfmadd213ss_fma(ZEXT416((uint)fVar226),ZEXT416((uint)fVar226),auVar86)
                    ;
                    fVar226 = fVar226 * auVar93._0_4_ * 0.5;
                    fVar227 = auVar87._0_4_ * 0.5;
                    auVar218 = ZEXT464((uint)fVar227);
                    fVar228 = auVar86._0_4_ * 0.5;
                    fVar174 = fVar175 * fVar175 * 0.5;
                    auVar198._0_4_ = fVar174 * fVar146;
                    auVar198._4_4_ = fVar174 * fVar163;
                    auVar198._8_4_ = fVar174 * fVar164;
                    auVar198._12_4_ = fVar174 * fVar165;
                    auVar183._4_4_ = fVar228;
                    auVar183._0_4_ = fVar228;
                    auVar183._8_4_ = fVar228;
                    auVar183._12_4_ = fVar228;
                    auVar86 = vfmadd132ps_fma(auVar183,auVar198,auVar91);
                    auVar199._4_4_ = fVar227;
                    auVar199._0_4_ = fVar227;
                    auVar199._8_4_ = fVar227;
                    auVar199._12_4_ = fVar227;
                    auVar86 = vfmadd132ps_fma(auVar199,auVar86,auVar21);
                    auVar208 = ZEXT1664(auVar86);
                    auVar184._4_4_ = fVar226;
                    auVar184._0_4_ = fVar226;
                    auVar184._8_4_ = fVar226;
                    auVar184._12_4_ = fVar226;
                    auVar86 = vfmadd132ps_fma(auVar184,auVar86,auVar20);
                    *(undefined4 *)(ray + k * 4 + 0x100) = *(undefined4 *)(local_300 + uVar74 * 4);
                    *(int *)(ray + k * 4 + 0x180) = auVar86._0_4_;
                    uVar9 = vextractps_avx(auVar86,1);
                    *(undefined4 *)(ray + k * 4 + 0x1a0) = uVar9;
                    uVar9 = vextractps_avx(auVar86,2);
                    *(undefined4 *)(ray + k * 4 + 0x1c0) = uVar9;
                    *(float *)(ray + k * 4 + 0x1e0) = fVar175;
                    *(undefined4 *)(ray + k * 4 + 0x200) = uVar147;
                    *(uint *)(ray + k * 4 + 0x220) = uVar7;
                    *(uint *)(ray + k * 4 + 0x240) = uVar80;
                    *(uint *)(ray + k * 4 + 0x260) = context->user->instID[0];
                    *(uint *)(ray + k * 4 + 0x280) = context->user->instPrimID[0];
                  }
                }
              }
            }
          }
        }
        goto LAB_01bb8fb9;
      }
LAB_01bb8637:
      uVar147 = *(undefined4 *)(ray + k * 4 + 0x100);
      auVar32._4_4_ = uVar147;
      auVar32._0_4_ = uVar147;
      auVar32._8_4_ = uVar147;
      auVar32._12_4_ = uVar147;
      uVar166 = vcmpps_avx512vl(local_2d0,auVar32,2);
      uVar80 = (uint)uVar81 & (uint)uVar81 + 0xf & (uint)uVar166;
      uVar81 = (ulong)uVar80;
    } while (uVar80 != 0);
  }
  return;
LAB_01bb936c:
  auVar86 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
  auVar243 = ZEXT1664(auVar86);
  auVar244 = ZEXT464(0xbf800000);
LAB_01bb8fb9:
  lVar77 = lVar77 + 8;
  if (iVar8 <= (int)lVar77) goto LAB_01bb8637;
  goto LAB_01bb86e8;
}

Assistant:

static __forceinline void intersect_t(Precalculations& pre, RayHitK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(normal.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          Vec3ff a0,a1,a2,a3; geom->gather(a0,a1,a2,a3,geom->curve(primID),ray.time()[k]);

          Intersector().intersect(pre,ray,k,context,geom,primID,a0,a1,a2,a3,Epilog(ray,k,context,geomID,primID));
          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
      }